

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8_fp16.h
# Opt level: O0

void ncnn::convdw3x3s1_fp16_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined1 auVar31 [32];
  __m256 _r22_3;
  __m256 _r21_3;
  __m256 _r20_3;
  __m256 _r12_3;
  __m256 _r11_3;
  __m256 _r10_3;
  __m256 _r02_3;
  __m256 _r01_3;
  __m256 _r00_3;
  __m256 _sum0_3;
  __m256 _r23_2;
  __m256 _r13_2;
  __m256 _r03_2;
  __m256 _sum1_2;
  __m256 _r22_2;
  __m256 _r21_2;
  __m256 _r20_2;
  __m256 _r12_2;
  __m256 _r11_2;
  __m256 _r10_2;
  __m256 _r02_2;
  __m256 _r01_2;
  __m256 _r00_2;
  __m256 _sum0_2;
  __m256 _r25_1;
  __m256 _r15_1;
  __m256 _r05_1;
  __m256 _sum3_1;
  __m256 _r24_1;
  __m256 _r14_1;
  __m256 _r04_1;
  __m256 _sum2_1;
  __m256 _r23_1;
  __m256 _r13_1;
  __m256 _r03_1;
  __m256 _sum1_1;
  __m256 _r22_1;
  __m256 _r21_1;
  __m256 _r20_1;
  __m256 _r12_1;
  __m256 _r11_1;
  __m256 _r10_1;
  __m256 _r02_1;
  __m256 _r01_1;
  __m256 _r00_1;
  __m256 _sum0_1;
  __m256 _r29;
  __m256 _r19;
  __m256 _r09;
  __m256 _sum7;
  __m256 _r28;
  __m256 _r18;
  __m256 _r08;
  __m256 _sum6;
  __m256 _r27;
  __m256 _r17;
  __m256 _r07;
  __m256 _sum5;
  __m256 _r26;
  __m256 _r16;
  __m256 _r06;
  __m256 _sum4;
  __m256 _r25;
  __m256 _r15;
  __m256 _r05;
  __m256 _sum3;
  __m256 _r24;
  __m256 _r14;
  __m256 _r04;
  __m256 _sum2;
  __m256 _r23;
  __m256 _r13;
  __m256 _r03;
  __m256 _sum1;
  __m256 _r22;
  __m256 _r21;
  __m256 _r20;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  __m256 _sum0;
  int j;
  int i;
  __m256 _k22;
  __m256 _k21;
  __m256 _k20;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  unsigned_short *k0;
  __m256 _bias0;
  Mat out;
  int g;
  float *bias;
  int group;
  int outh;
  int outw;
  undefined8 local_9520;
  undefined8 uStack_9518;
  undefined8 local_9500;
  Mat *this;
  undefined8 local_94e0;
  undefined8 uStack_94d8;
  undefined8 local_94c0;
  undefined8 uStack_94b8;
  undefined8 local_94a0;
  undefined8 uStack_9498;
  undefined8 local_9480;
  undefined8 uStack_9478;
  undefined8 local_9460;
  undefined8 uStack_9458;
  undefined8 local_9440;
  undefined8 uStack_9438;
  undefined8 local_9420;
  undefined8 uStack_9418;
  undefined8 local_92e0;
  undefined8 uStack_92d8;
  undefined8 local_92c0;
  undefined8 uStack_92b8;
  undefined8 local_92a0;
  undefined8 uStack_9298;
  undefined8 local_9280;
  undefined8 uStack_9278;
  undefined8 local_9260;
  undefined8 uStack_9258;
  undefined8 local_9240;
  undefined8 uStack_9238;
  undefined8 local_9220;
  undefined8 uStack_9218;
  undefined8 local_9200;
  undefined8 uStack_91f8;
  undefined8 local_91e0;
  undefined8 uStack_91d8;
  undefined8 local_9160;
  undefined8 uStack_9158;
  undefined8 local_9140;
  undefined8 uStack_9138;
  undefined8 local_9120;
  undefined8 uStack_9118;
  undefined8 local_9100;
  undefined8 uStack_90f8;
  undefined8 local_90e0;
  undefined8 uStack_90d8;
  undefined8 local_90c0;
  undefined8 uStack_90b8;
  undefined8 local_90a0;
  undefined8 uStack_9098;
  undefined8 local_9080;
  undefined8 uStack_9078;
  undefined8 local_9060;
  undefined8 uStack_9058;
  undefined8 local_8f20;
  undefined8 uStack_8f18;
  undefined8 local_8f00;
  undefined8 uStack_8ef8;
  undefined8 local_8ee0;
  undefined8 uStack_8ed8;
  undefined8 local_8ec0;
  undefined8 uStack_8eb8;
  undefined8 local_8ea0;
  undefined8 uStack_8e98;
  undefined8 local_8e80;
  undefined8 uStack_8e78;
  undefined8 local_8e60;
  undefined8 uStack_8e58;
  undefined8 local_8e40;
  undefined8 uStack_8e38;
  undefined8 local_8e20;
  undefined8 uStack_8e18;
  undefined8 local_8da0;
  undefined8 uStack_8d98;
  undefined8 local_8d80;
  undefined8 uStack_8d78;
  undefined8 local_8d60;
  undefined8 uStack_8d58;
  undefined8 local_8d40;
  undefined8 uStack_8d38;
  undefined8 local_8d20;
  undefined8 uStack_8d18;
  undefined8 local_8d00;
  undefined8 uStack_8cf8;
  undefined8 local_8ce0;
  undefined8 uStack_8cd8;
  undefined8 local_8cc0;
  undefined8 uStack_8cb8;
  undefined8 local_8ca0;
  undefined8 uStack_8c98;
  undefined8 local_8c20;
  undefined8 uStack_8c18;
  undefined8 local_8c00;
  undefined8 uStack_8bf8;
  undefined8 local_8be0;
  undefined8 uStack_8bd8;
  undefined8 local_8bc0;
  undefined8 uStack_8bb8;
  undefined8 local_8ba0;
  undefined8 uStack_8b98;
  undefined8 local_8b80;
  undefined8 uStack_8b78;
  undefined8 local_8b60;
  undefined8 uStack_8b58;
  undefined8 local_8b40;
  undefined8 uStack_8b38;
  undefined8 local_8b20;
  undefined8 uStack_8b18;
  undefined8 local_8aa0;
  undefined8 uStack_8a98;
  undefined8 local_8a80;
  undefined8 uStack_8a78;
  undefined8 local_8a60;
  undefined8 uStack_8a58;
  undefined8 local_8a40;
  undefined8 uStack_8a38;
  undefined8 local_8a20;
  undefined8 uStack_8a18;
  undefined8 local_8a00;
  undefined8 uStack_89f8;
  undefined8 local_89e0;
  undefined8 uStack_89d8;
  undefined8 local_89c0;
  undefined8 uStack_89b8;
  undefined8 local_89a0;
  undefined8 uStack_8998;
  undefined8 local_8860;
  undefined8 uStack_8858;
  undefined8 local_8840;
  undefined8 uStack_8838;
  undefined8 local_8820;
  undefined8 uStack_8818;
  undefined8 local_8800;
  undefined8 uStack_87f8;
  undefined8 local_87e0;
  undefined8 uStack_87d8;
  undefined8 local_87c0;
  undefined8 uStack_87b8;
  undefined8 local_87a0;
  undefined8 uStack_8798;
  undefined8 local_8780;
  undefined8 uStack_8778;
  undefined8 local_8760;
  undefined8 uStack_8758;
  undefined8 local_86e0;
  undefined8 uStack_86d8;
  undefined8 local_86c0;
  undefined8 uStack_86b8;
  undefined8 local_86a0;
  undefined8 uStack_8698;
  undefined8 local_8680;
  undefined8 uStack_8678;
  undefined8 local_8660;
  undefined8 uStack_8658;
  undefined8 local_8640;
  undefined8 uStack_8638;
  undefined8 local_8620;
  undefined8 uStack_8618;
  undefined8 local_8600;
  undefined8 uStack_85f8;
  undefined8 local_85e0;
  undefined8 uStack_85d8;
  undefined8 local_8560;
  undefined8 uStack_8558;
  undefined8 local_8540;
  undefined8 uStack_8538;
  undefined8 local_8520;
  undefined8 uStack_8518;
  undefined8 local_8500;
  undefined8 uStack_84f8;
  undefined8 local_84e0;
  undefined8 uStack_84d8;
  undefined8 local_84c0;
  undefined8 uStack_84b8;
  undefined8 local_84a0;
  undefined8 uStack_8498;
  undefined8 local_8480;
  undefined8 uStack_8478;
  undefined8 local_8460;
  undefined8 uStack_8458;
  undefined8 local_83e0;
  undefined8 uStack_83d8;
  undefined8 local_83c0;
  undefined8 uStack_83b8;
  undefined8 local_83a0;
  undefined8 uStack_8398;
  undefined8 local_8380;
  undefined8 uStack_8378;
  undefined8 local_8360;
  undefined8 uStack_8358;
  undefined8 local_8340;
  undefined8 uStack_8338;
  undefined8 local_8320;
  undefined8 uStack_8318;
  undefined8 local_8300;
  undefined8 uStack_82f8;
  undefined8 local_82e0;
  undefined8 uStack_82d8;
  undefined8 local_8260;
  undefined8 uStack_8258;
  undefined8 local_8240;
  undefined8 uStack_8238;
  undefined8 local_8220;
  undefined8 uStack_8218;
  undefined8 local_8200;
  undefined8 uStack_81f8;
  undefined8 local_81e0;
  undefined8 uStack_81d8;
  undefined8 local_81c0;
  undefined8 uStack_81b8;
  undefined8 local_81a0;
  undefined8 uStack_8198;
  undefined8 local_8180;
  undefined8 uStack_8178;
  undefined8 local_8160;
  undefined8 uStack_8158;
  undefined8 local_80e0;
  undefined8 uStack_80d8;
  undefined8 local_80c0;
  undefined8 uStack_80b8;
  undefined8 local_80a0;
  undefined8 uStack_8098;
  undefined8 local_8080;
  undefined8 uStack_8078;
  undefined8 local_8060;
  undefined8 uStack_8058;
  undefined8 local_8040;
  undefined8 uStack_8038;
  undefined8 local_8020;
  undefined8 uStack_8018;
  undefined8 local_8000;
  undefined8 uStack_7ff8;
  undefined8 local_7fe0;
  undefined8 uStack_7fd8;
  undefined8 local_7f60;
  undefined8 uStack_7f58;
  undefined8 local_7f40;
  undefined8 uStack_7f38;
  undefined8 local_7f20;
  undefined8 uStack_7f18;
  undefined8 local_7f00;
  undefined8 uStack_7ef8;
  undefined8 local_7ee0;
  undefined8 uStack_7ed8;
  undefined8 local_7ec0;
  undefined8 uStack_7eb8;
  undefined8 local_7ea0;
  undefined8 uStack_7e98;
  undefined8 local_7e80;
  undefined8 uStack_7e78;
  undefined8 local_7e60;
  undefined8 uStack_7e58;
  undefined8 local_7de0;
  undefined8 uStack_7dd8;
  undefined8 local_7dc0;
  undefined8 uStack_7db8;
  undefined8 local_7da0;
  undefined8 uStack_7d98;
  undefined8 local_7d80;
  undefined8 uStack_7d78;
  undefined8 local_7d60;
  undefined8 uStack_7d58;
  undefined8 local_7d40;
  undefined8 uStack_7d38;
  undefined8 local_7d20;
  undefined8 uStack_7d18;
  undefined8 local_7d00;
  undefined8 uStack_7cf8;
  undefined8 local_7ce0;
  undefined8 uStack_7cd8;
  undefined8 local_7ba0;
  undefined8 uStack_7b98;
  undefined8 uStack_7b90;
  undefined8 uStack_7b88;
  undefined8 local_7b80;
  undefined8 uStack_7b78;
  undefined8 uStack_7b70;
  undefined8 uStack_7b68;
  undefined8 local_7b60;
  undefined8 uStack_7b58;
  undefined8 uStack_7b50;
  undefined8 uStack_7b48;
  undefined8 local_7b40;
  undefined8 uStack_7b38;
  undefined8 uStack_7b30;
  undefined8 uStack_7b28;
  undefined8 local_7b20;
  undefined8 uStack_7b18;
  undefined8 uStack_7b10;
  undefined8 uStack_7b08;
  undefined8 local_7b00;
  undefined8 uStack_7af8;
  undefined8 uStack_7af0;
  undefined8 uStack_7ae8;
  undefined8 local_7ae0;
  undefined8 uStack_7ad8;
  undefined8 uStack_7ad0;
  undefined8 uStack_7ac8;
  undefined8 local_7ac0;
  undefined8 uStack_7ab8;
  undefined8 uStack_7ab0;
  undefined8 uStack_7aa8;
  undefined8 local_7aa0;
  undefined8 uStack_7a98;
  undefined8 uStack_7a90;
  undefined8 uStack_7a88;
  undefined8 local_7a20;
  undefined8 uStack_7a18;
  undefined8 uStack_7a10;
  undefined8 uStack_7a08;
  int local_6f48;
  int local_6f44;
  undefined1 (*local_6e20) [32];
  undefined1 (*local_6e18) [32];
  undefined1 (*local_6e10) [32];
  Mat local_6e08;
  float *local_6dc0;
  undefined1 (*local_6db8) [16];
  undefined8 local_6da0;
  undefined8 uStack_6d98;
  undefined8 uStack_6d90;
  undefined8 uStack_6d88;
  Mat local_6d68;
  int local_6d1c;
  float *local_6d18;
  int local_6d0c;
  int local_6d08;
  int local_6d04;
  Mat *local_6cf0;
  undefined4 local_6cd4;
  undefined1 (*local_6cd0) [32];
  undefined1 (*local_6cc8) [32];
  undefined1 (*local_6cc0) [32];
  undefined1 (*local_6cb8) [32];
  undefined1 (*local_6cb0) [32];
  undefined1 (*local_6ca8) [32];
  undefined1 (*local_6ca0) [32];
  undefined1 (*local_6c98) [32];
  undefined1 (*local_6c90) [32];
  undefined1 (*local_6c88) [32];
  undefined1 (*local_6c80) [32];
  undefined1 (*local_6c78) [32];
  undefined1 (*local_6c70) [32];
  undefined1 (*local_6c68) [32];
  undefined1 (*local_6c60) [32];
  undefined1 (*local_6c58) [32];
  undefined1 (*local_6c50) [32];
  undefined1 (*local_6c48) [32];
  undefined1 (*local_6c40) [32];
  undefined1 (*local_6c38) [32];
  undefined1 (*local_6c30) [32];
  undefined1 (*local_6c28) [32];
  undefined1 (*local_6c20) [32];
  undefined1 (*local_6c18) [32];
  undefined1 (*local_6c10) [32];
  undefined1 (*local_6c08) [32];
  undefined1 (*local_6c00) [32];
  undefined1 (*local_6bf8) [32];
  undefined1 (*local_6bf0) [32];
  undefined1 (*local_6be8) [32];
  undefined1 (*local_6be0) [32];
  undefined1 (*local_6bd8) [32];
  undefined1 (*local_6bd0) [32];
  undefined1 (*local_6bc8) [32];
  undefined1 (*local_6bc0) [32];
  undefined1 (*local_6bb8) [32];
  undefined1 (*local_6bb0) [32];
  undefined1 (*local_6ba8) [32];
  undefined1 (*local_6ba0) [32];
  undefined1 (*local_6b98) [32];
  undefined1 (*local_6b90) [32];
  undefined1 (*local_6b88) [32];
  undefined1 (*local_6b80) [32];
  undefined1 (*local_6b78) [32];
  undefined1 (*local_6b70) [32];
  undefined1 (*local_6b68) [32];
  undefined1 (*local_6b60) [32];
  undefined1 (*local_6b58) [32];
  undefined1 (*local_6b50) [32];
  undefined1 (*local_6b48) [32];
  undefined1 (*local_6b40) [32];
  undefined1 (*local_6b38) [32];
  undefined1 (*local_6b30) [32];
  undefined1 (*local_6b28) [32];
  undefined1 (*local_6b20) [32];
  undefined1 (*local_6b18) [32];
  undefined1 (*local_6b10) [32];
  undefined1 (*local_6b08) [32];
  undefined1 (*local_6b00) [32];
  undefined1 (*local_6af8) [32];
  undefined1 (*local_6af0) [32];
  undefined1 (*local_6ae8) [32];
  undefined1 (*local_6ae0) [32];
  undefined1 (*local_6ad8) [32];
  undefined1 (*local_6ad0) [32];
  undefined1 (*local_6ac8) [32];
  undefined1 (*local_6ac0) [32];
  undefined1 (*local_6ab8) [32];
  undefined1 (*local_6ab0) [32];
  float *local_6aa8;
  undefined8 local_6aa0;
  undefined8 uStack_6a98;
  undefined8 uStack_6a90;
  undefined8 uStack_6a88;
  undefined8 local_6a80;
  undefined8 uStack_6a78;
  undefined8 uStack_6a70;
  undefined8 uStack_6a68;
  undefined8 local_6a60;
  undefined8 uStack_6a58;
  undefined8 uStack_6a50;
  undefined8 uStack_6a48;
  undefined8 local_6a40;
  undefined8 uStack_6a38;
  undefined8 uStack_6a30;
  undefined8 uStack_6a28;
  undefined8 local_6a20;
  undefined8 uStack_6a18;
  undefined8 uStack_6a10;
  undefined8 uStack_6a08;
  undefined8 local_6a00;
  undefined8 uStack_69f8;
  undefined8 uStack_69f0;
  undefined8 uStack_69e8;
  undefined8 local_69e0;
  undefined8 uStack_69d8;
  undefined8 uStack_69d0;
  undefined8 uStack_69c8;
  undefined8 local_69c0;
  undefined8 uStack_69b8;
  undefined8 uStack_69b0;
  undefined8 uStack_69a8;
  undefined8 local_69a0;
  undefined8 uStack_6998;
  undefined8 uStack_6990;
  undefined8 uStack_6988;
  undefined8 local_6980;
  undefined8 uStack_6978;
  undefined8 uStack_6970;
  undefined8 uStack_6968;
  undefined8 local_6960;
  undefined8 uStack_6958;
  undefined8 uStack_6950;
  undefined8 uStack_6948;
  undefined8 local_6940;
  undefined8 uStack_6938;
  undefined8 uStack_6930;
  undefined8 uStack_6928;
  undefined8 local_6920;
  undefined8 uStack_6918;
  undefined8 uStack_6910;
  undefined8 uStack_6908;
  undefined8 local_6900;
  undefined8 uStack_68f8;
  undefined8 uStack_68f0;
  undefined8 uStack_68e8;
  undefined8 local_68e0;
  undefined8 uStack_68d8;
  undefined8 uStack_68d0;
  undefined8 uStack_68c8;
  undefined8 local_68c0;
  undefined8 uStack_68b8;
  undefined8 uStack_68b0;
  undefined8 uStack_68a8;
  undefined8 local_68a0;
  undefined8 uStack_6898;
  undefined8 uStack_6890;
  undefined8 uStack_6888;
  undefined8 local_6880;
  undefined8 uStack_6878;
  undefined8 uStack_6870;
  undefined8 uStack_6868;
  undefined8 local_6860;
  undefined8 uStack_6858;
  undefined8 uStack_6850;
  undefined8 uStack_6848;
  undefined8 local_6840;
  undefined8 uStack_6838;
  undefined8 uStack_6830;
  undefined8 uStack_6828;
  undefined8 local_6820;
  undefined8 uStack_6818;
  undefined8 uStack_6810;
  undefined8 uStack_6808;
  undefined8 local_6800;
  undefined8 uStack_67f8;
  undefined8 uStack_67f0;
  undefined8 uStack_67e8;
  undefined8 local_67e0;
  undefined8 uStack_67d8;
  undefined8 uStack_67d0;
  undefined8 uStack_67c8;
  undefined8 local_67c0;
  undefined8 uStack_67b8;
  undefined8 uStack_67b0;
  undefined8 uStack_67a8;
  undefined8 local_67a0;
  undefined8 uStack_6798;
  undefined8 uStack_6790;
  undefined8 uStack_6788;
  undefined8 local_6780;
  undefined8 uStack_6778;
  undefined8 uStack_6770;
  undefined8 uStack_6768;
  undefined8 local_6760;
  undefined8 uStack_6758;
  undefined8 uStack_6750;
  undefined8 uStack_6748;
  undefined8 local_6740;
  undefined8 uStack_6738;
  undefined8 uStack_6730;
  undefined8 uStack_6728;
  undefined8 local_6720;
  undefined8 uStack_6718;
  undefined8 uStack_6710;
  undefined8 uStack_6708;
  undefined8 local_6700;
  undefined8 uStack_66f8;
  undefined8 uStack_66f0;
  undefined8 uStack_66e8;
  undefined8 local_66e0;
  undefined8 uStack_66d8;
  undefined8 uStack_66d0;
  undefined8 uStack_66c8;
  undefined8 local_66c0;
  undefined8 uStack_66b8;
  undefined8 uStack_66b0;
  undefined8 uStack_66a8;
  undefined8 local_66a0;
  undefined8 uStack_6698;
  undefined8 uStack_6690;
  undefined8 uStack_6688;
  undefined8 local_6680;
  undefined8 uStack_6678;
  undefined8 uStack_6670;
  undefined8 uStack_6668;
  undefined8 local_6660;
  undefined8 uStack_6658;
  undefined8 uStack_6650;
  undefined8 uStack_6648;
  undefined8 local_6640;
  undefined8 uStack_6638;
  undefined8 uStack_6630;
  undefined8 uStack_6628;
  undefined8 local_6620;
  undefined8 uStack_6618;
  undefined8 uStack_6610;
  undefined8 uStack_6608;
  undefined8 local_6600;
  undefined8 uStack_65f8;
  undefined8 uStack_65f0;
  undefined8 uStack_65e8;
  undefined8 local_65e0;
  undefined8 uStack_65d8;
  undefined8 uStack_65d0;
  undefined8 uStack_65c8;
  undefined8 local_65c0;
  undefined8 uStack_65b8;
  undefined8 uStack_65b0;
  undefined8 uStack_65a8;
  undefined8 local_65a0;
  undefined8 uStack_6598;
  undefined8 uStack_6590;
  undefined8 uStack_6588;
  undefined8 local_6580;
  undefined8 uStack_6578;
  undefined8 uStack_6570;
  undefined8 uStack_6568;
  undefined8 local_6560;
  undefined8 uStack_6558;
  undefined8 uStack_6550;
  undefined8 uStack_6548;
  undefined8 local_6540;
  undefined8 uStack_6538;
  undefined8 uStack_6530;
  undefined8 uStack_6528;
  undefined8 local_6520;
  undefined8 uStack_6518;
  undefined8 uStack_6510;
  undefined8 uStack_6508;
  undefined8 local_6500;
  undefined8 uStack_64f8;
  undefined8 uStack_64f0;
  undefined8 uStack_64e8;
  undefined8 local_64e0;
  undefined8 uStack_64d8;
  undefined8 uStack_64d0;
  undefined8 uStack_64c8;
  undefined8 local_64c0;
  undefined8 uStack_64b8;
  undefined8 uStack_64b0;
  undefined8 uStack_64a8;
  undefined8 local_64a0;
  undefined8 uStack_6498;
  undefined8 uStack_6490;
  undefined8 uStack_6488;
  undefined8 local_6480;
  undefined8 uStack_6478;
  undefined8 uStack_6470;
  undefined8 uStack_6468;
  undefined8 local_6460;
  undefined8 uStack_6458;
  undefined8 uStack_6450;
  undefined8 uStack_6448;
  undefined8 local_6440;
  undefined8 uStack_6438;
  undefined8 uStack_6430;
  undefined8 uStack_6428;
  undefined8 local_6420;
  undefined8 uStack_6418;
  undefined8 uStack_6410;
  undefined8 uStack_6408;
  undefined8 local_6400;
  undefined8 uStack_63f8;
  undefined8 uStack_63f0;
  undefined8 uStack_63e8;
  undefined8 local_63e0;
  undefined8 uStack_63d8;
  undefined8 uStack_63d0;
  undefined8 uStack_63c8;
  undefined8 local_63c0;
  undefined8 uStack_63b8;
  undefined8 uStack_63b0;
  undefined8 uStack_63a8;
  undefined8 local_63a0;
  undefined8 uStack_6398;
  undefined8 uStack_6390;
  undefined8 uStack_6388;
  undefined8 local_6380;
  undefined8 uStack_6378;
  undefined8 uStack_6370;
  undefined8 uStack_6368;
  undefined8 local_6360;
  undefined8 uStack_6358;
  undefined8 uStack_6350;
  undefined8 uStack_6348;
  undefined8 local_6340;
  undefined8 uStack_6338;
  undefined8 uStack_6330;
  undefined8 uStack_6328;
  undefined8 local_6320;
  undefined8 uStack_6318;
  undefined8 uStack_6310;
  undefined8 uStack_6308;
  undefined8 local_6300;
  undefined8 uStack_62f8;
  undefined8 uStack_62f0;
  undefined8 uStack_62e8;
  undefined8 local_62e0;
  undefined8 uStack_62d8;
  undefined8 uStack_62d0;
  undefined8 uStack_62c8;
  undefined8 local_62c0;
  undefined8 uStack_62b8;
  undefined8 uStack_62b0;
  undefined8 uStack_62a8;
  undefined8 local_62a0;
  undefined8 uStack_6298;
  undefined8 uStack_6290;
  undefined8 uStack_6288;
  undefined8 local_6280;
  undefined8 uStack_6278;
  undefined8 uStack_6270;
  undefined8 uStack_6268;
  undefined8 local_6260;
  undefined8 uStack_6258;
  undefined8 uStack_6250;
  undefined8 uStack_6248;
  undefined8 local_6240;
  undefined8 uStack_6238;
  undefined8 uStack_6230;
  undefined8 uStack_6228;
  undefined8 local_6220;
  undefined8 uStack_6218;
  undefined8 uStack_6210;
  undefined8 uStack_6208;
  undefined8 local_6200;
  undefined8 uStack_61f8;
  undefined8 uStack_61f0;
  undefined8 uStack_61e8;
  undefined8 local_61e0;
  undefined8 uStack_61d8;
  undefined8 uStack_61d0;
  undefined8 uStack_61c8;
  undefined8 local_61c0;
  undefined8 uStack_61b8;
  undefined8 uStack_61b0;
  undefined8 uStack_61a8;
  undefined8 local_61a0;
  undefined8 uStack_6198;
  undefined8 uStack_6190;
  undefined8 uStack_6188;
  undefined8 local_6180;
  undefined8 uStack_6178;
  undefined8 uStack_6170;
  undefined8 uStack_6168;
  undefined8 local_6160;
  undefined8 uStack_6158;
  undefined8 uStack_6150;
  undefined8 uStack_6148;
  undefined8 local_6140;
  undefined8 uStack_6138;
  undefined8 uStack_6130;
  undefined8 uStack_6128;
  undefined8 local_6120;
  undefined8 uStack_6118;
  undefined8 uStack_6110;
  undefined8 uStack_6108;
  undefined8 local_6100;
  undefined8 uStack_60f8;
  undefined8 uStack_60f0;
  undefined8 uStack_60e8;
  undefined8 local_60e0;
  undefined8 uStack_60d8;
  undefined8 uStack_60d0;
  undefined8 uStack_60c8;
  undefined8 local_60c0;
  undefined8 uStack_60b8;
  undefined8 uStack_60b0;
  undefined8 uStack_60a8;
  undefined8 local_60a0;
  undefined8 uStack_6098;
  undefined8 uStack_6090;
  undefined8 uStack_6088;
  undefined8 local_6080;
  undefined8 uStack_6078;
  undefined8 uStack_6070;
  undefined8 uStack_6068;
  undefined8 local_6060;
  undefined8 uStack_6058;
  undefined8 uStack_6050;
  undefined8 uStack_6048;
  undefined8 local_6040;
  undefined8 uStack_6038;
  undefined8 uStack_6030;
  undefined8 uStack_6028;
  undefined8 local_6020;
  undefined8 uStack_6018;
  undefined8 uStack_6010;
  undefined8 uStack_6008;
  undefined8 local_6000;
  undefined8 uStack_5ff8;
  undefined8 uStack_5ff0;
  undefined8 uStack_5fe8;
  undefined8 local_5fe0;
  undefined8 uStack_5fd8;
  undefined8 uStack_5fd0;
  undefined8 uStack_5fc8;
  undefined8 local_5fc0;
  undefined8 uStack_5fb8;
  undefined8 uStack_5fb0;
  undefined8 uStack_5fa8;
  undefined8 local_5fa0;
  undefined8 uStack_5f98;
  undefined8 uStack_5f90;
  undefined8 uStack_5f88;
  undefined8 local_5f80;
  undefined8 uStack_5f78;
  undefined8 uStack_5f70;
  undefined8 uStack_5f68;
  undefined8 local_5f60;
  undefined8 uStack_5f58;
  undefined8 uStack_5f50;
  undefined8 uStack_5f48;
  undefined8 local_5f40;
  undefined8 uStack_5f38;
  undefined8 uStack_5f30;
  undefined8 uStack_5f28;
  undefined8 local_5f20;
  undefined8 uStack_5f18;
  undefined8 uStack_5f10;
  undefined8 uStack_5f08;
  undefined8 local_5f00;
  undefined8 uStack_5ef8;
  undefined8 uStack_5ef0;
  undefined8 uStack_5ee8;
  undefined8 local_5ee0;
  undefined8 uStack_5ed8;
  undefined8 uStack_5ed0;
  undefined8 uStack_5ec8;
  undefined8 local_5ec0;
  undefined8 uStack_5eb8;
  undefined8 uStack_5eb0;
  undefined8 uStack_5ea8;
  undefined8 local_5ea0;
  undefined8 uStack_5e98;
  undefined8 uStack_5e90;
  undefined8 uStack_5e88;
  undefined8 local_5e80;
  undefined8 uStack_5e78;
  undefined8 uStack_5e70;
  undefined8 uStack_5e68;
  undefined8 local_5e60;
  undefined8 uStack_5e58;
  undefined8 uStack_5e50;
  undefined8 uStack_5e48;
  undefined8 local_5e40;
  undefined8 uStack_5e38;
  undefined8 uStack_5e30;
  undefined8 uStack_5e28;
  undefined8 local_5e20;
  undefined8 uStack_5e18;
  undefined8 uStack_5e10;
  undefined8 uStack_5e08;
  undefined8 local_5e00;
  undefined8 uStack_5df8;
  undefined8 uStack_5df0;
  undefined8 uStack_5de8;
  undefined8 local_5de0;
  undefined8 uStack_5dd8;
  undefined8 uStack_5dd0;
  undefined8 uStack_5dc8;
  undefined8 local_5dc0;
  undefined8 uStack_5db8;
  undefined8 uStack_5db0;
  undefined8 uStack_5da8;
  undefined8 local_5da0;
  undefined8 uStack_5d98;
  undefined8 uStack_5d90;
  undefined8 uStack_5d88;
  undefined8 local_5d80;
  undefined8 uStack_5d78;
  undefined8 uStack_5d70;
  undefined8 uStack_5d68;
  undefined8 local_5d60;
  undefined8 uStack_5d58;
  undefined8 uStack_5d50;
  undefined8 uStack_5d48;
  undefined8 local_5d40;
  undefined8 uStack_5d38;
  undefined8 uStack_5d30;
  undefined8 uStack_5d28;
  undefined8 local_5d20;
  undefined8 uStack_5d18;
  undefined8 uStack_5d10;
  undefined8 uStack_5d08;
  undefined8 local_5d00;
  undefined8 uStack_5cf8;
  undefined8 uStack_5cf0;
  undefined8 uStack_5ce8;
  undefined8 local_5ce0;
  undefined8 uStack_5cd8;
  undefined8 uStack_5cd0;
  undefined8 uStack_5cc8;
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  undefined8 local_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  undefined8 local_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined8 local_5c20;
  undefined8 uStack_5c18;
  undefined8 uStack_5c10;
  undefined8 uStack_5c08;
  undefined8 local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined8 local_5be0;
  undefined8 uStack_5bd8;
  undefined8 uStack_5bd0;
  undefined8 uStack_5bc8;
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined8 local_5ba0;
  undefined8 uStack_5b98;
  undefined8 uStack_5b90;
  undefined8 uStack_5b88;
  undefined8 local_5b80;
  undefined8 uStack_5b78;
  undefined8 uStack_5b70;
  undefined8 uStack_5b68;
  undefined8 local_5b60;
  undefined8 uStack_5b58;
  undefined8 uStack_5b50;
  undefined8 uStack_5b48;
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  undefined8 local_5b20;
  undefined8 uStack_5b18;
  undefined8 uStack_5b10;
  undefined8 uStack_5b08;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  undefined8 local_5ae0;
  undefined8 uStack_5ad8;
  undefined8 uStack_5ad0;
  undefined8 uStack_5ac8;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined8 local_5aa0;
  undefined8 uStack_5a98;
  undefined8 uStack_5a90;
  undefined8 uStack_5a88;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  undefined8 local_5a60;
  undefined8 uStack_5a58;
  undefined8 uStack_5a50;
  undefined8 uStack_5a48;
  undefined8 local_5a40;
  undefined8 uStack_5a38;
  undefined8 uStack_5a30;
  undefined8 uStack_5a28;
  undefined8 local_5a20;
  undefined8 uStack_5a18;
  undefined8 uStack_5a10;
  undefined8 uStack_5a08;
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined8 uStack_59f0;
  undefined8 uStack_59e8;
  undefined8 local_59e0;
  undefined8 uStack_59d8;
  undefined8 uStack_59d0;
  undefined8 uStack_59c8;
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 uStack_59b0;
  undefined8 uStack_59a8;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 uStack_5970;
  undefined8 uStack_5968;
  undefined8 local_5960;
  undefined8 uStack_5958;
  undefined8 uStack_5950;
  undefined8 uStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 uStack_5910;
  undefined8 uStack_5908;
  undefined8 local_5900;
  undefined8 uStack_58f8;
  undefined8 uStack_58f0;
  undefined8 uStack_58e8;
  undefined8 local_58e0;
  undefined8 uStack_58d8;
  undefined8 uStack_58d0;
  undefined8 uStack_58c8;
  undefined8 local_58c0;
  undefined8 uStack_58b8;
  undefined8 uStack_58b0;
  undefined8 uStack_58a8;
  undefined8 local_58a0;
  undefined8 uStack_5898;
  undefined8 uStack_5890;
  undefined8 uStack_5888;
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined8 uStack_5870;
  undefined8 uStack_5868;
  undefined8 local_5860;
  undefined8 uStack_5858;
  undefined8 uStack_5850;
  undefined8 uStack_5848;
  undefined8 local_5840;
  undefined8 uStack_5838;
  undefined8 uStack_5830;
  undefined8 uStack_5828;
  undefined8 local_5820;
  undefined8 uStack_5818;
  undefined8 uStack_5810;
  undefined8 uStack_5808;
  undefined8 local_5800;
  undefined8 uStack_57f8;
  undefined8 uStack_57f0;
  undefined8 uStack_57e8;
  undefined8 local_57e0;
  undefined8 uStack_57d8;
  undefined8 uStack_57d0;
  undefined8 uStack_57c8;
  undefined8 local_57c0;
  undefined8 uStack_57b8;
  undefined8 uStack_57b0;
  undefined8 uStack_57a8;
  undefined8 local_57a0;
  undefined8 uStack_5798;
  undefined8 uStack_5790;
  undefined8 uStack_5788;
  undefined8 local_5780;
  undefined8 uStack_5778;
  undefined8 uStack_5770;
  undefined8 uStack_5768;
  undefined8 local_5760;
  undefined8 uStack_5758;
  undefined8 uStack_5750;
  undefined8 uStack_5748;
  undefined8 local_5740;
  undefined8 uStack_5738;
  undefined8 uStack_5730;
  undefined8 uStack_5728;
  undefined8 local_5720;
  undefined8 uStack_5718;
  undefined8 uStack_5710;
  undefined8 uStack_5708;
  undefined8 local_5700;
  undefined8 uStack_56f8;
  undefined8 uStack_56f0;
  undefined8 uStack_56e8;
  undefined8 local_56e0;
  undefined8 uStack_56d8;
  undefined8 uStack_56d0;
  undefined8 uStack_56c8;
  undefined8 local_56c0;
  undefined8 uStack_56b8;
  undefined8 uStack_56b0;
  undefined8 uStack_56a8;
  undefined8 local_56a0;
  undefined8 uStack_5698;
  undefined8 uStack_5690;
  undefined8 uStack_5688;
  undefined8 local_5680;
  undefined8 uStack_5678;
  undefined8 uStack_5670;
  undefined8 uStack_5668;
  undefined8 local_5660;
  undefined8 uStack_5658;
  undefined8 uStack_5650;
  undefined8 uStack_5648;
  undefined8 local_5640;
  undefined8 uStack_5638;
  undefined8 uStack_5630;
  undefined8 uStack_5628;
  undefined8 local_5620;
  undefined8 uStack_5618;
  undefined8 uStack_5610;
  undefined8 uStack_5608;
  undefined8 local_5600;
  undefined8 uStack_55f8;
  undefined8 uStack_55f0;
  undefined8 uStack_55e8;
  undefined8 local_55e0;
  undefined8 uStack_55d8;
  undefined8 uStack_55d0;
  undefined8 uStack_55c8;
  undefined8 local_55c0;
  undefined8 uStack_55b8;
  undefined8 uStack_55b0;
  undefined8 uStack_55a8;
  undefined8 local_55a0;
  undefined8 uStack_5598;
  undefined8 uStack_5590;
  undefined8 uStack_5588;
  undefined8 local_5580;
  undefined8 uStack_5578;
  undefined8 uStack_5570;
  undefined8 uStack_5568;
  undefined8 local_5560;
  undefined8 uStack_5558;
  undefined8 uStack_5550;
  undefined8 uStack_5548;
  undefined8 local_5540;
  undefined8 uStack_5538;
  undefined8 uStack_5530;
  undefined8 uStack_5528;
  undefined8 local_5520;
  undefined8 uStack_5518;
  undefined8 uStack_5510;
  undefined8 uStack_5508;
  undefined8 local_5500;
  undefined8 uStack_54f8;
  undefined8 uStack_54f0;
  undefined8 uStack_54e8;
  undefined8 local_54e0;
  undefined8 uStack_54d8;
  undefined8 uStack_54d0;
  undefined8 uStack_54c8;
  undefined8 local_54c0;
  undefined8 uStack_54b8;
  undefined8 uStack_54b0;
  undefined8 uStack_54a8;
  undefined8 local_54a0;
  undefined8 uStack_5498;
  undefined8 uStack_5490;
  undefined8 uStack_5488;
  undefined8 local_5480;
  undefined8 uStack_5478;
  undefined8 uStack_5470;
  undefined8 uStack_5468;
  undefined8 local_5460;
  undefined8 uStack_5458;
  undefined8 uStack_5450;
  undefined8 uStack_5448;
  undefined8 local_5440;
  undefined8 uStack_5438;
  undefined8 uStack_5430;
  undefined8 uStack_5428;
  undefined8 local_5420;
  undefined8 uStack_5418;
  undefined8 uStack_5410;
  undefined8 uStack_5408;
  undefined8 local_5400;
  undefined8 uStack_53f8;
  undefined8 uStack_53f0;
  undefined8 uStack_53e8;
  undefined8 local_53e0;
  undefined8 uStack_53d8;
  undefined8 uStack_53d0;
  undefined8 uStack_53c8;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined8 uStack_53b0;
  undefined8 uStack_53a8;
  undefined8 local_53a0;
  undefined8 uStack_5398;
  undefined8 uStack_5390;
  undefined8 uStack_5388;
  undefined8 local_5380;
  undefined8 uStack_5378;
  undefined8 uStack_5370;
  undefined8 uStack_5368;
  undefined8 local_5360;
  undefined8 uStack_5358;
  undefined8 uStack_5350;
  undefined8 uStack_5348;
  undefined8 local_5340;
  undefined8 uStack_5338;
  undefined8 uStack_5330;
  undefined8 uStack_5328;
  undefined8 local_5320;
  undefined8 uStack_5318;
  undefined8 uStack_5310;
  undefined8 uStack_5308;
  undefined8 local_5300;
  undefined8 uStack_52f8;
  undefined8 uStack_52f0;
  undefined8 uStack_52e8;
  undefined8 local_52e0;
  undefined8 uStack_52d8;
  undefined8 uStack_52d0;
  undefined8 uStack_52c8;
  undefined8 local_52c0;
  undefined8 uStack_52b8;
  undefined8 uStack_52b0;
  undefined8 uStack_52a8;
  undefined8 local_52a0;
  undefined8 uStack_5298;
  undefined8 uStack_5290;
  undefined8 uStack_5288;
  undefined8 local_5280;
  undefined8 uStack_5278;
  undefined8 uStack_5270;
  undefined8 uStack_5268;
  undefined8 local_5260;
  undefined8 uStack_5258;
  undefined8 uStack_5250;
  undefined8 uStack_5248;
  undefined8 local_5240;
  undefined8 uStack_5238;
  undefined8 uStack_5230;
  undefined8 uStack_5228;
  undefined8 local_5220;
  undefined8 uStack_5218;
  undefined8 uStack_5210;
  undefined8 uStack_5208;
  undefined8 local_5200;
  undefined8 uStack_51f8;
  undefined8 uStack_51f0;
  undefined8 uStack_51e8;
  undefined8 local_51e0;
  undefined8 uStack_51d8;
  undefined8 uStack_51d0;
  undefined8 uStack_51c8;
  undefined8 local_51c0;
  undefined8 uStack_51b8;
  undefined8 uStack_51b0;
  undefined8 uStack_51a8;
  undefined8 local_51a0;
  undefined8 uStack_5198;
  undefined8 uStack_5190;
  undefined8 uStack_5188;
  undefined8 local_5180;
  undefined8 uStack_5178;
  undefined8 uStack_5170;
  undefined8 uStack_5168;
  undefined8 local_5160;
  undefined8 uStack_5158;
  undefined8 uStack_5150;
  undefined8 uStack_5148;
  undefined8 local_5140;
  undefined8 uStack_5138;
  undefined8 uStack_5130;
  undefined8 uStack_5128;
  undefined8 local_5120;
  undefined8 uStack_5118;
  undefined8 uStack_5110;
  undefined8 uStack_5108;
  undefined8 local_5100;
  undefined8 uStack_50f8;
  undefined8 uStack_50f0;
  undefined8 uStack_50e8;
  undefined8 local_50e0;
  undefined8 uStack_50d8;
  undefined8 uStack_50d0;
  undefined8 uStack_50c8;
  undefined8 local_50c0;
  undefined8 uStack_50b8;
  undefined8 uStack_50b0;
  undefined8 uStack_50a8;
  undefined8 local_50a0;
  undefined8 uStack_5098;
  undefined8 uStack_5090;
  undefined8 uStack_5088;
  undefined8 local_5080;
  undefined8 uStack_5078;
  undefined8 uStack_5070;
  undefined8 uStack_5068;
  undefined8 local_5060;
  undefined8 uStack_5058;
  undefined8 uStack_5050;
  undefined8 uStack_5048;
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 local_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  undefined8 local_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined8 local_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 uStack_4f70;
  undefined8 uStack_4f68;
  undefined8 local_4f60;
  undefined8 uStack_4f58;
  undefined8 uStack_4f50;
  undefined8 uStack_4f48;
  undefined8 local_4f40;
  undefined8 uStack_4f38;
  undefined8 uStack_4f30;
  undefined8 uStack_4f28;
  undefined8 local_4f20;
  undefined8 uStack_4f18;
  undefined8 uStack_4f10;
  undefined8 uStack_4f08;
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  undefined8 uStack_4ef0;
  undefined8 uStack_4ee8;
  undefined8 local_4ee0;
  undefined8 uStack_4ed8;
  undefined8 uStack_4ed0;
  undefined8 uStack_4ec8;
  undefined8 local_4ec0;
  undefined8 uStack_4eb8;
  undefined8 uStack_4eb0;
  undefined8 uStack_4ea8;
  undefined8 local_4ea0;
  undefined8 uStack_4e98;
  undefined8 uStack_4e90;
  undefined8 uStack_4e88;
  undefined8 local_4e80;
  undefined8 uStack_4e78;
  undefined8 uStack_4e70;
  undefined8 uStack_4e68;
  undefined8 local_4e60;
  undefined8 uStack_4e58;
  undefined8 uStack_4e50;
  undefined8 uStack_4e48;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined8 local_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined8 uStack_4e08;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 local_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 local_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 uStack_4d70;
  undefined8 uStack_4d68;
  undefined8 local_4d60;
  undefined8 uStack_4d58;
  undefined8 uStack_4d50;
  undefined8 uStack_4d48;
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined8 uStack_4d30;
  undefined8 uStack_4d28;
  undefined8 local_4d20;
  undefined8 uStack_4d18;
  undefined8 uStack_4d10;
  undefined8 uStack_4d08;
  undefined8 local_4d00;
  undefined8 uStack_4cf8;
  undefined8 uStack_4cf0;
  undefined8 uStack_4ce8;
  undefined8 local_4ce0;
  undefined8 uStack_4cd8;
  undefined8 uStack_4cd0;
  undefined8 uStack_4cc8;
  undefined8 local_4cc0;
  undefined8 uStack_4cb8;
  undefined8 uStack_4cb0;
  undefined8 uStack_4ca8;
  undefined8 local_4ca0;
  undefined8 uStack_4c98;
  undefined8 uStack_4c90;
  undefined8 uStack_4c88;
  undefined8 local_4c80;
  undefined8 uStack_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined8 local_4c60;
  undefined8 uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  undefined8 local_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 local_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  undefined8 local_4bc0;
  undefined8 uStack_4bb8;
  undefined8 uStack_4bb0;
  undefined8 uStack_4ba8;
  undefined8 local_4ba0;
  undefined8 uStack_4b98;
  undefined8 uStack_4b90;
  undefined8 uStack_4b88;
  undefined8 local_4b80;
  undefined8 uStack_4b78;
  undefined8 uStack_4b70;
  undefined8 uStack_4b68;
  undefined8 local_4b60;
  undefined8 uStack_4b58;
  undefined8 uStack_4b50;
  undefined8 uStack_4b48;
  undefined8 local_4b40;
  undefined8 uStack_4b38;
  undefined8 uStack_4b30;
  undefined8 uStack_4b28;
  undefined8 local_4b20;
  undefined8 uStack_4b18;
  undefined8 uStack_4b10;
  undefined8 uStack_4b08;
  undefined8 local_4b00;
  undefined8 uStack_4af8;
  undefined8 uStack_4af0;
  undefined8 uStack_4ae8;
  undefined8 local_4ae0;
  undefined8 uStack_4ad8;
  undefined8 uStack_4ad0;
  undefined8 uStack_4ac8;
  undefined8 local_4ac0;
  undefined8 uStack_4ab8;
  undefined8 uStack_4ab0;
  undefined8 uStack_4aa8;
  undefined8 local_4aa0;
  undefined8 uStack_4a98;
  undefined8 uStack_4a90;
  undefined8 uStack_4a88;
  undefined8 local_4a80;
  undefined8 uStack_4a78;
  undefined8 uStack_4a70;
  undefined8 uStack_4a68;
  undefined8 local_4a60;
  undefined8 uStack_4a58;
  undefined8 uStack_4a50;
  undefined8 uStack_4a48;
  undefined8 local_4a40;
  undefined8 uStack_4a38;
  undefined8 uStack_4a30;
  undefined8 uStack_4a28;
  undefined8 local_4a20;
  undefined8 uStack_4a18;
  undefined8 uStack_4a10;
  undefined8 uStack_4a08;
  undefined8 local_4a00;
  undefined8 uStack_49f8;
  undefined8 uStack_49f0;
  undefined8 uStack_49e8;
  undefined8 local_49e0;
  undefined8 uStack_49d8;
  undefined8 uStack_49d0;
  undefined8 uStack_49c8;
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 uStack_49b0;
  undefined8 uStack_49a8;
  undefined8 local_49a0;
  undefined8 uStack_4998;
  undefined8 uStack_4990;
  undefined8 uStack_4988;
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 uStack_4970;
  undefined8 uStack_4968;
  undefined8 local_4960;
  undefined8 uStack_4958;
  undefined8 uStack_4950;
  undefined8 uStack_4948;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 uStack_4930;
  undefined8 uStack_4928;
  undefined8 local_4920;
  undefined8 uStack_4918;
  undefined8 uStack_4910;
  undefined8 uStack_4908;
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  undefined8 local_48e0;
  undefined8 uStack_48d8;
  undefined8 uStack_48d0;
  undefined8 uStack_48c8;
  undefined8 local_48c0;
  undefined8 uStack_48b8;
  undefined8 uStack_48b0;
  undefined8 uStack_48a8;
  undefined8 local_48a0;
  undefined8 uStack_4898;
  undefined8 uStack_4890;
  undefined8 uStack_4888;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  undefined8 local_4860;
  undefined8 uStack_4858;
  undefined8 uStack_4850;
  undefined8 uStack_4848;
  undefined8 local_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  undefined8 local_4820;
  undefined8 uStack_4818;
  undefined8 uStack_4810;
  undefined8 uStack_4808;
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  undefined8 local_47e0;
  undefined8 uStack_47d8;
  undefined8 uStack_47d0;
  undefined8 uStack_47c8;
  undefined8 local_47c0;
  undefined8 uStack_47b8;
  undefined8 uStack_47b0;
  undefined8 uStack_47a8;
  undefined8 local_47a0;
  undefined8 uStack_4798;
  undefined8 uStack_4790;
  undefined8 uStack_4788;
  undefined8 local_4780;
  undefined8 uStack_4778;
  undefined8 uStack_4770;
  undefined8 uStack_4768;
  undefined8 local_4760;
  undefined8 uStack_4758;
  undefined8 uStack_4750;
  undefined8 uStack_4748;
  undefined8 local_4740;
  undefined8 uStack_4738;
  undefined8 uStack_4730;
  undefined8 uStack_4728;
  undefined8 local_4720;
  undefined8 uStack_4718;
  undefined8 uStack_4710;
  undefined8 uStack_4708;
  undefined8 local_4700;
  undefined8 uStack_46f8;
  undefined8 uStack_46f0;
  undefined8 uStack_46e8;
  undefined8 local_46e0;
  undefined8 uStack_46d8;
  undefined8 uStack_46d0;
  undefined8 uStack_46c8;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  undefined8 local_46a0;
  undefined8 uStack_4698;
  undefined8 uStack_4690;
  undefined8 uStack_4688;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  undefined8 local_4660;
  undefined8 uStack_4658;
  undefined8 uStack_4650;
  undefined8 uStack_4648;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined8 local_4620;
  undefined8 uStack_4618;
  undefined8 uStack_4610;
  undefined8 uStack_4608;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  undefined8 local_45e0;
  undefined8 uStack_45d8;
  undefined8 uStack_45d0;
  undefined8 uStack_45c8;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  undefined8 local_45a0;
  undefined8 uStack_4598;
  undefined8 uStack_4590;
  undefined8 uStack_4588;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  undefined8 local_4560;
  undefined8 uStack_4558;
  undefined8 uStack_4550;
  undefined8 uStack_4548;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  undefined8 local_4520;
  undefined8 uStack_4518;
  undefined8 uStack_4510;
  undefined8 uStack_4508;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  undefined8 local_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  undefined8 local_44a0;
  undefined8 uStack_4498;
  undefined8 uStack_4490;
  undefined8 uStack_4488;
  undefined8 local_4480;
  undefined8 uStack_4478;
  undefined8 uStack_4470;
  undefined8 uStack_4468;
  undefined8 local_4460;
  undefined8 uStack_4458;
  undefined8 uStack_4450;
  undefined8 uStack_4448;
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  undefined8 local_4420;
  undefined8 uStack_4418;
  undefined8 uStack_4410;
  undefined8 uStack_4408;
  undefined8 local_4400;
  undefined8 uStack_43f8;
  undefined8 uStack_43f0;
  undefined8 uStack_43e8;
  undefined8 local_43e0;
  undefined8 uStack_43d8;
  undefined8 uStack_43d0;
  undefined8 uStack_43c8;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  undefined8 local_43a0;
  undefined8 uStack_4398;
  undefined8 uStack_4390;
  undefined8 uStack_4388;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  undefined8 uStack_4368;
  undefined8 local_4360;
  undefined8 uStack_4358;
  undefined8 uStack_4350;
  undefined8 uStack_4348;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  undefined8 local_4320;
  undefined8 uStack_4318;
  undefined8 uStack_4310;
  undefined8 uStack_4308;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 uStack_42f0;
  undefined8 uStack_42e8;
  undefined8 local_42e0;
  undefined8 uStack_42d8;
  undefined8 uStack_42d0;
  undefined8 uStack_42c8;
  undefined8 local_42c0;
  undefined8 uStack_42b8;
  undefined8 uStack_42b0;
  undefined8 uStack_42a8;
  undefined8 local_42a0;
  undefined8 uStack_4298;
  undefined8 uStack_4290;
  undefined8 uStack_4288;
  undefined8 local_4280;
  undefined8 uStack_4278;
  undefined8 uStack_4270;
  undefined8 uStack_4268;
  undefined8 local_4260;
  undefined8 uStack_4258;
  undefined8 uStack_4250;
  undefined8 uStack_4248;
  undefined8 local_4240;
  undefined8 uStack_4238;
  undefined8 uStack_4230;
  undefined8 uStack_4228;
  undefined8 local_4220;
  undefined8 uStack_4218;
  undefined8 uStack_4210;
  undefined8 uStack_4208;
  undefined8 local_4200;
  undefined8 uStack_41f8;
  undefined8 uStack_41f0;
  undefined8 uStack_41e8;
  undefined8 local_41e0;
  undefined8 uStack_41d8;
  undefined8 uStack_41d0;
  undefined8 uStack_41c8;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined8 local_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined8 local_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  undefined8 local_4120;
  undefined8 uStack_4118;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  undefined8 local_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 local_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 local_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  undefined8 local_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 local_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 local_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined8 local_3e60;
  undefined8 uStack_3e58;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  undefined8 local_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 local_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 uStack_3db0;
  undefined8 uStack_3da8;
  undefined8 local_3da0;
  undefined8 uStack_3d98;
  undefined8 uStack_3d90;
  undefined8 uStack_3d88;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 local_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  undefined8 local_3d20;
  undefined8 uStack_3d18;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  undefined8 local_3ce0;
  undefined8 uStack_3cd8;
  undefined8 uStack_3cd0;
  undefined8 uStack_3cc8;
  undefined8 local_3cc0;
  undefined8 uStack_3cb8;
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  undefined8 local_3ca0;
  undefined8 uStack_3c98;
  undefined8 uStack_3c90;
  undefined8 uStack_3c88;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  undefined8 local_3c60;
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  undefined8 local_3c20;
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  undefined8 local_3ba0;
  undefined8 uStack_3b98;
  undefined8 uStack_3b90;
  undefined8 uStack_3b88;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  undefined8 local_3b60;
  undefined8 uStack_3b58;
  undefined8 uStack_3b50;
  undefined8 uStack_3b48;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 local_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 local_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 local_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 local_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 local_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  float *local_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  float *local_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  float *local_3748;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  float *local_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  float *local_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  float *local_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  float *local_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  float *local_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  float *local_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  float *local_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  float *local_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  float *local_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  float *local_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  float *local_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  float *local_3450;
  undefined1 (*local_3448) [16];
  undefined1 (*local_3440) [16];
  undefined1 (*local_3438) [16];
  undefined1 (*local_3430) [16];
  undefined1 (*local_3428) [16];
  undefined1 (*local_3420) [16];
  undefined1 (*local_3418) [16];
  undefined1 (*local_3410) [16];
  undefined1 (*local_3408) [16];
  undefined1 local_3400 [16];
  undefined1 local_33f0 [16];
  undefined1 local_33e0 [16];
  undefined1 local_33d0 [16];
  undefined1 local_33c0 [16];
  undefined1 local_33b0 [16];
  undefined1 local_33a0 [16];
  undefined1 local_3390 [16];
  undefined1 local_3380 [16];
  undefined1 (*local_3368) [16];
  undefined1 (*local_3360) [16];
  undefined1 (*local_3358) [16];
  undefined1 (*local_3350) [16];
  undefined1 (*local_3348) [16];
  undefined1 (*local_3340) [16];
  undefined1 (*local_3338) [16];
  undefined1 (*local_3330) [16];
  undefined1 (*local_3328) [16];
  undefined1 local_3320 [32];
  undefined4 local_3300;
  undefined4 local_32fc;
  undefined4 local_32f8;
  undefined4 local_32f4;
  undefined4 local_32f0;
  undefined4 local_32ec;
  undefined4 local_32e8;
  undefined4 local_32e4;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_6d04 = *(int *)(in_RSI + 0x2c);
  local_6d08 = *(int *)(in_RSI + 0x30);
  local_6d0c = *(int *)(in_RDI + 0x38);
  local_6cf0 = in_RDX;
  local_6d18 = Mat::operator_cast_to_float_(in_RCX);
  for (local_6d1c = 0; local_6d1c < local_6d0c; local_6d1c = local_6d1c + 1) {
    Mat::channel(this,local_9500._12_4_);
    if (local_6d18 == (float *)0x0) {
      local_6cd4 = 0;
      local_32e4 = 0;
      local_32e8 = 0;
      local_32ec = 0;
      local_32f0 = 0;
      local_32f4 = 0;
      local_32f8 = 0;
      local_32fc = 0;
      local_3300 = 0;
      auVar9 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0),0x20);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0),0x30);
      auVar10 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0),0x20);
      auVar10 = vinsertps_avx(auVar10,ZEXT416(0),0x30);
      auVar31._16_16_ = auVar9;
      auVar31._0_16_ = auVar10;
      local_3320._0_8_ = auVar10._0_8_;
      local_3320._8_8_ = auVar10._8_8_;
      local_3320._16_8_ = auVar9._0_8_;
      local_3320._24_8_ = auVar9._8_8_;
      local_7a20 = local_3320._0_8_;
      uStack_7a18 = local_3320._8_8_;
      uStack_7a10 = local_3320._16_8_;
      uStack_7a08 = local_3320._24_8_;
      local_3320 = auVar31;
    }
    else {
      local_6aa8 = local_6d18 + (local_6d1c << 3);
      local_7a20 = *(undefined8 *)local_6aa8;
      uStack_7a18 = *(undefined8 *)(local_6aa8 + 2);
      uStack_7a10 = *(undefined8 *)(local_6aa8 + 4);
      uStack_7a08 = *(undefined8 *)(local_6aa8 + 6);
    }
    local_6da0 = local_7a20;
    uStack_6d98 = uStack_7a18;
    uStack_6d90 = uStack_7a10;
    uStack_6d88 = uStack_7a08;
    local_6db8 = (undefined1 (*) [16])Mat::row(local_6cf0,local_6d1c);
    local_6dc0 = Mat::row(&local_6d68,0);
    Mat::channel(this,local_9500._12_4_);
    local_6e10 = (undefined1 (*) [32])Mat::row(&local_6e08,0);
    local_6e18 = (undefined1 (*) [32])Mat::row(&local_6e08,1);
    local_6e20 = (undefined1 (*) [32])Mat::row(&local_6e08,2);
    local_3408 = local_6db8;
    local_3368 = local_6db8;
    local_3400 = vlddqu_avx(*local_6db8);
    auVar31 = vcvtph2ps_f16c(local_3400);
    local_7aa0 = auVar31._0_8_;
    uStack_7a98 = auVar31._8_8_;
    uStack_7a90 = auVar31._16_8_;
    uStack_7a88 = auVar31._24_8_;
    local_3410 = local_6db8 + 1;
    local_33f0 = vlddqu_avx(*local_3410);
    auVar1 = vcvtph2ps_f16c(local_33f0);
    local_7ac0 = auVar1._0_8_;
    uStack_7ab8 = auVar1._8_8_;
    uStack_7ab0 = auVar1._16_8_;
    uStack_7aa8 = auVar1._24_8_;
    local_3418 = local_6db8 + 2;
    local_33e0 = vlddqu_avx(*local_3418);
    auVar2 = vcvtph2ps_f16c(local_33e0);
    local_7ae0 = auVar2._0_8_;
    uStack_7ad8 = auVar2._8_8_;
    uStack_7ad0 = auVar2._16_8_;
    uStack_7ac8 = auVar2._24_8_;
    local_3420 = local_6db8 + 3;
    local_33d0 = vlddqu_avx(*local_3420);
    auVar3 = vcvtph2ps_f16c(local_33d0);
    local_7b00 = auVar3._0_8_;
    uStack_7af8 = auVar3._8_8_;
    uStack_7af0 = auVar3._16_8_;
    uStack_7ae8 = auVar3._24_8_;
    local_3428 = local_6db8 + 4;
    local_33c0 = vlddqu_avx(*local_3428);
    auVar4 = vcvtph2ps_f16c(local_33c0);
    local_7b20 = auVar4._0_8_;
    uStack_7b18 = auVar4._8_8_;
    uStack_7b10 = auVar4._16_8_;
    uStack_7b08 = auVar4._24_8_;
    local_3430 = local_6db8 + 5;
    local_33b0 = vlddqu_avx(*local_3430);
    auVar5 = vcvtph2ps_f16c(local_33b0);
    local_7b40 = auVar5._0_8_;
    uStack_7b38 = auVar5._8_8_;
    uStack_7b30 = auVar5._16_8_;
    uStack_7b28 = auVar5._24_8_;
    local_3438 = local_6db8 + 6;
    local_33a0 = vlddqu_avx(*local_3438);
    auVar6 = vcvtph2ps_f16c(local_33a0);
    local_7b60 = auVar6._0_8_;
    uStack_7b58 = auVar6._8_8_;
    uStack_7b50 = auVar6._16_8_;
    uStack_7b48 = auVar6._24_8_;
    local_3440 = local_6db8 + 7;
    local_3390 = vlddqu_avx(*local_3440);
    auVar7 = vcvtph2ps_f16c(local_3390);
    local_7b80 = auVar7._0_8_;
    uStack_7b78 = auVar7._8_8_;
    uStack_7b70 = auVar7._16_8_;
    uStack_7b68 = auVar7._24_8_;
    local_3448 = local_6db8 + 8;
    local_3380 = vlddqu_avx(*local_3448);
    auVar8 = vcvtph2ps_f16c(local_3380);
    local_7ba0 = auVar8._0_8_;
    uStack_7b98 = auVar8._8_8_;
    uStack_7b90 = auVar8._16_8_;
    uStack_7b88 = auVar8._24_8_;
    for (local_6f44 = 0; local_6f44 < local_6d08; local_6f44 = local_6f44 + 1) {
      for (local_6f48 = 0; local_6f48 + 7 < local_6d04; local_6f48 = local_6f48 + 8) {
        local_6ab0 = local_6e10;
        local_3840 = *(undefined8 *)*local_6e10;
        uStack_3838 = *(undefined8 *)(*local_6e10 + 8);
        uStack_3830 = *(undefined8 *)(*local_6e10 + 0x10);
        uStack_3828 = *(undefined8 *)(*local_6e10 + 0x18);
        local_6ab8 = local_6e10 + 1;
        local_3ba0 = *(undefined8 *)*local_6ab8;
        uStack_3b98 = *(undefined8 *)(local_6e10[1] + 8);
        uStack_3b90 = *(undefined8 *)(local_6e10[1] + 0x10);
        uStack_3b88 = *(undefined8 *)(local_6e10[1] + 0x18);
        auVar12 = *local_6ab8;
        local_6ac0 = local_6e10 + 2;
        local_3f00 = *(undefined8 *)*local_6ac0;
        uStack_3ef8 = *(undefined8 *)(local_6e10[2] + 8);
        uStack_3ef0 = *(undefined8 *)(local_6e10[2] + 0x10);
        uStack_3ee8 = *(undefined8 *)(local_6e10[2] + 0x18);
        auVar20 = *local_6ac0;
        auVar13 = *local_6ac0;
        local_6ac8 = local_6e18;
        local_3960 = *(undefined8 *)*local_6e18;
        uStack_3958 = *(undefined8 *)(*local_6e18 + 8);
        uStack_3950 = *(undefined8 *)(*local_6e18 + 0x10);
        uStack_3948 = *(undefined8 *)(*local_6e18 + 0x18);
        local_6ad0 = local_6e18 + 1;
        local_3cc0 = *(undefined8 *)*local_6ad0;
        uStack_3cb8 = *(undefined8 *)(local_6e18[1] + 8);
        uStack_3cb0 = *(undefined8 *)(local_6e18[1] + 0x10);
        uStack_3ca8 = *(undefined8 *)(local_6e18[1] + 0x18);
        auVar14 = *local_6ad0;
        local_6ad8 = local_6e18 + 2;
        local_4020 = *(undefined8 *)*local_6ad8;
        uStack_4018 = *(undefined8 *)(local_6e18[2] + 8);
        uStack_4010 = *(undefined8 *)(local_6e18[2] + 0x10);
        uStack_4008 = *(undefined8 *)(local_6e18[2] + 0x18);
        auVar22 = *local_6ad8;
        auVar15 = *local_6ad8;
        local_6ae0 = local_6e20;
        local_3a80 = *(undefined8 *)*local_6e20;
        uStack_3a78 = *(undefined8 *)(*local_6e20 + 8);
        uStack_3a70 = *(undefined8 *)(*local_6e20 + 0x10);
        uStack_3a68 = *(undefined8 *)(*local_6e20 + 0x18);
        local_6ae8 = local_6e20 + 1;
        local_3de0 = *(undefined8 *)*local_6ae8;
        uStack_3dd8 = *(undefined8 *)(local_6e20[1] + 8);
        uStack_3dd0 = *(undefined8 *)(local_6e20[1] + 0x10);
        uStack_3dc8 = *(undefined8 *)(local_6e20[1] + 0x18);
        auVar17 = *local_6ae8;
        local_6af0 = local_6e20 + 2;
        local_4140 = *(undefined8 *)*local_6af0;
        uStack_4138 = *(undefined8 *)(local_6e20[2] + 8);
        uStack_4130 = *(undefined8 *)(local_6e20[2] + 0x10);
        uStack_4128 = *(undefined8 *)(local_6e20[2] + 0x18);
        auVar24 = *local_6af0;
        auVar18 = *local_6af0;
        local_3820 = local_7aa0;
        uStack_3818 = uStack_7a98;
        uStack_3810 = uStack_7a90;
        uStack_3808 = uStack_7a88;
        local_3860 = local_6da0;
        uStack_3858 = uStack_6d98;
        uStack_3850 = uStack_6d90;
        uStack_3848 = uStack_6d88;
        local_32a0 = local_7aa0;
        uStack_3298 = uStack_7a98;
        uStack_3290 = uStack_7a90;
        uStack_3288 = uStack_7a88;
        local_32e0 = local_6da0;
        uStack_32d8 = uStack_6d98;
        uStack_32d0 = uStack_6d90;
        uStack_32c8 = uStack_6d88;
        auVar30._8_8_ = uStack_6d98;
        auVar30._0_8_ = local_6da0;
        auVar30._16_8_ = uStack_6d90;
        auVar30._24_8_ = uStack_6d88;
        auVar9 = vfmadd213ps_fma(*local_6e10,auVar31,auVar30);
        local_7ce0 = auVar9._0_8_;
        uStack_7cd8 = auVar9._8_8_;
        local_3880 = local_7ac0;
        uStack_3878 = uStack_7ab8;
        uStack_3870 = uStack_7ab0;
        uStack_3868 = uStack_7aa8;
        local_38c0 = local_7ce0;
        uStack_38b8 = uStack_7cd8;
        uStack_38b0 = 0;
        uStack_38a8 = 0;
        local_3240 = local_7ac0;
        uStack_3238 = uStack_7ab8;
        uStack_3230 = uStack_7ab0;
        uStack_3228 = uStack_7aa8;
        local_3280 = local_7ce0;
        uStack_3278 = uStack_7cd8;
        uStack_3270 = 0;
        uStack_3268 = 0;
        auVar9 = vfmadd213ps_fma(*local_6ab8,auVar1,ZEXT1632(auVar9));
        local_7d00 = auVar9._0_8_;
        uStack_7cf8 = auVar9._8_8_;
        local_38e0 = local_7ae0;
        uStack_38d8 = uStack_7ad8;
        uStack_38d0 = uStack_7ad0;
        uStack_38c8 = uStack_7ac8;
        local_3920 = local_7d00;
        uStack_3918 = uStack_7cf8;
        uStack_3910 = 0;
        uStack_3908 = 0;
        local_31e0 = local_7ae0;
        uStack_31d8 = uStack_7ad8;
        uStack_31d0 = uStack_7ad0;
        uStack_31c8 = uStack_7ac8;
        local_3220 = local_7d00;
        uStack_3218 = uStack_7cf8;
        uStack_3210 = 0;
        uStack_3208 = 0;
        auVar9 = vfmadd213ps_fma(*local_6ac0,auVar2,ZEXT1632(auVar9));
        local_7d20 = auVar9._0_8_;
        uStack_7d18 = auVar9._8_8_;
        local_3940 = local_7b00;
        uStack_3938 = uStack_7af8;
        uStack_3930 = uStack_7af0;
        uStack_3928 = uStack_7ae8;
        local_3980 = local_7d20;
        uStack_3978 = uStack_7d18;
        uStack_3970 = 0;
        uStack_3968 = 0;
        local_3180 = local_7b00;
        uStack_3178 = uStack_7af8;
        uStack_3170 = uStack_7af0;
        uStack_3168 = uStack_7ae8;
        local_31c0 = local_7d20;
        uStack_31b8 = uStack_7d18;
        uStack_31b0 = 0;
        uStack_31a8 = 0;
        auVar9 = vfmadd213ps_fma(*local_6e18,auVar3,ZEXT1632(auVar9));
        local_7d40 = auVar9._0_8_;
        uStack_7d38 = auVar9._8_8_;
        local_39a0 = local_7b20;
        uStack_3998 = uStack_7b18;
        uStack_3990 = uStack_7b10;
        uStack_3988 = uStack_7b08;
        local_39e0 = local_7d40;
        uStack_39d8 = uStack_7d38;
        uStack_39d0 = 0;
        uStack_39c8 = 0;
        local_3120 = local_7b20;
        uStack_3118 = uStack_7b18;
        uStack_3110 = uStack_7b10;
        uStack_3108 = uStack_7b08;
        local_3160 = local_7d40;
        uStack_3158 = uStack_7d38;
        uStack_3150 = 0;
        uStack_3148 = 0;
        auVar9 = vfmadd213ps_fma(*local_6ad0,auVar4,ZEXT1632(auVar9));
        local_7d60 = auVar9._0_8_;
        uStack_7d58 = auVar9._8_8_;
        local_3a00 = local_7b40;
        uStack_39f8 = uStack_7b38;
        uStack_39f0 = uStack_7b30;
        uStack_39e8 = uStack_7b28;
        local_3a40 = local_7d60;
        uStack_3a38 = uStack_7d58;
        uStack_3a30 = 0;
        uStack_3a28 = 0;
        local_30c0 = local_7b40;
        uStack_30b8 = uStack_7b38;
        uStack_30b0 = uStack_7b30;
        uStack_30a8 = uStack_7b28;
        local_3100 = local_7d60;
        uStack_30f8 = uStack_7d58;
        uStack_30f0 = 0;
        uStack_30e8 = 0;
        auVar9 = vfmadd213ps_fma(*local_6ad8,auVar5,ZEXT1632(auVar9));
        local_7d80 = auVar9._0_8_;
        uStack_7d78 = auVar9._8_8_;
        local_3a60 = local_7b60;
        uStack_3a58 = uStack_7b58;
        uStack_3a50 = uStack_7b50;
        uStack_3a48 = uStack_7b48;
        local_3aa0 = local_7d80;
        uStack_3a98 = uStack_7d78;
        uStack_3a90 = 0;
        uStack_3a88 = 0;
        local_3060 = local_7b60;
        uStack_3058 = uStack_7b58;
        uStack_3050 = uStack_7b50;
        uStack_3048 = uStack_7b48;
        local_30a0 = local_7d80;
        uStack_3098 = uStack_7d78;
        uStack_3090 = 0;
        uStack_3088 = 0;
        auVar9 = vfmadd213ps_fma(*local_6e20,auVar6,ZEXT1632(auVar9));
        local_7da0 = auVar9._0_8_;
        uStack_7d98 = auVar9._8_8_;
        local_3ac0 = local_7b80;
        uStack_3ab8 = uStack_7b78;
        uStack_3ab0 = uStack_7b70;
        uStack_3aa8 = uStack_7b68;
        local_3b00 = local_7da0;
        uStack_3af8 = uStack_7d98;
        uStack_3af0 = 0;
        uStack_3ae8 = 0;
        local_3000 = local_7b80;
        uStack_2ff8 = uStack_7b78;
        uStack_2ff0 = uStack_7b70;
        uStack_2fe8 = uStack_7b68;
        local_3040 = local_7da0;
        uStack_3038 = uStack_7d98;
        uStack_3030 = 0;
        uStack_3028 = 0;
        auVar9 = vfmadd213ps_fma(*local_6ae8,auVar7,ZEXT1632(auVar9));
        local_7dc0 = auVar9._0_8_;
        uStack_7db8 = auVar9._8_8_;
        local_3b20 = local_7ba0;
        uStack_3b18 = uStack_7b98;
        uStack_3b10 = uStack_7b90;
        uStack_3b08 = uStack_7b88;
        local_3b60 = local_7dc0;
        uStack_3b58 = uStack_7db8;
        uStack_3b50 = 0;
        uStack_3b48 = 0;
        local_2fa0 = local_7ba0;
        uStack_2f98 = uStack_7b98;
        uStack_2f90 = uStack_7b90;
        uStack_2f88 = uStack_7b88;
        local_2fe0 = local_7dc0;
        uStack_2fd8 = uStack_7db8;
        uStack_2fd0 = 0;
        uStack_2fc8 = 0;
        auVar9 = vfmadd213ps_fma(*local_6af0,auVar8,ZEXT1632(auVar9));
        local_7de0 = auVar9._0_8_;
        uStack_7dd8 = auVar9._8_8_;
        local_6af8 = local_6e10 + 3;
        local_4260 = *(undefined8 *)*local_6af8;
        uStack_4258 = *(undefined8 *)(local_6e10[3] + 8);
        uStack_4250 = *(undefined8 *)(local_6e10[3] + 0x10);
        uStack_4248 = *(undefined8 *)(local_6e10[3] + 0x18);
        auVar26 = *local_6af8;
        auVar21 = *local_6af8;
        auVar30 = *local_6af8;
        local_6b00 = local_6e18 + 3;
        local_4380 = *(undefined8 *)*local_6b00;
        uStack_4378 = *(undefined8 *)(local_6e18[3] + 8);
        uStack_4370 = *(undefined8 *)(local_6e18[3] + 0x10);
        uStack_4368 = *(undefined8 *)(local_6e18[3] + 0x18);
        auVar27 = *local_6b00;
        auVar23 = *local_6b00;
        auVar16 = *local_6b00;
        local_6b08 = local_6e20 + 3;
        local_44a0 = *(undefined8 *)*local_6b08;
        uStack_4498 = *(undefined8 *)(local_6e20[3] + 8);
        uStack_4490 = *(undefined8 *)(local_6e20[3] + 0x10);
        uStack_4488 = *(undefined8 *)(local_6e20[3] + 0x18);
        auVar28 = *local_6b08;
        auVar25 = *local_6b08;
        auVar19 = *local_6b08;
        local_3450 = local_6dc0;
        local_3480 = local_7de0;
        uStack_3478 = uStack_7dd8;
        uStack_3470 = 0;
        uStack_3468 = 0;
        *(undefined8 *)local_6dc0 = local_7de0;
        *(undefined8 *)(local_6dc0 + 2) = uStack_7dd8;
        local_3450[4] = 0.0;
        local_3450[5] = 0.0;
        local_3450[6] = 0.0;
        local_3450[7] = 0.0;
        local_3b80 = local_7aa0;
        uStack_3b78 = uStack_7a98;
        uStack_3b70 = uStack_7a90;
        uStack_3b68 = uStack_7a88;
        local_3bc0 = local_6da0;
        uStack_3bb8 = uStack_6d98;
        uStack_3bb0 = uStack_6d90;
        uStack_3ba8 = uStack_6d88;
        local_2f40 = local_7aa0;
        uStack_2f38 = uStack_7a98;
        uStack_2f30 = uStack_7a90;
        uStack_2f28 = uStack_7a88;
        local_2f80 = local_6da0;
        uStack_2f78 = uStack_6d98;
        uStack_2f70 = uStack_6d90;
        uStack_2f68 = uStack_6d88;
        auVar11._8_8_ = uStack_6d98;
        auVar11._0_8_ = local_6da0;
        auVar11._16_8_ = uStack_6d90;
        auVar11._24_8_ = uStack_6d88;
        auVar9 = vfmadd213ps_fma(auVar12,auVar31,auVar11);
        local_7e60 = auVar9._0_8_;
        uStack_7e58 = auVar9._8_8_;
        local_3be0 = local_7ac0;
        uStack_3bd8 = uStack_7ab8;
        uStack_3bd0 = uStack_7ab0;
        uStack_3bc8 = uStack_7aa8;
        local_3c20 = local_7e60;
        uStack_3c18 = uStack_7e58;
        uStack_3c10 = 0;
        uStack_3c08 = 0;
        local_2ee0 = local_7ac0;
        uStack_2ed8 = uStack_7ab8;
        uStack_2ed0 = uStack_7ab0;
        uStack_2ec8 = uStack_7aa8;
        local_2f20 = local_7e60;
        uStack_2f18 = uStack_7e58;
        uStack_2f10 = 0;
        uStack_2f08 = 0;
        auVar9 = vfmadd213ps_fma(auVar13,auVar1,ZEXT1632(auVar9));
        local_7e80 = auVar9._0_8_;
        uStack_7e78 = auVar9._8_8_;
        local_3c40 = local_7ae0;
        uStack_3c38 = uStack_7ad8;
        uStack_3c30 = uStack_7ad0;
        uStack_3c28 = uStack_7ac8;
        local_3c80 = local_7e80;
        uStack_3c78 = uStack_7e78;
        uStack_3c70 = 0;
        uStack_3c68 = 0;
        local_2e80 = local_7ae0;
        uStack_2e78 = uStack_7ad8;
        uStack_2e70 = uStack_7ad0;
        uStack_2e68 = uStack_7ac8;
        local_2ec0 = local_7e80;
        uStack_2eb8 = uStack_7e78;
        uStack_2eb0 = 0;
        uStack_2ea8 = 0;
        auVar9 = vfmadd213ps_fma(auVar30,auVar2,ZEXT1632(auVar9));
        local_7ea0 = auVar9._0_8_;
        uStack_7e98 = auVar9._8_8_;
        local_3ca0 = local_7b00;
        uStack_3c98 = uStack_7af8;
        uStack_3c90 = uStack_7af0;
        uStack_3c88 = uStack_7ae8;
        local_3ce0 = local_7ea0;
        uStack_3cd8 = uStack_7e98;
        uStack_3cd0 = 0;
        uStack_3cc8 = 0;
        local_2e20 = local_7b00;
        uStack_2e18 = uStack_7af8;
        uStack_2e10 = uStack_7af0;
        uStack_2e08 = uStack_7ae8;
        local_2e60 = local_7ea0;
        uStack_2e58 = uStack_7e98;
        uStack_2e50 = 0;
        uStack_2e48 = 0;
        auVar9 = vfmadd213ps_fma(auVar14,auVar3,ZEXT1632(auVar9));
        local_7ec0 = auVar9._0_8_;
        uStack_7eb8 = auVar9._8_8_;
        local_3d00 = local_7b20;
        uStack_3cf8 = uStack_7b18;
        uStack_3cf0 = uStack_7b10;
        uStack_3ce8 = uStack_7b08;
        local_3d40 = local_7ec0;
        uStack_3d38 = uStack_7eb8;
        uStack_3d30 = 0;
        uStack_3d28 = 0;
        local_2dc0 = local_7b20;
        uStack_2db8 = uStack_7b18;
        uStack_2db0 = uStack_7b10;
        uStack_2da8 = uStack_7b08;
        local_2e00 = local_7ec0;
        uStack_2df8 = uStack_7eb8;
        uStack_2df0 = 0;
        uStack_2de8 = 0;
        auVar9 = vfmadd213ps_fma(auVar15,auVar4,ZEXT1632(auVar9));
        local_7ee0 = auVar9._0_8_;
        uStack_7ed8 = auVar9._8_8_;
        local_3d60 = local_7b40;
        uStack_3d58 = uStack_7b38;
        uStack_3d50 = uStack_7b30;
        uStack_3d48 = uStack_7b28;
        local_3da0 = local_7ee0;
        uStack_3d98 = uStack_7ed8;
        uStack_3d90 = 0;
        uStack_3d88 = 0;
        local_2d60 = local_7b40;
        uStack_2d58 = uStack_7b38;
        uStack_2d50 = uStack_7b30;
        uStack_2d48 = uStack_7b28;
        local_2da0 = local_7ee0;
        uStack_2d98 = uStack_7ed8;
        uStack_2d90 = 0;
        uStack_2d88 = 0;
        auVar9 = vfmadd213ps_fma(auVar16,auVar5,ZEXT1632(auVar9));
        local_7f00 = auVar9._0_8_;
        uStack_7ef8 = auVar9._8_8_;
        local_3dc0 = local_7b60;
        uStack_3db8 = uStack_7b58;
        uStack_3db0 = uStack_7b50;
        uStack_3da8 = uStack_7b48;
        local_3e00 = local_7f00;
        uStack_3df8 = uStack_7ef8;
        uStack_3df0 = 0;
        uStack_3de8 = 0;
        local_2d00 = local_7b60;
        uStack_2cf8 = uStack_7b58;
        uStack_2cf0 = uStack_7b50;
        uStack_2ce8 = uStack_7b48;
        local_2d40 = local_7f00;
        uStack_2d38 = uStack_7ef8;
        uStack_2d30 = 0;
        uStack_2d28 = 0;
        auVar9 = vfmadd213ps_fma(auVar17,auVar6,ZEXT1632(auVar9));
        local_7f20 = auVar9._0_8_;
        uStack_7f18 = auVar9._8_8_;
        local_3e20 = local_7b80;
        uStack_3e18 = uStack_7b78;
        uStack_3e10 = uStack_7b70;
        uStack_3e08 = uStack_7b68;
        local_3e60 = local_7f20;
        uStack_3e58 = uStack_7f18;
        uStack_3e50 = 0;
        uStack_3e48 = 0;
        local_2ca0 = local_7b80;
        uStack_2c98 = uStack_7b78;
        uStack_2c90 = uStack_7b70;
        uStack_2c88 = uStack_7b68;
        local_2ce0 = local_7f20;
        uStack_2cd8 = uStack_7f18;
        uStack_2cd0 = 0;
        uStack_2cc8 = 0;
        auVar9 = vfmadd213ps_fma(auVar18,auVar7,ZEXT1632(auVar9));
        local_7f40 = auVar9._0_8_;
        uStack_7f38 = auVar9._8_8_;
        local_3e80 = local_7ba0;
        uStack_3e78 = uStack_7b98;
        uStack_3e70 = uStack_7b90;
        uStack_3e68 = uStack_7b88;
        local_3ec0 = local_7f40;
        uStack_3eb8 = uStack_7f38;
        uStack_3eb0 = 0;
        uStack_3ea8 = 0;
        local_2c40 = local_7ba0;
        uStack_2c38 = uStack_7b98;
        uStack_2c30 = uStack_7b90;
        uStack_2c28 = uStack_7b88;
        local_2c80 = local_7f40;
        uStack_2c78 = uStack_7f38;
        uStack_2c70 = 0;
        uStack_2c68 = 0;
        auVar9 = vfmadd213ps_fma(auVar19,auVar8,ZEXT1632(auVar9));
        local_7f60 = auVar9._0_8_;
        uStack_7f58 = auVar9._8_8_;
        local_6b10 = local_6e10 + 4;
        local_45c0 = *(undefined8 *)*local_6b10;
        uStack_45b8 = *(undefined8 *)(local_6e10[4] + 8);
        uStack_45b0 = *(undefined8 *)(local_6e10[4] + 0x10);
        uStack_45a8 = *(undefined8 *)(local_6e10[4] + 0x18);
        auVar17 = *local_6b10;
        auVar14 = *local_6b10;
        auVar30 = *local_6b10;
        local_6b18 = local_6e18 + 4;
        local_46e0 = *(undefined8 *)*local_6b18;
        uStack_46d8 = *(undefined8 *)(local_6e18[4] + 8);
        uStack_46d0 = *(undefined8 *)(local_6e18[4] + 0x10);
        uStack_46c8 = *(undefined8 *)(local_6e18[4] + 0x18);
        auVar19 = *local_6b18;
        auVar15 = *local_6b18;
        auVar11 = *local_6b18;
        local_6b20 = local_6e20 + 4;
        local_4800 = *(undefined8 *)*local_6b20;
        uStack_47f8 = *(undefined8 *)(local_6e20[4] + 8);
        uStack_47f0 = *(undefined8 *)(local_6e20[4] + 0x10);
        uStack_47e8 = *(undefined8 *)(local_6e20[4] + 0x18);
        auVar29 = *local_6b20;
        auVar16 = *local_6b20;
        auVar13 = *local_6b20;
        local_3488 = local_6dc0 + 8;
        local_34c0 = local_7f60;
        uStack_34b8 = uStack_7f58;
        uStack_34b0 = 0;
        uStack_34a8 = 0;
        *(undefined8 *)local_3488 = local_7f60;
        *(undefined8 *)(local_6dc0 + 10) = uStack_7f58;
        local_3450[0xc] = 0.0;
        local_3450[0xd] = 0.0;
        local_3450[0xe] = 0.0;
        local_3450[0xf] = 0.0;
        local_3ee0 = local_7aa0;
        uStack_3ed8 = uStack_7a98;
        uStack_3ed0 = uStack_7a90;
        uStack_3ec8 = uStack_7a88;
        local_3f20 = local_6da0;
        uStack_3f18 = uStack_6d98;
        uStack_3f10 = uStack_6d90;
        uStack_3f08 = uStack_6d88;
        local_2be0 = local_7aa0;
        uStack_2bd8 = uStack_7a98;
        uStack_2bd0 = uStack_7a90;
        uStack_2bc8 = uStack_7a88;
        local_2c20 = local_6da0;
        uStack_2c18 = uStack_6d98;
        uStack_2c10 = uStack_6d90;
        uStack_2c08 = uStack_6d88;
        auVar12._8_8_ = uStack_6d98;
        auVar12._0_8_ = local_6da0;
        auVar12._16_8_ = uStack_6d90;
        auVar12._24_8_ = uStack_6d88;
        auVar9 = vfmadd213ps_fma(auVar20,auVar31,auVar12);
        local_7fe0 = auVar9._0_8_;
        uStack_7fd8 = auVar9._8_8_;
        local_3f40 = local_7ac0;
        uStack_3f38 = uStack_7ab8;
        uStack_3f30 = uStack_7ab0;
        uStack_3f28 = uStack_7aa8;
        local_3f80 = local_7fe0;
        uStack_3f78 = uStack_7fd8;
        uStack_3f70 = 0;
        uStack_3f68 = 0;
        local_2b80 = local_7ac0;
        uStack_2b78 = uStack_7ab8;
        uStack_2b70 = uStack_7ab0;
        uStack_2b68 = uStack_7aa8;
        local_2bc0 = local_7fe0;
        uStack_2bb8 = uStack_7fd8;
        uStack_2bb0 = 0;
        uStack_2ba8 = 0;
        auVar9 = vfmadd213ps_fma(auVar21,auVar1,ZEXT1632(auVar9));
        local_8000 = auVar9._0_8_;
        uStack_7ff8 = auVar9._8_8_;
        local_3fa0 = local_7ae0;
        uStack_3f98 = uStack_7ad8;
        uStack_3f90 = uStack_7ad0;
        uStack_3f88 = uStack_7ac8;
        local_3fe0 = local_8000;
        uStack_3fd8 = uStack_7ff8;
        uStack_3fd0 = 0;
        uStack_3fc8 = 0;
        local_2b20 = local_7ae0;
        uStack_2b18 = uStack_7ad8;
        uStack_2b10 = uStack_7ad0;
        uStack_2b08 = uStack_7ac8;
        local_2b60 = local_8000;
        uStack_2b58 = uStack_7ff8;
        uStack_2b50 = 0;
        uStack_2b48 = 0;
        auVar9 = vfmadd213ps_fma(auVar30,auVar2,ZEXT1632(auVar9));
        local_8020 = auVar9._0_8_;
        uStack_8018 = auVar9._8_8_;
        local_4000 = local_7b00;
        uStack_3ff8 = uStack_7af8;
        uStack_3ff0 = uStack_7af0;
        uStack_3fe8 = uStack_7ae8;
        local_4040 = local_8020;
        uStack_4038 = uStack_8018;
        uStack_4030 = 0;
        uStack_4028 = 0;
        local_2ac0 = local_7b00;
        uStack_2ab8 = uStack_7af8;
        uStack_2ab0 = uStack_7af0;
        uStack_2aa8 = uStack_7ae8;
        local_2b00 = local_8020;
        uStack_2af8 = uStack_8018;
        uStack_2af0 = 0;
        uStack_2ae8 = 0;
        auVar9 = vfmadd213ps_fma(auVar22,auVar3,ZEXT1632(auVar9));
        local_8040 = auVar9._0_8_;
        uStack_8038 = auVar9._8_8_;
        local_4060 = local_7b20;
        uStack_4058 = uStack_7b18;
        uStack_4050 = uStack_7b10;
        uStack_4048 = uStack_7b08;
        local_40a0 = local_8040;
        uStack_4098 = uStack_8038;
        uStack_4090 = 0;
        uStack_4088 = 0;
        local_2a60 = local_7b20;
        uStack_2a58 = uStack_7b18;
        uStack_2a50 = uStack_7b10;
        uStack_2a48 = uStack_7b08;
        local_2aa0 = local_8040;
        uStack_2a98 = uStack_8038;
        uStack_2a90 = 0;
        uStack_2a88 = 0;
        auVar9 = vfmadd213ps_fma(auVar23,auVar4,ZEXT1632(auVar9));
        local_8060 = auVar9._0_8_;
        uStack_8058 = auVar9._8_8_;
        local_40c0 = local_7b40;
        uStack_40b8 = uStack_7b38;
        uStack_40b0 = uStack_7b30;
        uStack_40a8 = uStack_7b28;
        local_4100 = local_8060;
        uStack_40f8 = uStack_8058;
        uStack_40f0 = 0;
        uStack_40e8 = 0;
        local_2a00 = local_7b40;
        uStack_29f8 = uStack_7b38;
        uStack_29f0 = uStack_7b30;
        uStack_29e8 = uStack_7b28;
        local_2a40 = local_8060;
        uStack_2a38 = uStack_8058;
        uStack_2a30 = 0;
        uStack_2a28 = 0;
        auVar9 = vfmadd213ps_fma(auVar11,auVar5,ZEXT1632(auVar9));
        local_8080 = auVar9._0_8_;
        uStack_8078 = auVar9._8_8_;
        local_4120 = local_7b60;
        uStack_4118 = uStack_7b58;
        uStack_4110 = uStack_7b50;
        uStack_4108 = uStack_7b48;
        local_4160 = local_8080;
        uStack_4158 = uStack_8078;
        uStack_4150 = 0;
        uStack_4148 = 0;
        local_29a0 = local_7b60;
        uStack_2998 = uStack_7b58;
        uStack_2990 = uStack_7b50;
        uStack_2988 = uStack_7b48;
        local_29e0 = local_8080;
        uStack_29d8 = uStack_8078;
        uStack_29d0 = 0;
        uStack_29c8 = 0;
        auVar9 = vfmadd213ps_fma(auVar24,auVar6,ZEXT1632(auVar9));
        local_80a0 = auVar9._0_8_;
        uStack_8098 = auVar9._8_8_;
        local_4180 = local_7b80;
        uStack_4178 = uStack_7b78;
        uStack_4170 = uStack_7b70;
        uStack_4168 = uStack_7b68;
        local_41c0 = local_80a0;
        uStack_41b8 = uStack_8098;
        uStack_41b0 = 0;
        uStack_41a8 = 0;
        local_2940 = local_7b80;
        uStack_2938 = uStack_7b78;
        uStack_2930 = uStack_7b70;
        uStack_2928 = uStack_7b68;
        local_2980 = local_80a0;
        uStack_2978 = uStack_8098;
        uStack_2970 = 0;
        uStack_2968 = 0;
        auVar9 = vfmadd213ps_fma(auVar25,auVar7,ZEXT1632(auVar9));
        local_80c0 = auVar9._0_8_;
        uStack_80b8 = auVar9._8_8_;
        local_41e0 = local_7ba0;
        uStack_41d8 = uStack_7b98;
        uStack_41d0 = uStack_7b90;
        uStack_41c8 = uStack_7b88;
        local_4220 = local_80c0;
        uStack_4218 = uStack_80b8;
        uStack_4210 = 0;
        uStack_4208 = 0;
        local_28e0 = local_7ba0;
        uStack_28d8 = uStack_7b98;
        uStack_28d0 = uStack_7b90;
        uStack_28c8 = uStack_7b88;
        local_2920 = local_80c0;
        uStack_2918 = uStack_80b8;
        uStack_2910 = 0;
        uStack_2908 = 0;
        auVar9 = vfmadd213ps_fma(auVar13,auVar8,ZEXT1632(auVar9));
        local_80e0 = auVar9._0_8_;
        uStack_80d8 = auVar9._8_8_;
        local_6b28 = local_6e10 + 5;
        local_4920 = *(undefined8 *)*local_6b28;
        uStack_4918 = *(undefined8 *)(local_6e10[5] + 8);
        uStack_4910 = *(undefined8 *)(local_6e10[5] + 0x10);
        uStack_4908 = *(undefined8 *)(local_6e10[5] + 0x18);
        auVar22 = *local_6b28;
        auVar18 = *local_6b28;
        auVar30 = *local_6b28;
        local_6b30 = local_6e18 + 5;
        local_4a40 = *(undefined8 *)*local_6b30;
        uStack_4a38 = *(undefined8 *)(local_6e18[5] + 8);
        uStack_4a30 = *(undefined8 *)(local_6e18[5] + 0x10);
        uStack_4a28 = *(undefined8 *)(local_6e18[5] + 0x18);
        auVar23 = *local_6b30;
        auVar20 = *local_6b30;
        auVar11 = *local_6b30;
        local_6b38 = local_6e20 + 5;
        local_4b60 = *(undefined8 *)*local_6b38;
        uStack_4b58 = *(undefined8 *)(local_6e20[5] + 8);
        uStack_4b50 = *(undefined8 *)(local_6e20[5] + 0x10);
        uStack_4b48 = *(undefined8 *)(local_6e20[5] + 0x18);
        auVar24 = *local_6b38;
        auVar21 = *local_6b38;
        auVar12 = *local_6b38;
        local_34c8 = local_6dc0 + 0x10;
        local_3500 = local_80e0;
        uStack_34f8 = uStack_80d8;
        uStack_34f0 = 0;
        uStack_34e8 = 0;
        *(undefined8 *)local_34c8 = local_80e0;
        *(undefined8 *)(local_6dc0 + 0x12) = uStack_80d8;
        local_3450[0x14] = 0.0;
        local_3450[0x15] = 0.0;
        local_3450[0x16] = 0.0;
        local_3450[0x17] = 0.0;
        local_4240 = local_7aa0;
        uStack_4238 = uStack_7a98;
        uStack_4230 = uStack_7a90;
        uStack_4228 = uStack_7a88;
        local_4280 = local_6da0;
        uStack_4278 = uStack_6d98;
        uStack_4270 = uStack_6d90;
        uStack_4268 = uStack_6d88;
        local_2880 = local_7aa0;
        uStack_2878 = uStack_7a98;
        uStack_2870 = uStack_7a90;
        uStack_2868 = uStack_7a88;
        local_28c0 = local_6da0;
        uStack_28b8 = uStack_6d98;
        uStack_28b0 = uStack_6d90;
        uStack_28a8 = uStack_6d88;
        auVar13._8_8_ = uStack_6d98;
        auVar13._0_8_ = local_6da0;
        auVar13._16_8_ = uStack_6d90;
        auVar13._24_8_ = uStack_6d88;
        auVar9 = vfmadd213ps_fma(auVar26,auVar31,auVar13);
        local_8160 = auVar9._0_8_;
        uStack_8158 = auVar9._8_8_;
        local_42a0 = local_7ac0;
        uStack_4298 = uStack_7ab8;
        uStack_4290 = uStack_7ab0;
        uStack_4288 = uStack_7aa8;
        local_42e0 = local_8160;
        uStack_42d8 = uStack_8158;
        uStack_42d0 = 0;
        uStack_42c8 = 0;
        local_2820 = local_7ac0;
        uStack_2818 = uStack_7ab8;
        uStack_2810 = uStack_7ab0;
        uStack_2808 = uStack_7aa8;
        local_2860 = local_8160;
        uStack_2858 = uStack_8158;
        uStack_2850 = 0;
        uStack_2848 = 0;
        auVar9 = vfmadd213ps_fma(auVar14,auVar1,ZEXT1632(auVar9));
        local_8180 = auVar9._0_8_;
        uStack_8178 = auVar9._8_8_;
        local_4300 = local_7ae0;
        uStack_42f8 = uStack_7ad8;
        uStack_42f0 = uStack_7ad0;
        uStack_42e8 = uStack_7ac8;
        local_4340 = local_8180;
        uStack_4338 = uStack_8178;
        uStack_4330 = 0;
        uStack_4328 = 0;
        local_27c0 = local_7ae0;
        uStack_27b8 = uStack_7ad8;
        uStack_27b0 = uStack_7ad0;
        uStack_27a8 = uStack_7ac8;
        local_2800 = local_8180;
        uStack_27f8 = uStack_8178;
        uStack_27f0 = 0;
        uStack_27e8 = 0;
        auVar9 = vfmadd213ps_fma(auVar30,auVar2,ZEXT1632(auVar9));
        local_81a0 = auVar9._0_8_;
        uStack_8198 = auVar9._8_8_;
        local_4360 = local_7b00;
        uStack_4358 = uStack_7af8;
        uStack_4350 = uStack_7af0;
        uStack_4348 = uStack_7ae8;
        local_43a0 = local_81a0;
        uStack_4398 = uStack_8198;
        uStack_4390 = 0;
        uStack_4388 = 0;
        local_2760 = local_7b00;
        uStack_2758 = uStack_7af8;
        uStack_2750 = uStack_7af0;
        uStack_2748 = uStack_7ae8;
        local_27a0 = local_81a0;
        uStack_2798 = uStack_8198;
        uStack_2790 = 0;
        uStack_2788 = 0;
        auVar9 = vfmadd213ps_fma(auVar27,auVar3,ZEXT1632(auVar9));
        local_81c0 = auVar9._0_8_;
        uStack_81b8 = auVar9._8_8_;
        local_43c0 = local_7b20;
        uStack_43b8 = uStack_7b18;
        uStack_43b0 = uStack_7b10;
        uStack_43a8 = uStack_7b08;
        local_4400 = local_81c0;
        uStack_43f8 = uStack_81b8;
        uStack_43f0 = 0;
        uStack_43e8 = 0;
        local_2700 = local_7b20;
        uStack_26f8 = uStack_7b18;
        uStack_26f0 = uStack_7b10;
        uStack_26e8 = uStack_7b08;
        local_2740 = local_81c0;
        uStack_2738 = uStack_81b8;
        uStack_2730 = 0;
        uStack_2728 = 0;
        auVar9 = vfmadd213ps_fma(auVar15,auVar4,ZEXT1632(auVar9));
        local_81e0 = auVar9._0_8_;
        uStack_81d8 = auVar9._8_8_;
        local_4420 = local_7b40;
        uStack_4418 = uStack_7b38;
        uStack_4410 = uStack_7b30;
        uStack_4408 = uStack_7b28;
        local_4460 = local_81e0;
        uStack_4458 = uStack_81d8;
        uStack_4450 = 0;
        uStack_4448 = 0;
        local_26a0 = local_7b40;
        uStack_2698 = uStack_7b38;
        uStack_2690 = uStack_7b30;
        uStack_2688 = uStack_7b28;
        local_26e0 = local_81e0;
        uStack_26d8 = uStack_81d8;
        uStack_26d0 = 0;
        uStack_26c8 = 0;
        auVar9 = vfmadd213ps_fma(auVar11,auVar5,ZEXT1632(auVar9));
        local_8200 = auVar9._0_8_;
        uStack_81f8 = auVar9._8_8_;
        local_4480 = local_7b60;
        uStack_4478 = uStack_7b58;
        uStack_4470 = uStack_7b50;
        uStack_4468 = uStack_7b48;
        local_44c0 = local_8200;
        uStack_44b8 = uStack_81f8;
        uStack_44b0 = 0;
        uStack_44a8 = 0;
        local_2640 = local_7b60;
        uStack_2638 = uStack_7b58;
        uStack_2630 = uStack_7b50;
        uStack_2628 = uStack_7b48;
        local_2680 = local_8200;
        uStack_2678 = uStack_81f8;
        uStack_2670 = 0;
        uStack_2668 = 0;
        auVar9 = vfmadd213ps_fma(auVar28,auVar6,ZEXT1632(auVar9));
        local_8220 = auVar9._0_8_;
        uStack_8218 = auVar9._8_8_;
        local_44e0 = local_7b80;
        uStack_44d8 = uStack_7b78;
        uStack_44d0 = uStack_7b70;
        uStack_44c8 = uStack_7b68;
        local_4520 = local_8220;
        uStack_4518 = uStack_8218;
        uStack_4510 = 0;
        uStack_4508 = 0;
        local_25e0 = local_7b80;
        uStack_25d8 = uStack_7b78;
        uStack_25d0 = uStack_7b70;
        uStack_25c8 = uStack_7b68;
        local_2620 = local_8220;
        uStack_2618 = uStack_8218;
        uStack_2610 = 0;
        uStack_2608 = 0;
        auVar9 = vfmadd213ps_fma(auVar16,auVar7,ZEXT1632(auVar9));
        local_8240 = auVar9._0_8_;
        uStack_8238 = auVar9._8_8_;
        local_4540 = local_7ba0;
        uStack_4538 = uStack_7b98;
        uStack_4530 = uStack_7b90;
        uStack_4528 = uStack_7b88;
        local_4580 = local_8240;
        uStack_4578 = uStack_8238;
        uStack_4570 = 0;
        uStack_4568 = 0;
        local_2580 = local_7ba0;
        uStack_2578 = uStack_7b98;
        uStack_2570 = uStack_7b90;
        uStack_2568 = uStack_7b88;
        local_25c0 = local_8240;
        uStack_25b8 = uStack_8238;
        uStack_25b0 = 0;
        uStack_25a8 = 0;
        auVar9 = vfmadd213ps_fma(auVar12,auVar8,ZEXT1632(auVar9));
        local_8260 = auVar9._0_8_;
        uStack_8258 = auVar9._8_8_;
        local_6b40 = local_6e10 + 6;
        local_4c80 = *(undefined8 *)*local_6b40;
        uStack_4c78 = *(undefined8 *)(local_6e10[6] + 8);
        uStack_4c70 = *(undefined8 *)(local_6e10[6] + 0x10);
        uStack_4c68 = *(undefined8 *)(local_6e10[6] + 0x18);
        auVar26 = *local_6b40;
        auVar13 = *local_6b40;
        auVar30 = *local_6b40;
        local_6b48 = local_6e18 + 6;
        local_4da0 = *(undefined8 *)*local_6b48;
        uStack_4d98 = *(undefined8 *)(local_6e18[6] + 8);
        uStack_4d90 = *(undefined8 *)(local_6e18[6] + 0x10);
        uStack_4d88 = *(undefined8 *)(local_6e18[6] + 0x18);
        auVar27 = *local_6b48;
        auVar16 = *local_6b48;
        auVar11 = *local_6b48;
        local_6b50 = local_6e20 + 6;
        local_4ec0 = *(undefined8 *)*local_6b50;
        uStack_4eb8 = *(undefined8 *)(local_6e20[6] + 8);
        uStack_4eb0 = *(undefined8 *)(local_6e20[6] + 0x10);
        uStack_4ea8 = *(undefined8 *)(local_6e20[6] + 0x18);
        auVar28 = *local_6b50;
        auVar25 = *local_6b50;
        auVar12 = *local_6b50;
        local_3508 = local_6dc0 + 0x18;
        local_3540 = local_8260;
        uStack_3538 = uStack_8258;
        uStack_3530 = 0;
        uStack_3528 = 0;
        *(undefined8 *)local_3508 = local_8260;
        *(undefined8 *)(local_6dc0 + 0x1a) = uStack_8258;
        local_3450[0x1c] = 0.0;
        local_3450[0x1d] = 0.0;
        local_3450[0x1e] = 0.0;
        local_3450[0x1f] = 0.0;
        local_45a0 = local_7aa0;
        uStack_4598 = uStack_7a98;
        uStack_4590 = uStack_7a90;
        uStack_4588 = uStack_7a88;
        local_45e0 = local_6da0;
        uStack_45d8 = uStack_6d98;
        uStack_45d0 = uStack_6d90;
        uStack_45c8 = uStack_6d88;
        local_2520 = local_7aa0;
        uStack_2518 = uStack_7a98;
        uStack_2510 = uStack_7a90;
        uStack_2508 = uStack_7a88;
        local_2560 = local_6da0;
        uStack_2558 = uStack_6d98;
        uStack_2550 = uStack_6d90;
        uStack_2548 = uStack_6d88;
        auVar14._8_8_ = uStack_6d98;
        auVar14._0_8_ = local_6da0;
        auVar14._16_8_ = uStack_6d90;
        auVar14._24_8_ = uStack_6d88;
        auVar9 = vfmadd213ps_fma(auVar17,auVar31,auVar14);
        local_82e0 = auVar9._0_8_;
        uStack_82d8 = auVar9._8_8_;
        local_4600 = local_7ac0;
        uStack_45f8 = uStack_7ab8;
        uStack_45f0 = uStack_7ab0;
        uStack_45e8 = uStack_7aa8;
        local_4640 = local_82e0;
        uStack_4638 = uStack_82d8;
        uStack_4630 = 0;
        uStack_4628 = 0;
        local_24c0 = local_7ac0;
        uStack_24b8 = uStack_7ab8;
        uStack_24b0 = uStack_7ab0;
        uStack_24a8 = uStack_7aa8;
        local_2500 = local_82e0;
        uStack_24f8 = uStack_82d8;
        uStack_24f0 = 0;
        uStack_24e8 = 0;
        auVar9 = vfmadd213ps_fma(auVar18,auVar1,ZEXT1632(auVar9));
        local_8300 = auVar9._0_8_;
        uStack_82f8 = auVar9._8_8_;
        local_4660 = local_7ae0;
        uStack_4658 = uStack_7ad8;
        uStack_4650 = uStack_7ad0;
        uStack_4648 = uStack_7ac8;
        local_46a0 = local_8300;
        uStack_4698 = uStack_82f8;
        uStack_4690 = 0;
        uStack_4688 = 0;
        local_2460 = local_7ae0;
        uStack_2458 = uStack_7ad8;
        uStack_2450 = uStack_7ad0;
        uStack_2448 = uStack_7ac8;
        local_24a0 = local_8300;
        uStack_2498 = uStack_82f8;
        uStack_2490 = 0;
        uStack_2488 = 0;
        auVar9 = vfmadd213ps_fma(auVar30,auVar2,ZEXT1632(auVar9));
        local_8320 = auVar9._0_8_;
        uStack_8318 = auVar9._8_8_;
        local_46c0 = local_7b00;
        uStack_46b8 = uStack_7af8;
        uStack_46b0 = uStack_7af0;
        uStack_46a8 = uStack_7ae8;
        local_4700 = local_8320;
        uStack_46f8 = uStack_8318;
        uStack_46f0 = 0;
        uStack_46e8 = 0;
        local_2400 = local_7b00;
        uStack_23f8 = uStack_7af8;
        uStack_23f0 = uStack_7af0;
        uStack_23e8 = uStack_7ae8;
        local_2440 = local_8320;
        uStack_2438 = uStack_8318;
        uStack_2430 = 0;
        uStack_2428 = 0;
        auVar9 = vfmadd213ps_fma(auVar19,auVar3,ZEXT1632(auVar9));
        local_8340 = auVar9._0_8_;
        uStack_8338 = auVar9._8_8_;
        local_4720 = local_7b20;
        uStack_4718 = uStack_7b18;
        uStack_4710 = uStack_7b10;
        uStack_4708 = uStack_7b08;
        local_4760 = local_8340;
        uStack_4758 = uStack_8338;
        uStack_4750 = 0;
        uStack_4748 = 0;
        local_23a0 = local_7b20;
        uStack_2398 = uStack_7b18;
        uStack_2390 = uStack_7b10;
        uStack_2388 = uStack_7b08;
        local_23e0 = local_8340;
        uStack_23d8 = uStack_8338;
        uStack_23d0 = 0;
        uStack_23c8 = 0;
        auVar9 = vfmadd213ps_fma(auVar20,auVar4,ZEXT1632(auVar9));
        local_8360 = auVar9._0_8_;
        uStack_8358 = auVar9._8_8_;
        local_4780 = local_7b40;
        uStack_4778 = uStack_7b38;
        uStack_4770 = uStack_7b30;
        uStack_4768 = uStack_7b28;
        local_47c0 = local_8360;
        uStack_47b8 = uStack_8358;
        uStack_47b0 = 0;
        uStack_47a8 = 0;
        local_2340 = local_7b40;
        uStack_2338 = uStack_7b38;
        uStack_2330 = uStack_7b30;
        uStack_2328 = uStack_7b28;
        local_2380 = local_8360;
        uStack_2378 = uStack_8358;
        uStack_2370 = 0;
        uStack_2368 = 0;
        auVar9 = vfmadd213ps_fma(auVar11,auVar5,ZEXT1632(auVar9));
        local_8380 = auVar9._0_8_;
        uStack_8378 = auVar9._8_8_;
        local_47e0 = local_7b60;
        uStack_47d8 = uStack_7b58;
        uStack_47d0 = uStack_7b50;
        uStack_47c8 = uStack_7b48;
        local_4820 = local_8380;
        uStack_4818 = uStack_8378;
        uStack_4810 = 0;
        uStack_4808 = 0;
        local_22e0 = local_7b60;
        uStack_22d8 = uStack_7b58;
        uStack_22d0 = uStack_7b50;
        uStack_22c8 = uStack_7b48;
        local_2320 = local_8380;
        uStack_2318 = uStack_8378;
        uStack_2310 = 0;
        uStack_2308 = 0;
        auVar9 = vfmadd213ps_fma(auVar29,auVar6,ZEXT1632(auVar9));
        local_83a0 = auVar9._0_8_;
        uStack_8398 = auVar9._8_8_;
        local_4840 = local_7b80;
        uStack_4838 = uStack_7b78;
        uStack_4830 = uStack_7b70;
        uStack_4828 = uStack_7b68;
        local_4880 = local_83a0;
        uStack_4878 = uStack_8398;
        uStack_4870 = 0;
        uStack_4868 = 0;
        local_2280 = local_7b80;
        uStack_2278 = uStack_7b78;
        uStack_2270 = uStack_7b70;
        uStack_2268 = uStack_7b68;
        local_22c0 = local_83a0;
        uStack_22b8 = uStack_8398;
        uStack_22b0 = 0;
        uStack_22a8 = 0;
        auVar9 = vfmadd213ps_fma(auVar21,auVar7,ZEXT1632(auVar9));
        local_83c0 = auVar9._0_8_;
        uStack_83b8 = auVar9._8_8_;
        local_48a0 = local_7ba0;
        uStack_4898 = uStack_7b98;
        uStack_4890 = uStack_7b90;
        uStack_4888 = uStack_7b88;
        local_48e0 = local_83c0;
        uStack_48d8 = uStack_83b8;
        uStack_48d0 = 0;
        uStack_48c8 = 0;
        local_2220 = local_7ba0;
        uStack_2218 = uStack_7b98;
        uStack_2210 = uStack_7b90;
        uStack_2208 = uStack_7b88;
        local_2260 = local_83c0;
        uStack_2258 = uStack_83b8;
        uStack_2250 = 0;
        uStack_2248 = 0;
        auVar9 = vfmadd213ps_fma(auVar12,auVar8,ZEXT1632(auVar9));
        local_83e0 = auVar9._0_8_;
        uStack_83d8 = auVar9._8_8_;
        local_6b58 = local_6e10 + 7;
        local_4fe0 = *(undefined8 *)*local_6b58;
        uStack_4fd8 = *(undefined8 *)(local_6e10[7] + 8);
        uStack_4fd0 = *(undefined8 *)(local_6e10[7] + 0x10);
        uStack_4fc8 = *(undefined8 *)(local_6e10[7] + 0x18);
        auVar19 = *local_6b58;
        auVar14 = *local_6b58;
        auVar30 = *local_6b58;
        local_6b60 = local_6e18 + 7;
        local_5100 = *(undefined8 *)*local_6b60;
        uStack_50f8 = *(undefined8 *)(local_6e18[7] + 8);
        uStack_50f0 = *(undefined8 *)(local_6e18[7] + 0x10);
        uStack_50e8 = *(undefined8 *)(local_6e18[7] + 0x18);
        auVar20 = *local_6b60;
        auVar17 = *local_6b60;
        auVar11 = *local_6b60;
        local_6b68 = local_6e20 + 7;
        local_5220 = *(undefined8 *)*local_6b68;
        uStack_5218 = *(undefined8 *)(local_6e20[7] + 8);
        uStack_5210 = *(undefined8 *)(local_6e20[7] + 0x10);
        uStack_5208 = *(undefined8 *)(local_6e20[7] + 0x18);
        auVar21 = *local_6b68;
        auVar18 = *local_6b68;
        auVar12 = *local_6b68;
        local_3548 = local_6dc0 + 0x20;
        local_3580 = local_83e0;
        uStack_3578 = uStack_83d8;
        uStack_3570 = 0;
        uStack_3568 = 0;
        *(undefined8 *)local_3548 = local_83e0;
        *(undefined8 *)(local_6dc0 + 0x22) = uStack_83d8;
        local_3450[0x24] = 0.0;
        local_3450[0x25] = 0.0;
        local_3450[0x26] = 0.0;
        local_3450[0x27] = 0.0;
        local_4900 = local_7aa0;
        uStack_48f8 = uStack_7a98;
        uStack_48f0 = uStack_7a90;
        uStack_48e8 = uStack_7a88;
        local_4940 = local_6da0;
        uStack_4938 = uStack_6d98;
        uStack_4930 = uStack_6d90;
        uStack_4928 = uStack_6d88;
        local_21c0 = local_7aa0;
        uStack_21b8 = uStack_7a98;
        uStack_21b0 = uStack_7a90;
        uStack_21a8 = uStack_7a88;
        local_2200 = local_6da0;
        uStack_21f8 = uStack_6d98;
        uStack_21f0 = uStack_6d90;
        uStack_21e8 = uStack_6d88;
        auVar15._8_8_ = uStack_6d98;
        auVar15._0_8_ = local_6da0;
        auVar15._16_8_ = uStack_6d90;
        auVar15._24_8_ = uStack_6d88;
        auVar9 = vfmadd213ps_fma(auVar22,auVar31,auVar15);
        local_8460 = auVar9._0_8_;
        uStack_8458 = auVar9._8_8_;
        local_4960 = local_7ac0;
        uStack_4958 = uStack_7ab8;
        uStack_4950 = uStack_7ab0;
        uStack_4948 = uStack_7aa8;
        local_49a0 = local_8460;
        uStack_4998 = uStack_8458;
        uStack_4990 = 0;
        uStack_4988 = 0;
        local_2160 = local_7ac0;
        uStack_2158 = uStack_7ab8;
        uStack_2150 = uStack_7ab0;
        uStack_2148 = uStack_7aa8;
        local_21a0 = local_8460;
        uStack_2198 = uStack_8458;
        uStack_2190 = 0;
        uStack_2188 = 0;
        auVar9 = vfmadd213ps_fma(auVar13,auVar1,ZEXT1632(auVar9));
        local_8480 = auVar9._0_8_;
        uStack_8478 = auVar9._8_8_;
        local_49c0 = local_7ae0;
        uStack_49b8 = uStack_7ad8;
        uStack_49b0 = uStack_7ad0;
        uStack_49a8 = uStack_7ac8;
        local_4a00 = local_8480;
        uStack_49f8 = uStack_8478;
        uStack_49f0 = 0;
        uStack_49e8 = 0;
        local_2100 = local_7ae0;
        uStack_20f8 = uStack_7ad8;
        uStack_20f0 = uStack_7ad0;
        uStack_20e8 = uStack_7ac8;
        local_2140 = local_8480;
        uStack_2138 = uStack_8478;
        uStack_2130 = 0;
        uStack_2128 = 0;
        auVar9 = vfmadd213ps_fma(auVar30,auVar2,ZEXT1632(auVar9));
        local_84a0 = auVar9._0_8_;
        uStack_8498 = auVar9._8_8_;
        local_4a20 = local_7b00;
        uStack_4a18 = uStack_7af8;
        uStack_4a10 = uStack_7af0;
        uStack_4a08 = uStack_7ae8;
        local_4a60 = local_84a0;
        uStack_4a58 = uStack_8498;
        uStack_4a50 = 0;
        uStack_4a48 = 0;
        local_20a0 = local_7b00;
        uStack_2098 = uStack_7af8;
        uStack_2090 = uStack_7af0;
        uStack_2088 = uStack_7ae8;
        local_20e0 = local_84a0;
        uStack_20d8 = uStack_8498;
        uStack_20d0 = 0;
        uStack_20c8 = 0;
        auVar9 = vfmadd213ps_fma(auVar23,auVar3,ZEXT1632(auVar9));
        local_84c0 = auVar9._0_8_;
        uStack_84b8 = auVar9._8_8_;
        local_4a80 = local_7b20;
        uStack_4a78 = uStack_7b18;
        uStack_4a70 = uStack_7b10;
        uStack_4a68 = uStack_7b08;
        local_4ac0 = local_84c0;
        uStack_4ab8 = uStack_84b8;
        uStack_4ab0 = 0;
        uStack_4aa8 = 0;
        local_2040 = local_7b20;
        uStack_2038 = uStack_7b18;
        uStack_2030 = uStack_7b10;
        uStack_2028 = uStack_7b08;
        local_2080 = local_84c0;
        uStack_2078 = uStack_84b8;
        uStack_2070 = 0;
        uStack_2068 = 0;
        auVar9 = vfmadd213ps_fma(auVar16,auVar4,ZEXT1632(auVar9));
        local_84e0 = auVar9._0_8_;
        uStack_84d8 = auVar9._8_8_;
        local_4ae0 = local_7b40;
        uStack_4ad8 = uStack_7b38;
        uStack_4ad0 = uStack_7b30;
        uStack_4ac8 = uStack_7b28;
        local_4b20 = local_84e0;
        uStack_4b18 = uStack_84d8;
        uStack_4b10 = 0;
        uStack_4b08 = 0;
        local_1fe0 = local_7b40;
        uStack_1fd8 = uStack_7b38;
        uStack_1fd0 = uStack_7b30;
        uStack_1fc8 = uStack_7b28;
        local_2020 = local_84e0;
        uStack_2018 = uStack_84d8;
        uStack_2010 = 0;
        uStack_2008 = 0;
        auVar9 = vfmadd213ps_fma(auVar11,auVar5,ZEXT1632(auVar9));
        local_8500 = auVar9._0_8_;
        uStack_84f8 = auVar9._8_8_;
        local_4b40 = local_7b60;
        uStack_4b38 = uStack_7b58;
        uStack_4b30 = uStack_7b50;
        uStack_4b28 = uStack_7b48;
        local_4b80 = local_8500;
        uStack_4b78 = uStack_84f8;
        uStack_4b70 = 0;
        uStack_4b68 = 0;
        local_1f80 = local_7b60;
        uStack_1f78 = uStack_7b58;
        uStack_1f70 = uStack_7b50;
        uStack_1f68 = uStack_7b48;
        local_1fc0 = local_8500;
        uStack_1fb8 = uStack_84f8;
        uStack_1fb0 = 0;
        uStack_1fa8 = 0;
        auVar9 = vfmadd213ps_fma(auVar24,auVar6,ZEXT1632(auVar9));
        local_8520 = auVar9._0_8_;
        uStack_8518 = auVar9._8_8_;
        local_4ba0 = local_7b80;
        uStack_4b98 = uStack_7b78;
        uStack_4b90 = uStack_7b70;
        uStack_4b88 = uStack_7b68;
        local_4be0 = local_8520;
        uStack_4bd8 = uStack_8518;
        uStack_4bd0 = 0;
        uStack_4bc8 = 0;
        local_1f20 = local_7b80;
        uStack_1f18 = uStack_7b78;
        uStack_1f10 = uStack_7b70;
        uStack_1f08 = uStack_7b68;
        local_1f60 = local_8520;
        uStack_1f58 = uStack_8518;
        uStack_1f50 = 0;
        uStack_1f48 = 0;
        auVar9 = vfmadd213ps_fma(auVar25,auVar7,ZEXT1632(auVar9));
        local_8540 = auVar9._0_8_;
        uStack_8538 = auVar9._8_8_;
        local_4c00 = local_7ba0;
        uStack_4bf8 = uStack_7b98;
        uStack_4bf0 = uStack_7b90;
        uStack_4be8 = uStack_7b88;
        local_4c40 = local_8540;
        uStack_4c38 = uStack_8538;
        uStack_4c30 = 0;
        uStack_4c28 = 0;
        local_1ec0 = local_7ba0;
        uStack_1eb8 = uStack_7b98;
        uStack_1eb0 = uStack_7b90;
        uStack_1ea8 = uStack_7b88;
        local_1f00 = local_8540;
        uStack_1ef8 = uStack_8538;
        uStack_1ef0 = 0;
        uStack_1ee8 = 0;
        auVar9 = vfmadd213ps_fma(auVar12,auVar8,ZEXT1632(auVar9));
        local_8560 = auVar9._0_8_;
        uStack_8558 = auVar9._8_8_;
        local_6b70 = local_6e10 + 8;
        local_5040 = *(undefined8 *)*local_6b70;
        uStack_5038 = *(undefined8 *)(local_6e10[8] + 8);
        uStack_5030 = *(undefined8 *)(local_6e10[8] + 0x10);
        uStack_5028 = *(undefined8 *)(local_6e10[8] + 0x18);
        auVar13 = *local_6b70;
        auVar30 = *local_6b70;
        local_6b78 = local_6e18 + 8;
        local_5160 = *(undefined8 *)*local_6b78;
        uStack_5158 = *(undefined8 *)(local_6e18[8] + 8);
        uStack_5150 = *(undefined8 *)(local_6e18[8] + 0x10);
        uStack_5148 = *(undefined8 *)(local_6e18[8] + 0x18);
        auVar15 = *local_6b78;
        auVar11 = *local_6b78;
        local_6b80 = local_6e20 + 8;
        local_5280 = *(undefined8 *)*local_6b80;
        uStack_5278 = *(undefined8 *)(local_6e20[8] + 8);
        uStack_5270 = *(undefined8 *)(local_6e20[8] + 0x10);
        uStack_5268 = *(undefined8 *)(local_6e20[8] + 0x18);
        auVar22 = *local_6b80;
        auVar12 = *local_6b80;
        local_3588 = local_6dc0 + 0x28;
        local_35c0 = local_8560;
        uStack_35b8 = uStack_8558;
        uStack_35b0 = 0;
        uStack_35a8 = 0;
        *(undefined8 *)local_3588 = local_8560;
        *(undefined8 *)(local_6dc0 + 0x2a) = uStack_8558;
        local_3450[0x2c] = 0.0;
        local_3450[0x2d] = 0.0;
        local_3450[0x2e] = 0.0;
        local_3450[0x2f] = 0.0;
        local_4c60 = local_7aa0;
        uStack_4c58 = uStack_7a98;
        uStack_4c50 = uStack_7a90;
        uStack_4c48 = uStack_7a88;
        local_4ca0 = local_6da0;
        uStack_4c98 = uStack_6d98;
        uStack_4c90 = uStack_6d90;
        uStack_4c88 = uStack_6d88;
        local_1e60 = local_7aa0;
        uStack_1e58 = uStack_7a98;
        uStack_1e50 = uStack_7a90;
        uStack_1e48 = uStack_7a88;
        local_1ea0 = local_6da0;
        uStack_1e98 = uStack_6d98;
        uStack_1e90 = uStack_6d90;
        uStack_1e88 = uStack_6d88;
        auVar16._8_8_ = uStack_6d98;
        auVar16._0_8_ = local_6da0;
        auVar16._16_8_ = uStack_6d90;
        auVar16._24_8_ = uStack_6d88;
        auVar9 = vfmadd213ps_fma(auVar26,auVar31,auVar16);
        local_85e0 = auVar9._0_8_;
        uStack_85d8 = auVar9._8_8_;
        local_4cc0 = local_7ac0;
        uStack_4cb8 = uStack_7ab8;
        uStack_4cb0 = uStack_7ab0;
        uStack_4ca8 = uStack_7aa8;
        local_4d00 = local_85e0;
        uStack_4cf8 = uStack_85d8;
        uStack_4cf0 = 0;
        uStack_4ce8 = 0;
        local_1e00 = local_7ac0;
        uStack_1df8 = uStack_7ab8;
        uStack_1df0 = uStack_7ab0;
        uStack_1de8 = uStack_7aa8;
        local_1e40 = local_85e0;
        uStack_1e38 = uStack_85d8;
        uStack_1e30 = 0;
        uStack_1e28 = 0;
        auVar9 = vfmadd213ps_fma(auVar14,auVar1,ZEXT1632(auVar9));
        local_8600 = auVar9._0_8_;
        uStack_85f8 = auVar9._8_8_;
        local_4d20 = local_7ae0;
        uStack_4d18 = uStack_7ad8;
        uStack_4d10 = uStack_7ad0;
        uStack_4d08 = uStack_7ac8;
        local_4d60 = local_8600;
        uStack_4d58 = uStack_85f8;
        uStack_4d50 = 0;
        uStack_4d48 = 0;
        local_1da0 = local_7ae0;
        uStack_1d98 = uStack_7ad8;
        uStack_1d90 = uStack_7ad0;
        uStack_1d88 = uStack_7ac8;
        local_1de0 = local_8600;
        uStack_1dd8 = uStack_85f8;
        uStack_1dd0 = 0;
        uStack_1dc8 = 0;
        auVar9 = vfmadd213ps_fma(auVar30,auVar2,ZEXT1632(auVar9));
        local_8620 = auVar9._0_8_;
        uStack_8618 = auVar9._8_8_;
        local_4d80 = local_7b00;
        uStack_4d78 = uStack_7af8;
        uStack_4d70 = uStack_7af0;
        uStack_4d68 = uStack_7ae8;
        local_4dc0 = local_8620;
        uStack_4db8 = uStack_8618;
        uStack_4db0 = 0;
        uStack_4da8 = 0;
        local_1d40 = local_7b00;
        uStack_1d38 = uStack_7af8;
        uStack_1d30 = uStack_7af0;
        uStack_1d28 = uStack_7ae8;
        local_1d80 = local_8620;
        uStack_1d78 = uStack_8618;
        uStack_1d70 = 0;
        uStack_1d68 = 0;
        auVar9 = vfmadd213ps_fma(auVar27,auVar3,ZEXT1632(auVar9));
        local_8640 = auVar9._0_8_;
        uStack_8638 = auVar9._8_8_;
        local_4de0 = local_7b20;
        uStack_4dd8 = uStack_7b18;
        uStack_4dd0 = uStack_7b10;
        uStack_4dc8 = uStack_7b08;
        local_4e20 = local_8640;
        uStack_4e18 = uStack_8638;
        uStack_4e10 = 0;
        uStack_4e08 = 0;
        local_1ce0 = local_7b20;
        uStack_1cd8 = uStack_7b18;
        uStack_1cd0 = uStack_7b10;
        uStack_1cc8 = uStack_7b08;
        local_1d20 = local_8640;
        uStack_1d18 = uStack_8638;
        uStack_1d10 = 0;
        uStack_1d08 = 0;
        auVar9 = vfmadd213ps_fma(auVar17,auVar4,ZEXT1632(auVar9));
        local_8660 = auVar9._0_8_;
        uStack_8658 = auVar9._8_8_;
        local_4e40 = local_7b40;
        uStack_4e38 = uStack_7b38;
        uStack_4e30 = uStack_7b30;
        uStack_4e28 = uStack_7b28;
        local_4e80 = local_8660;
        uStack_4e78 = uStack_8658;
        uStack_4e70 = 0;
        uStack_4e68 = 0;
        local_1c80 = local_7b40;
        uStack_1c78 = uStack_7b38;
        uStack_1c70 = uStack_7b30;
        uStack_1c68 = uStack_7b28;
        local_1cc0 = local_8660;
        uStack_1cb8 = uStack_8658;
        uStack_1cb0 = 0;
        uStack_1ca8 = 0;
        auVar9 = vfmadd213ps_fma(auVar11,auVar5,ZEXT1632(auVar9));
        local_8680 = auVar9._0_8_;
        uStack_8678 = auVar9._8_8_;
        local_4ea0 = local_7b60;
        uStack_4e98 = uStack_7b58;
        uStack_4e90 = uStack_7b50;
        uStack_4e88 = uStack_7b48;
        local_4ee0 = local_8680;
        uStack_4ed8 = uStack_8678;
        uStack_4ed0 = 0;
        uStack_4ec8 = 0;
        local_1c20 = local_7b60;
        uStack_1c18 = uStack_7b58;
        uStack_1c10 = uStack_7b50;
        uStack_1c08 = uStack_7b48;
        local_1c60 = local_8680;
        uStack_1c58 = uStack_8678;
        uStack_1c50 = 0;
        uStack_1c48 = 0;
        auVar9 = vfmadd213ps_fma(auVar28,auVar6,ZEXT1632(auVar9));
        local_86a0 = auVar9._0_8_;
        uStack_8698 = auVar9._8_8_;
        local_4f00 = local_7b80;
        uStack_4ef8 = uStack_7b78;
        uStack_4ef0 = uStack_7b70;
        uStack_4ee8 = uStack_7b68;
        local_4f40 = local_86a0;
        uStack_4f38 = uStack_8698;
        uStack_4f30 = 0;
        uStack_4f28 = 0;
        local_1bc0 = local_7b80;
        uStack_1bb8 = uStack_7b78;
        uStack_1bb0 = uStack_7b70;
        uStack_1ba8 = uStack_7b68;
        local_1c00 = local_86a0;
        uStack_1bf8 = uStack_8698;
        uStack_1bf0 = 0;
        uStack_1be8 = 0;
        auVar9 = vfmadd213ps_fma(auVar18,auVar7,ZEXT1632(auVar9));
        local_86c0 = auVar9._0_8_;
        uStack_86b8 = auVar9._8_8_;
        local_4f60 = local_7ba0;
        uStack_4f58 = uStack_7b98;
        uStack_4f50 = uStack_7b90;
        uStack_4f48 = uStack_7b88;
        local_4fa0 = local_86c0;
        uStack_4f98 = uStack_86b8;
        uStack_4f90 = 0;
        uStack_4f88 = 0;
        local_1b60 = local_7ba0;
        uStack_1b58 = uStack_7b98;
        uStack_1b50 = uStack_7b90;
        uStack_1b48 = uStack_7b88;
        local_1ba0 = local_86c0;
        uStack_1b98 = uStack_86b8;
        uStack_1b90 = 0;
        uStack_1b88 = 0;
        auVar9 = vfmadd213ps_fma(auVar12,auVar8,ZEXT1632(auVar9));
        local_86e0 = auVar9._0_8_;
        uStack_86d8 = auVar9._8_8_;
        local_6b88 = local_6e10 + 9;
        local_50a0 = *(undefined8 *)*local_6b88;
        uStack_5098 = *(undefined8 *)(local_6e10[9] + 8);
        uStack_5090 = *(undefined8 *)(local_6e10[9] + 0x10);
        uStack_5088 = *(undefined8 *)(local_6e10[9] + 0x18);
        auVar30 = *local_6b88;
        local_6b90 = local_6e18 + 9;
        local_51c0 = *(undefined8 *)*local_6b90;
        uStack_51b8 = *(undefined8 *)(local_6e18[9] + 8);
        uStack_51b0 = *(undefined8 *)(local_6e18[9] + 0x10);
        uStack_51a8 = *(undefined8 *)(local_6e18[9] + 0x18);
        auVar11 = *local_6b90;
        local_6b98 = local_6e20 + 9;
        local_52e0 = *(undefined8 *)*local_6b98;
        uStack_52d8 = *(undefined8 *)(local_6e20[9] + 8);
        uStack_52d0 = *(undefined8 *)(local_6e20[9] + 0x10);
        uStack_52c8 = *(undefined8 *)(local_6e20[9] + 0x18);
        auVar12 = *local_6b98;
        local_35c8 = local_6dc0 + 0x30;
        local_3600 = local_86e0;
        uStack_35f8 = uStack_86d8;
        uStack_35f0 = 0;
        uStack_35e8 = 0;
        *(undefined8 *)local_35c8 = local_86e0;
        *(undefined8 *)(local_6dc0 + 0x32) = uStack_86d8;
        local_3450[0x34] = 0.0;
        local_3450[0x35] = 0.0;
        local_3450[0x36] = 0.0;
        local_3450[0x37] = 0.0;
        local_4fc0 = local_7aa0;
        uStack_4fb8 = uStack_7a98;
        uStack_4fb0 = uStack_7a90;
        uStack_4fa8 = uStack_7a88;
        local_5000 = local_6da0;
        uStack_4ff8 = uStack_6d98;
        uStack_4ff0 = uStack_6d90;
        uStack_4fe8 = uStack_6d88;
        local_1b00 = local_7aa0;
        uStack_1af8 = uStack_7a98;
        uStack_1af0 = uStack_7a90;
        uStack_1ae8 = uStack_7a88;
        local_1b40 = local_6da0;
        uStack_1b38 = uStack_6d98;
        uStack_1b30 = uStack_6d90;
        uStack_1b28 = uStack_6d88;
        auVar17._8_8_ = uStack_6d98;
        auVar17._0_8_ = local_6da0;
        auVar17._16_8_ = uStack_6d90;
        auVar17._24_8_ = uStack_6d88;
        auVar9 = vfmadd213ps_fma(auVar19,auVar31,auVar17);
        local_8760 = auVar9._0_8_;
        uStack_8758 = auVar9._8_8_;
        local_5020 = local_7ac0;
        uStack_5018 = uStack_7ab8;
        uStack_5010 = uStack_7ab0;
        uStack_5008 = uStack_7aa8;
        local_5060 = local_8760;
        uStack_5058 = uStack_8758;
        uStack_5050 = 0;
        uStack_5048 = 0;
        local_1aa0 = local_7ac0;
        uStack_1a98 = uStack_7ab8;
        uStack_1a90 = uStack_7ab0;
        uStack_1a88 = uStack_7aa8;
        local_1ae0 = local_8760;
        uStack_1ad8 = uStack_8758;
        uStack_1ad0 = 0;
        uStack_1ac8 = 0;
        auVar9 = vfmadd213ps_fma(auVar13,auVar1,ZEXT1632(auVar9));
        local_8780 = auVar9._0_8_;
        uStack_8778 = auVar9._8_8_;
        local_5080 = local_7ae0;
        uStack_5078 = uStack_7ad8;
        uStack_5070 = uStack_7ad0;
        uStack_5068 = uStack_7ac8;
        local_50c0 = local_8780;
        uStack_50b8 = uStack_8778;
        uStack_50b0 = 0;
        uStack_50a8 = 0;
        local_1a40 = local_7ae0;
        uStack_1a38 = uStack_7ad8;
        uStack_1a30 = uStack_7ad0;
        uStack_1a28 = uStack_7ac8;
        local_1a80 = local_8780;
        uStack_1a78 = uStack_8778;
        uStack_1a70 = 0;
        uStack_1a68 = 0;
        auVar9 = vfmadd213ps_fma(auVar30,auVar2,ZEXT1632(auVar9));
        local_87a0 = auVar9._0_8_;
        uStack_8798 = auVar9._8_8_;
        local_50e0 = local_7b00;
        uStack_50d8 = uStack_7af8;
        uStack_50d0 = uStack_7af0;
        uStack_50c8 = uStack_7ae8;
        local_5120 = local_87a0;
        uStack_5118 = uStack_8798;
        uStack_5110 = 0;
        uStack_5108 = 0;
        local_19e0 = local_7b00;
        uStack_19d8 = uStack_7af8;
        uStack_19d0 = uStack_7af0;
        uStack_19c8 = uStack_7ae8;
        local_1a20 = local_87a0;
        uStack_1a18 = uStack_8798;
        uStack_1a10 = 0;
        uStack_1a08 = 0;
        auVar9 = vfmadd213ps_fma(auVar20,auVar3,ZEXT1632(auVar9));
        local_87c0 = auVar9._0_8_;
        uStack_87b8 = auVar9._8_8_;
        local_5140 = local_7b20;
        uStack_5138 = uStack_7b18;
        uStack_5130 = uStack_7b10;
        uStack_5128 = uStack_7b08;
        local_5180 = local_87c0;
        uStack_5178 = uStack_87b8;
        uStack_5170 = 0;
        uStack_5168 = 0;
        local_1980 = local_7b20;
        uStack_1978 = uStack_7b18;
        uStack_1970 = uStack_7b10;
        uStack_1968 = uStack_7b08;
        local_19c0 = local_87c0;
        uStack_19b8 = uStack_87b8;
        uStack_19b0 = 0;
        uStack_19a8 = 0;
        auVar9 = vfmadd213ps_fma(auVar15,auVar4,ZEXT1632(auVar9));
        local_87e0 = auVar9._0_8_;
        uStack_87d8 = auVar9._8_8_;
        local_51a0 = local_7b40;
        uStack_5198 = uStack_7b38;
        uStack_5190 = uStack_7b30;
        uStack_5188 = uStack_7b28;
        local_51e0 = local_87e0;
        uStack_51d8 = uStack_87d8;
        uStack_51d0 = 0;
        uStack_51c8 = 0;
        local_1920 = local_7b40;
        uStack_1918 = uStack_7b38;
        uStack_1910 = uStack_7b30;
        uStack_1908 = uStack_7b28;
        local_1960 = local_87e0;
        uStack_1958 = uStack_87d8;
        uStack_1950 = 0;
        uStack_1948 = 0;
        auVar9 = vfmadd213ps_fma(auVar11,auVar5,ZEXT1632(auVar9));
        local_8800 = auVar9._0_8_;
        uStack_87f8 = auVar9._8_8_;
        local_5200 = local_7b60;
        uStack_51f8 = uStack_7b58;
        uStack_51f0 = uStack_7b50;
        uStack_51e8 = uStack_7b48;
        local_5240 = local_8800;
        uStack_5238 = uStack_87f8;
        uStack_5230 = 0;
        uStack_5228 = 0;
        local_18c0 = local_7b60;
        uStack_18b8 = uStack_7b58;
        uStack_18b0 = uStack_7b50;
        uStack_18a8 = uStack_7b48;
        local_1900 = local_8800;
        uStack_18f8 = uStack_87f8;
        uStack_18f0 = 0;
        uStack_18e8 = 0;
        auVar9 = vfmadd213ps_fma(auVar21,auVar6,ZEXT1632(auVar9));
        local_8820 = auVar9._0_8_;
        uStack_8818 = auVar9._8_8_;
        local_5260 = local_7b80;
        uStack_5258 = uStack_7b78;
        uStack_5250 = uStack_7b70;
        uStack_5248 = uStack_7b68;
        local_52a0 = local_8820;
        uStack_5298 = uStack_8818;
        uStack_5290 = 0;
        uStack_5288 = 0;
        local_1860 = local_7b80;
        uStack_1858 = uStack_7b78;
        uStack_1850 = uStack_7b70;
        uStack_1848 = uStack_7b68;
        local_18a0 = local_8820;
        uStack_1898 = uStack_8818;
        uStack_1890 = 0;
        uStack_1888 = 0;
        auVar9 = vfmadd213ps_fma(auVar22,auVar7,ZEXT1632(auVar9));
        local_8840 = auVar9._0_8_;
        uStack_8838 = auVar9._8_8_;
        local_52c0 = local_7ba0;
        uStack_52b8 = uStack_7b98;
        uStack_52b0 = uStack_7b90;
        uStack_52a8 = uStack_7b88;
        local_5300 = local_8840;
        uStack_52f8 = uStack_8838;
        uStack_52f0 = 0;
        uStack_52e8 = 0;
        local_1800 = local_7ba0;
        uStack_17f8 = uStack_7b98;
        uStack_17f0 = uStack_7b90;
        uStack_17e8 = uStack_7b88;
        local_1840 = local_8840;
        uStack_1838 = uStack_8838;
        uStack_1830 = 0;
        uStack_1828 = 0;
        auVar9 = vfmadd213ps_fma(auVar12,auVar8,ZEXT1632(auVar9));
        local_8860 = auVar9._0_8_;
        uStack_8858 = auVar9._8_8_;
        local_3608 = local_6dc0 + 0x38;
        local_3640 = local_8860;
        uStack_3638 = uStack_8858;
        uStack_3630 = 0;
        uStack_3628 = 0;
        *(undefined8 *)local_3608 = local_8860;
        *(undefined8 *)(local_6dc0 + 0x3a) = uStack_8858;
        local_3450[0x3c] = 0.0;
        local_3450[0x3d] = 0.0;
        local_3450[0x3e] = 0.0;
        local_3450[0x3f] = 0.0;
        local_6e10 = local_6e10 + 8;
        local_6e18 = local_6e18 + 8;
        local_6e20 = local_6e20 + 8;
        local_6dc0 = local_6dc0 + 0x40;
        local_4f80 = local_5280;
        uStack_4f78 = uStack_5278;
        uStack_4f70 = uStack_5270;
        uStack_4f68 = uStack_5268;
        local_4f20 = local_5220;
        uStack_4f18 = uStack_5218;
        uStack_4f10 = uStack_5210;
        uStack_4f08 = uStack_5208;
        local_4e60 = local_5160;
        uStack_4e58 = uStack_5158;
        uStack_4e50 = uStack_5150;
        uStack_4e48 = uStack_5148;
        local_4e00 = local_5100;
        uStack_4df8 = uStack_50f8;
        uStack_4df0 = uStack_50f0;
        uStack_4de8 = uStack_50e8;
        local_4d40 = local_5040;
        uStack_4d38 = uStack_5038;
        uStack_4d30 = uStack_5030;
        uStack_4d28 = uStack_5028;
        local_4ce0 = local_4fe0;
        uStack_4cd8 = uStack_4fd8;
        uStack_4cd0 = uStack_4fd0;
        uStack_4cc8 = uStack_4fc8;
        local_4c20 = local_5220;
        uStack_4c18 = uStack_5218;
        uStack_4c10 = uStack_5210;
        uStack_4c08 = uStack_5208;
        local_4bc0 = local_4ec0;
        uStack_4bb8 = uStack_4eb8;
        uStack_4bb0 = uStack_4eb0;
        uStack_4ba8 = uStack_4ea8;
        local_4b00 = local_5100;
        uStack_4af8 = uStack_50f8;
        uStack_4af0 = uStack_50f0;
        uStack_4ae8 = uStack_50e8;
        local_4aa0 = local_4da0;
        uStack_4a98 = uStack_4d98;
        uStack_4a90 = uStack_4d90;
        uStack_4a88 = uStack_4d88;
        local_49e0 = local_4fe0;
        uStack_49d8 = uStack_4fd8;
        uStack_49d0 = uStack_4fd0;
        uStack_49c8 = uStack_4fc8;
        local_4980 = local_4c80;
        uStack_4978 = uStack_4c78;
        uStack_4970 = uStack_4c70;
        uStack_4968 = uStack_4c68;
        local_48c0 = local_4ec0;
        uStack_48b8 = uStack_4eb8;
        uStack_48b0 = uStack_4eb0;
        uStack_48a8 = uStack_4ea8;
        local_4860 = local_4b60;
        uStack_4858 = uStack_4b58;
        uStack_4850 = uStack_4b50;
        uStack_4848 = uStack_4b48;
        local_47a0 = local_4da0;
        uStack_4798 = uStack_4d98;
        uStack_4790 = uStack_4d90;
        uStack_4788 = uStack_4d88;
        local_4740 = local_4a40;
        uStack_4738 = uStack_4a38;
        uStack_4730 = uStack_4a30;
        uStack_4728 = uStack_4a28;
        local_4680 = local_4c80;
        uStack_4678 = uStack_4c78;
        uStack_4670 = uStack_4c70;
        uStack_4668 = uStack_4c68;
        local_4620 = local_4920;
        uStack_4618 = uStack_4918;
        uStack_4610 = uStack_4910;
        uStack_4608 = uStack_4908;
        local_4560 = local_4b60;
        uStack_4558 = uStack_4b58;
        uStack_4550 = uStack_4b50;
        uStack_4548 = uStack_4b48;
        local_4500 = local_4800;
        uStack_44f8 = uStack_47f8;
        uStack_44f0 = uStack_47f0;
        uStack_44e8 = uStack_47e8;
        local_4440 = local_4a40;
        uStack_4438 = uStack_4a38;
        uStack_4430 = uStack_4a30;
        uStack_4428 = uStack_4a28;
        local_43e0 = local_46e0;
        uStack_43d8 = uStack_46d8;
        uStack_43d0 = uStack_46d0;
        uStack_43c8 = uStack_46c8;
        local_4320 = local_4920;
        uStack_4318 = uStack_4918;
        uStack_4310 = uStack_4910;
        uStack_4308 = uStack_4908;
        local_42c0 = local_45c0;
        uStack_42b8 = uStack_45b8;
        uStack_42b0 = uStack_45b0;
        uStack_42a8 = uStack_45a8;
        local_4200 = local_4800;
        uStack_41f8 = uStack_47f8;
        uStack_41f0 = uStack_47f0;
        uStack_41e8 = uStack_47e8;
        local_41a0 = local_44a0;
        uStack_4198 = uStack_4498;
        uStack_4190 = uStack_4490;
        uStack_4188 = uStack_4488;
        local_40e0 = local_46e0;
        uStack_40d8 = uStack_46d8;
        uStack_40d0 = uStack_46d0;
        uStack_40c8 = uStack_46c8;
        local_4080 = local_4380;
        uStack_4078 = uStack_4378;
        uStack_4070 = uStack_4370;
        uStack_4068 = uStack_4368;
        local_3fc0 = local_45c0;
        uStack_3fb8 = uStack_45b8;
        uStack_3fb0 = uStack_45b0;
        uStack_3fa8 = uStack_45a8;
        local_3f60 = local_4260;
        uStack_3f58 = uStack_4258;
        uStack_3f50 = uStack_4250;
        uStack_3f48 = uStack_4248;
        local_3ea0 = local_44a0;
        uStack_3e98 = uStack_4498;
        uStack_3e90 = uStack_4490;
        uStack_3e88 = uStack_4488;
        local_3e40 = local_4140;
        uStack_3e38 = uStack_4138;
        uStack_3e30 = uStack_4130;
        uStack_3e28 = uStack_4128;
        local_3d80 = local_4380;
        uStack_3d78 = uStack_4378;
        uStack_3d70 = uStack_4370;
        uStack_3d68 = uStack_4368;
        local_3d20 = local_4020;
        uStack_3d18 = uStack_4018;
        uStack_3d10 = uStack_4010;
        uStack_3d08 = uStack_4008;
        local_3c60 = local_4260;
        uStack_3c58 = uStack_4258;
        uStack_3c50 = uStack_4250;
        uStack_3c48 = uStack_4248;
        local_3c00 = local_3f00;
        uStack_3bf8 = uStack_3ef8;
        uStack_3bf0 = uStack_3ef0;
        uStack_3be8 = uStack_3ee8;
        local_3b40 = local_4140;
        uStack_3b38 = uStack_4138;
        uStack_3b30 = uStack_4130;
        uStack_3b28 = uStack_4128;
        local_3ae0 = local_3de0;
        uStack_3ad8 = uStack_3dd8;
        uStack_3ad0 = uStack_3dd0;
        uStack_3ac8 = uStack_3dc8;
        local_3a20 = local_4020;
        uStack_3a18 = uStack_4018;
        uStack_3a10 = uStack_4010;
        uStack_3a08 = uStack_4008;
        local_39c0 = local_3cc0;
        uStack_39b8 = uStack_3cb8;
        uStack_39b0 = uStack_3cb0;
        uStack_39a8 = uStack_3ca8;
        local_3900 = local_3f00;
        uStack_38f8 = uStack_3ef8;
        uStack_38f0 = uStack_3ef0;
        uStack_38e8 = uStack_3ee8;
        local_38a0 = local_3ba0;
        uStack_3898 = uStack_3b98;
        uStack_3890 = uStack_3b90;
        uStack_3888 = uStack_3b88;
        local_32c0 = local_3840;
        uStack_32b8 = uStack_3838;
        uStack_32b0 = uStack_3830;
        uStack_32a8 = uStack_3828;
        local_3260 = local_3ba0;
        uStack_3258 = uStack_3b98;
        uStack_3250 = uStack_3b90;
        uStack_3248 = uStack_3b88;
        local_3200 = local_3f00;
        uStack_31f8 = uStack_3ef8;
        uStack_31f0 = uStack_3ef0;
        uStack_31e8 = uStack_3ee8;
        local_31a0 = local_3960;
        uStack_3198 = uStack_3958;
        uStack_3190 = uStack_3950;
        uStack_3188 = uStack_3948;
        local_3140 = local_3cc0;
        uStack_3138 = uStack_3cb8;
        uStack_3130 = uStack_3cb0;
        uStack_3128 = uStack_3ca8;
        local_30e0 = local_4020;
        uStack_30d8 = uStack_4018;
        uStack_30d0 = uStack_4010;
        uStack_30c8 = uStack_4008;
        local_3080 = local_3a80;
        uStack_3078 = uStack_3a78;
        uStack_3070 = uStack_3a70;
        uStack_3068 = uStack_3a68;
        local_3020 = local_3de0;
        uStack_3018 = uStack_3dd8;
        uStack_3010 = uStack_3dd0;
        uStack_3008 = uStack_3dc8;
        local_2fc0 = local_4140;
        uStack_2fb8 = uStack_4138;
        uStack_2fb0 = uStack_4130;
        uStack_2fa8 = uStack_4128;
        local_2f60 = local_3ba0;
        uStack_2f58 = uStack_3b98;
        uStack_2f50 = uStack_3b90;
        uStack_2f48 = uStack_3b88;
        local_2f00 = local_3f00;
        uStack_2ef8 = uStack_3ef8;
        uStack_2ef0 = uStack_3ef0;
        uStack_2ee8 = uStack_3ee8;
        local_2ea0 = local_4260;
        uStack_2e98 = uStack_4258;
        uStack_2e90 = uStack_4250;
        uStack_2e88 = uStack_4248;
        local_2e40 = local_3cc0;
        uStack_2e38 = uStack_3cb8;
        uStack_2e30 = uStack_3cb0;
        uStack_2e28 = uStack_3ca8;
        local_2de0 = local_4020;
        uStack_2dd8 = uStack_4018;
        uStack_2dd0 = uStack_4010;
        uStack_2dc8 = uStack_4008;
        local_2d80 = local_4380;
        uStack_2d78 = uStack_4378;
        uStack_2d70 = uStack_4370;
        uStack_2d68 = uStack_4368;
        local_2d20 = local_3de0;
        uStack_2d18 = uStack_3dd8;
        uStack_2d10 = uStack_3dd0;
        uStack_2d08 = uStack_3dc8;
        local_2cc0 = local_4140;
        uStack_2cb8 = uStack_4138;
        uStack_2cb0 = uStack_4130;
        uStack_2ca8 = uStack_4128;
        local_2c60 = local_44a0;
        uStack_2c58 = uStack_4498;
        uStack_2c50 = uStack_4490;
        uStack_2c48 = uStack_4488;
        local_2c00 = local_3f00;
        uStack_2bf8 = uStack_3ef8;
        uStack_2bf0 = uStack_3ef0;
        uStack_2be8 = uStack_3ee8;
        local_2ba0 = local_4260;
        uStack_2b98 = uStack_4258;
        uStack_2b90 = uStack_4250;
        uStack_2b88 = uStack_4248;
        local_2b40 = local_45c0;
        uStack_2b38 = uStack_45b8;
        uStack_2b30 = uStack_45b0;
        uStack_2b28 = uStack_45a8;
        local_2ae0 = local_4020;
        uStack_2ad8 = uStack_4018;
        uStack_2ad0 = uStack_4010;
        uStack_2ac8 = uStack_4008;
        local_2a80 = local_4380;
        uStack_2a78 = uStack_4378;
        uStack_2a70 = uStack_4370;
        uStack_2a68 = uStack_4368;
        local_2a20 = local_46e0;
        uStack_2a18 = uStack_46d8;
        uStack_2a10 = uStack_46d0;
        uStack_2a08 = uStack_46c8;
        local_29c0 = local_4140;
        uStack_29b8 = uStack_4138;
        uStack_29b0 = uStack_4130;
        uStack_29a8 = uStack_4128;
        local_2960 = local_44a0;
        uStack_2958 = uStack_4498;
        uStack_2950 = uStack_4490;
        uStack_2948 = uStack_4488;
        local_2900 = local_4800;
        uStack_28f8 = uStack_47f8;
        uStack_28f0 = uStack_47f0;
        uStack_28e8 = uStack_47e8;
        local_28a0 = local_4260;
        uStack_2898 = uStack_4258;
        uStack_2890 = uStack_4250;
        uStack_2888 = uStack_4248;
        local_2840 = local_45c0;
        uStack_2838 = uStack_45b8;
        uStack_2830 = uStack_45b0;
        uStack_2828 = uStack_45a8;
        local_27e0 = local_4920;
        uStack_27d8 = uStack_4918;
        uStack_27d0 = uStack_4910;
        uStack_27c8 = uStack_4908;
        local_2780 = local_4380;
        uStack_2778 = uStack_4378;
        uStack_2770 = uStack_4370;
        uStack_2768 = uStack_4368;
        local_2720 = local_46e0;
        uStack_2718 = uStack_46d8;
        uStack_2710 = uStack_46d0;
        uStack_2708 = uStack_46c8;
        local_26c0 = local_4a40;
        uStack_26b8 = uStack_4a38;
        uStack_26b0 = uStack_4a30;
        uStack_26a8 = uStack_4a28;
        local_2660 = local_44a0;
        uStack_2658 = uStack_4498;
        uStack_2650 = uStack_4490;
        uStack_2648 = uStack_4488;
        local_2600 = local_4800;
        uStack_25f8 = uStack_47f8;
        uStack_25f0 = uStack_47f0;
        uStack_25e8 = uStack_47e8;
        local_25a0 = local_4b60;
        uStack_2598 = uStack_4b58;
        uStack_2590 = uStack_4b50;
        uStack_2588 = uStack_4b48;
        local_2540 = local_45c0;
        uStack_2538 = uStack_45b8;
        uStack_2530 = uStack_45b0;
        uStack_2528 = uStack_45a8;
        local_24e0 = local_4920;
        uStack_24d8 = uStack_4918;
        uStack_24d0 = uStack_4910;
        uStack_24c8 = uStack_4908;
        local_2480 = local_4c80;
        uStack_2478 = uStack_4c78;
        uStack_2470 = uStack_4c70;
        uStack_2468 = uStack_4c68;
        local_2420 = local_46e0;
        uStack_2418 = uStack_46d8;
        uStack_2410 = uStack_46d0;
        uStack_2408 = uStack_46c8;
        local_23c0 = local_4a40;
        uStack_23b8 = uStack_4a38;
        uStack_23b0 = uStack_4a30;
        uStack_23a8 = uStack_4a28;
        local_2360 = local_4da0;
        uStack_2358 = uStack_4d98;
        uStack_2350 = uStack_4d90;
        uStack_2348 = uStack_4d88;
        local_2300 = local_4800;
        uStack_22f8 = uStack_47f8;
        uStack_22f0 = uStack_47f0;
        uStack_22e8 = uStack_47e8;
        local_22a0 = local_4b60;
        uStack_2298 = uStack_4b58;
        uStack_2290 = uStack_4b50;
        uStack_2288 = uStack_4b48;
        local_2240 = local_4ec0;
        uStack_2238 = uStack_4eb8;
        uStack_2230 = uStack_4eb0;
        uStack_2228 = uStack_4ea8;
        local_21e0 = local_4920;
        uStack_21d8 = uStack_4918;
        uStack_21d0 = uStack_4910;
        uStack_21c8 = uStack_4908;
        local_2180 = local_4c80;
        uStack_2178 = uStack_4c78;
        uStack_2170 = uStack_4c70;
        uStack_2168 = uStack_4c68;
        local_2120 = local_4fe0;
        uStack_2118 = uStack_4fd8;
        uStack_2110 = uStack_4fd0;
        uStack_2108 = uStack_4fc8;
        local_20c0 = local_4a40;
        uStack_20b8 = uStack_4a38;
        uStack_20b0 = uStack_4a30;
        uStack_20a8 = uStack_4a28;
        local_2060 = local_4da0;
        uStack_2058 = uStack_4d98;
        uStack_2050 = uStack_4d90;
        uStack_2048 = uStack_4d88;
        local_2000 = local_5100;
        uStack_1ff8 = uStack_50f8;
        uStack_1ff0 = uStack_50f0;
        uStack_1fe8 = uStack_50e8;
        local_1fa0 = local_4b60;
        uStack_1f98 = uStack_4b58;
        uStack_1f90 = uStack_4b50;
        uStack_1f88 = uStack_4b48;
        local_1f40 = local_4ec0;
        uStack_1f38 = uStack_4eb8;
        uStack_1f30 = uStack_4eb0;
        uStack_1f28 = uStack_4ea8;
        local_1ee0 = local_5220;
        uStack_1ed8 = uStack_5218;
        uStack_1ed0 = uStack_5210;
        uStack_1ec8 = uStack_5208;
        local_1e80 = local_4c80;
        uStack_1e78 = uStack_4c78;
        uStack_1e70 = uStack_4c70;
        uStack_1e68 = uStack_4c68;
        local_1e20 = local_4fe0;
        uStack_1e18 = uStack_4fd8;
        uStack_1e10 = uStack_4fd0;
        uStack_1e08 = uStack_4fc8;
        local_1dc0 = local_5040;
        uStack_1db8 = uStack_5038;
        uStack_1db0 = uStack_5030;
        uStack_1da8 = uStack_5028;
        local_1d60 = local_4da0;
        uStack_1d58 = uStack_4d98;
        uStack_1d50 = uStack_4d90;
        uStack_1d48 = uStack_4d88;
        local_1d00 = local_5100;
        uStack_1cf8 = uStack_50f8;
        uStack_1cf0 = uStack_50f0;
        uStack_1ce8 = uStack_50e8;
        local_1ca0 = local_5160;
        uStack_1c98 = uStack_5158;
        uStack_1c90 = uStack_5150;
        uStack_1c88 = uStack_5148;
        local_1c40 = local_4ec0;
        uStack_1c38 = uStack_4eb8;
        uStack_1c30 = uStack_4eb0;
        uStack_1c28 = uStack_4ea8;
        local_1be0 = local_5220;
        uStack_1bd8 = uStack_5218;
        uStack_1bd0 = uStack_5210;
        uStack_1bc8 = uStack_5208;
        local_1b80 = local_5280;
        uStack_1b78 = uStack_5278;
        uStack_1b70 = uStack_5270;
        uStack_1b68 = uStack_5268;
        local_1b20 = local_4fe0;
        uStack_1b18 = uStack_4fd8;
        uStack_1b10 = uStack_4fd0;
        uStack_1b08 = uStack_4fc8;
        local_1ac0 = local_5040;
        uStack_1ab8 = uStack_5038;
        uStack_1ab0 = uStack_5030;
        uStack_1aa8 = uStack_5028;
        local_1a60 = local_50a0;
        uStack_1a58 = uStack_5098;
        uStack_1a50 = uStack_5090;
        uStack_1a48 = uStack_5088;
        local_1a00 = local_5100;
        uStack_19f8 = uStack_50f8;
        uStack_19f0 = uStack_50f0;
        uStack_19e8 = uStack_50e8;
        local_19a0 = local_5160;
        uStack_1998 = uStack_5158;
        uStack_1990 = uStack_5150;
        uStack_1988 = uStack_5148;
        local_1940 = local_51c0;
        uStack_1938 = uStack_51b8;
        uStack_1930 = uStack_51b0;
        uStack_1928 = uStack_51a8;
        local_18e0 = local_5220;
        uStack_18d8 = uStack_5218;
        uStack_18d0 = uStack_5210;
        uStack_18c8 = uStack_5208;
        local_1880 = local_5280;
        uStack_1878 = uStack_5278;
        uStack_1870 = uStack_5270;
        uStack_1868 = uStack_5268;
        local_1820 = local_52e0;
        uStack_1818 = uStack_52d8;
        uStack_1810 = uStack_52d0;
        uStack_1808 = uStack_52c8;
      }
      for (; local_6f48 + 3 < local_6d04; local_6f48 = local_6f48 + 4) {
        local_6ba0 = local_6e10;
        local_5340 = *(undefined8 *)*local_6e10;
        uStack_5338 = *(undefined8 *)(*local_6e10 + 8);
        uStack_5330 = *(undefined8 *)(*local_6e10 + 0x10);
        uStack_5328 = *(undefined8 *)(*local_6e10 + 0x18);
        local_6ba8 = local_6e10 + 1;
        local_56a0 = *(undefined8 *)*local_6ba8;
        uStack_5698 = *(undefined8 *)(local_6e10[1] + 8);
        uStack_5690 = *(undefined8 *)(local_6e10[1] + 0x10);
        uStack_5688 = *(undefined8 *)(local_6e10[1] + 0x18);
        auVar30 = *local_6ba8;
        local_6bb0 = local_6e10 + 2;
        local_5a00 = *(undefined8 *)*local_6bb0;
        uStack_59f8 = *(undefined8 *)(local_6e10[2] + 8);
        uStack_59f0 = *(undefined8 *)(local_6e10[2] + 0x10);
        uStack_59e8 = *(undefined8 *)(local_6e10[2] + 0x18);
        auVar21 = *local_6bb0;
        auVar11 = *local_6bb0;
        local_6bb8 = local_6e18;
        local_5460 = *(undefined8 *)*local_6e18;
        uStack_5458 = *(undefined8 *)(*local_6e18 + 8);
        uStack_5450 = *(undefined8 *)(*local_6e18 + 0x10);
        uStack_5448 = *(undefined8 *)(*local_6e18 + 0x18);
        local_6bc0 = local_6e18 + 1;
        local_57c0 = *(undefined8 *)*local_6bc0;
        uStack_57b8 = *(undefined8 *)(local_6e18[1] + 8);
        uStack_57b0 = *(undefined8 *)(local_6e18[1] + 0x10);
        uStack_57a8 = *(undefined8 *)(local_6e18[1] + 0x18);
        auVar13 = *local_6bc0;
        local_6bc8 = local_6e18 + 2;
        local_5b20 = *(undefined8 *)*local_6bc8;
        uStack_5b18 = *(undefined8 *)(local_6e18[2] + 8);
        uStack_5b10 = *(undefined8 *)(local_6e18[2] + 0x10);
        uStack_5b08 = *(undefined8 *)(local_6e18[2] + 0x18);
        auVar23 = *local_6bc8;
        auVar14 = *local_6bc8;
        local_6bd0 = local_6e20;
        local_5580 = *(undefined8 *)*local_6e20;
        uStack_5578 = *(undefined8 *)(*local_6e20 + 8);
        uStack_5570 = *(undefined8 *)(*local_6e20 + 0x10);
        uStack_5568 = *(undefined8 *)(*local_6e20 + 0x18);
        local_6bd8 = local_6e20 + 1;
        local_58e0 = *(undefined8 *)*local_6bd8;
        uStack_58d8 = *(undefined8 *)(local_6e20[1] + 8);
        uStack_58d0 = *(undefined8 *)(local_6e20[1] + 0x10);
        uStack_58c8 = *(undefined8 *)(local_6e20[1] + 0x18);
        auVar16 = *local_6bd8;
        local_6be0 = local_6e20 + 2;
        local_5c40 = *(undefined8 *)*local_6be0;
        uStack_5c38 = *(undefined8 *)(local_6e20[2] + 8);
        uStack_5c30 = *(undefined8 *)(local_6e20[2] + 0x10);
        uStack_5c28 = *(undefined8 *)(local_6e20[2] + 0x18);
        auVar25 = *local_6be0;
        auVar17 = *local_6be0;
        local_5320 = local_7aa0;
        uStack_5318 = uStack_7a98;
        uStack_5310 = uStack_7a90;
        uStack_5308 = uStack_7a88;
        local_5360 = local_6da0;
        uStack_5358 = uStack_6d98;
        uStack_5350 = uStack_6d90;
        uStack_5348 = uStack_6d88;
        local_17a0 = local_7aa0;
        uStack_1798 = uStack_7a98;
        uStack_1790 = uStack_7a90;
        uStack_1788 = uStack_7a88;
        local_17e0 = local_6da0;
        uStack_17d8 = uStack_6d98;
        uStack_17d0 = uStack_6d90;
        uStack_17c8 = uStack_6d88;
        auVar18._8_8_ = uStack_6d98;
        auVar18._0_8_ = local_6da0;
        auVar18._16_8_ = uStack_6d90;
        auVar18._24_8_ = uStack_6d88;
        auVar9 = vfmadd213ps_fma(*local_6e10,auVar31,auVar18);
        local_89a0 = auVar9._0_8_;
        uStack_8998 = auVar9._8_8_;
        local_5380 = local_7ac0;
        uStack_5378 = uStack_7ab8;
        uStack_5370 = uStack_7ab0;
        uStack_5368 = uStack_7aa8;
        local_53c0 = local_89a0;
        uStack_53b8 = uStack_8998;
        uStack_53b0 = 0;
        uStack_53a8 = 0;
        local_1740 = local_7ac0;
        uStack_1738 = uStack_7ab8;
        uStack_1730 = uStack_7ab0;
        uStack_1728 = uStack_7aa8;
        local_1780 = local_89a0;
        uStack_1778 = uStack_8998;
        uStack_1770 = 0;
        uStack_1768 = 0;
        auVar9 = vfmadd213ps_fma(*local_6ba8,auVar1,ZEXT1632(auVar9));
        local_89c0 = auVar9._0_8_;
        uStack_89b8 = auVar9._8_8_;
        local_53e0 = local_7ae0;
        uStack_53d8 = uStack_7ad8;
        uStack_53d0 = uStack_7ad0;
        uStack_53c8 = uStack_7ac8;
        local_5420 = local_89c0;
        uStack_5418 = uStack_89b8;
        uStack_5410 = 0;
        uStack_5408 = 0;
        local_16e0 = local_7ae0;
        uStack_16d8 = uStack_7ad8;
        uStack_16d0 = uStack_7ad0;
        uStack_16c8 = uStack_7ac8;
        local_1720 = local_89c0;
        uStack_1718 = uStack_89b8;
        uStack_1710 = 0;
        uStack_1708 = 0;
        auVar9 = vfmadd213ps_fma(*local_6bb0,auVar2,ZEXT1632(auVar9));
        local_89e0 = auVar9._0_8_;
        uStack_89d8 = auVar9._8_8_;
        local_5440 = local_7b00;
        uStack_5438 = uStack_7af8;
        uStack_5430 = uStack_7af0;
        uStack_5428 = uStack_7ae8;
        local_5480 = local_89e0;
        uStack_5478 = uStack_89d8;
        uStack_5470 = 0;
        uStack_5468 = 0;
        local_1680 = local_7b00;
        uStack_1678 = uStack_7af8;
        uStack_1670 = uStack_7af0;
        uStack_1668 = uStack_7ae8;
        local_16c0 = local_89e0;
        uStack_16b8 = uStack_89d8;
        uStack_16b0 = 0;
        uStack_16a8 = 0;
        auVar9 = vfmadd213ps_fma(*local_6e18,auVar3,ZEXT1632(auVar9));
        local_8a00 = auVar9._0_8_;
        uStack_89f8 = auVar9._8_8_;
        local_54a0 = local_7b20;
        uStack_5498 = uStack_7b18;
        uStack_5490 = uStack_7b10;
        uStack_5488 = uStack_7b08;
        local_54e0 = local_8a00;
        uStack_54d8 = uStack_89f8;
        uStack_54d0 = 0;
        uStack_54c8 = 0;
        local_1620 = local_7b20;
        uStack_1618 = uStack_7b18;
        uStack_1610 = uStack_7b10;
        uStack_1608 = uStack_7b08;
        local_1660 = local_8a00;
        uStack_1658 = uStack_89f8;
        uStack_1650 = 0;
        uStack_1648 = 0;
        auVar9 = vfmadd213ps_fma(*local_6bc0,auVar4,ZEXT1632(auVar9));
        local_8a20 = auVar9._0_8_;
        uStack_8a18 = auVar9._8_8_;
        local_5500 = local_7b40;
        uStack_54f8 = uStack_7b38;
        uStack_54f0 = uStack_7b30;
        uStack_54e8 = uStack_7b28;
        local_5540 = local_8a20;
        uStack_5538 = uStack_8a18;
        uStack_5530 = 0;
        uStack_5528 = 0;
        local_15c0 = local_7b40;
        uStack_15b8 = uStack_7b38;
        uStack_15b0 = uStack_7b30;
        uStack_15a8 = uStack_7b28;
        local_1600 = local_8a20;
        uStack_15f8 = uStack_8a18;
        uStack_15f0 = 0;
        uStack_15e8 = 0;
        auVar9 = vfmadd213ps_fma(*local_6bc8,auVar5,ZEXT1632(auVar9));
        local_8a40 = auVar9._0_8_;
        uStack_8a38 = auVar9._8_8_;
        local_5560 = local_7b60;
        uStack_5558 = uStack_7b58;
        uStack_5550 = uStack_7b50;
        uStack_5548 = uStack_7b48;
        local_55a0 = local_8a40;
        uStack_5598 = uStack_8a38;
        uStack_5590 = 0;
        uStack_5588 = 0;
        local_1560 = local_7b60;
        uStack_1558 = uStack_7b58;
        uStack_1550 = uStack_7b50;
        uStack_1548 = uStack_7b48;
        local_15a0 = local_8a40;
        uStack_1598 = uStack_8a38;
        uStack_1590 = 0;
        uStack_1588 = 0;
        auVar9 = vfmadd213ps_fma(*local_6e20,auVar6,ZEXT1632(auVar9));
        local_8a60 = auVar9._0_8_;
        uStack_8a58 = auVar9._8_8_;
        local_55c0 = local_7b80;
        uStack_55b8 = uStack_7b78;
        uStack_55b0 = uStack_7b70;
        uStack_55a8 = uStack_7b68;
        local_5600 = local_8a60;
        uStack_55f8 = uStack_8a58;
        uStack_55f0 = 0;
        uStack_55e8 = 0;
        local_1500 = local_7b80;
        uStack_14f8 = uStack_7b78;
        uStack_14f0 = uStack_7b70;
        uStack_14e8 = uStack_7b68;
        local_1540 = local_8a60;
        uStack_1538 = uStack_8a58;
        uStack_1530 = 0;
        uStack_1528 = 0;
        auVar9 = vfmadd213ps_fma(*local_6bd8,auVar7,ZEXT1632(auVar9));
        local_8a80 = auVar9._0_8_;
        uStack_8a78 = auVar9._8_8_;
        local_5620 = local_7ba0;
        uStack_5618 = uStack_7b98;
        uStack_5610 = uStack_7b90;
        uStack_5608 = uStack_7b88;
        local_5660 = local_8a80;
        uStack_5658 = uStack_8a78;
        uStack_5650 = 0;
        uStack_5648 = 0;
        local_14a0 = local_7ba0;
        uStack_1498 = uStack_7b98;
        uStack_1490 = uStack_7b90;
        uStack_1488 = uStack_7b88;
        local_14e0 = local_8a80;
        uStack_14d8 = uStack_8a78;
        uStack_14d0 = 0;
        uStack_14c8 = 0;
        auVar9 = vfmadd213ps_fma(*local_6be0,auVar8,ZEXT1632(auVar9));
        local_8aa0 = auVar9._0_8_;
        uStack_8a98 = auVar9._8_8_;
        local_6be8 = local_6e10 + 3;
        local_5d60 = *(undefined8 *)*local_6be8;
        uStack_5d58 = *(undefined8 *)(local_6e10[3] + 8);
        uStack_5d50 = *(undefined8 *)(local_6e10[3] + 0x10);
        uStack_5d48 = *(undefined8 *)(local_6e10[3] + 0x18);
        auVar27 = *local_6be8;
        auVar22 = *local_6be8;
        auVar12 = *local_6be8;
        local_6bf0 = local_6e18 + 3;
        local_5e80 = *(undefined8 *)*local_6bf0;
        uStack_5e78 = *(undefined8 *)(local_6e18[3] + 8);
        uStack_5e70 = *(undefined8 *)(local_6e18[3] + 0x10);
        uStack_5e68 = *(undefined8 *)(local_6e18[3] + 0x18);
        auVar28 = *local_6bf0;
        auVar24 = *local_6bf0;
        auVar15 = *local_6bf0;
        local_6bf8 = local_6e20 + 3;
        local_5fa0 = *(undefined8 *)*local_6bf8;
        uStack_5f98 = *(undefined8 *)(local_6e20[3] + 8);
        uStack_5f90 = *(undefined8 *)(local_6e20[3] + 0x10);
        uStack_5f88 = *(undefined8 *)(local_6e20[3] + 0x18);
        auVar29 = *local_6bf8;
        auVar26 = *local_6bf8;
        auVar18 = *local_6bf8;
        local_3648 = local_6dc0;
        local_3680 = local_8aa0;
        uStack_3678 = uStack_8a98;
        uStack_3670 = 0;
        uStack_3668 = 0;
        *(undefined8 *)local_6dc0 = local_8aa0;
        *(undefined8 *)(local_6dc0 + 2) = uStack_8a98;
        local_3648[4] = 0.0;
        local_3648[5] = 0.0;
        local_3648[6] = 0.0;
        local_3648[7] = 0.0;
        local_5680 = local_7aa0;
        uStack_5678 = uStack_7a98;
        uStack_5670 = uStack_7a90;
        uStack_5668 = uStack_7a88;
        local_56c0 = local_6da0;
        uStack_56b8 = uStack_6d98;
        uStack_56b0 = uStack_6d90;
        uStack_56a8 = uStack_6d88;
        local_1440 = local_7aa0;
        uStack_1438 = uStack_7a98;
        uStack_1430 = uStack_7a90;
        uStack_1428 = uStack_7a88;
        local_1480 = local_6da0;
        uStack_1478 = uStack_6d98;
        uStack_1470 = uStack_6d90;
        uStack_1468 = uStack_6d88;
        auVar19._8_8_ = uStack_6d98;
        auVar19._0_8_ = local_6da0;
        auVar19._16_8_ = uStack_6d90;
        auVar19._24_8_ = uStack_6d88;
        auVar9 = vfmadd213ps_fma(auVar30,auVar31,auVar19);
        local_8b20 = auVar9._0_8_;
        uStack_8b18 = auVar9._8_8_;
        local_56e0 = local_7ac0;
        uStack_56d8 = uStack_7ab8;
        uStack_56d0 = uStack_7ab0;
        uStack_56c8 = uStack_7aa8;
        local_5720 = local_8b20;
        uStack_5718 = uStack_8b18;
        uStack_5710 = 0;
        uStack_5708 = 0;
        local_13e0 = local_7ac0;
        uStack_13d8 = uStack_7ab8;
        uStack_13d0 = uStack_7ab0;
        uStack_13c8 = uStack_7aa8;
        local_1420 = local_8b20;
        uStack_1418 = uStack_8b18;
        uStack_1410 = 0;
        uStack_1408 = 0;
        auVar9 = vfmadd213ps_fma(auVar11,auVar1,ZEXT1632(auVar9));
        local_8b40 = auVar9._0_8_;
        uStack_8b38 = auVar9._8_8_;
        local_5740 = local_7ae0;
        uStack_5738 = uStack_7ad8;
        uStack_5730 = uStack_7ad0;
        uStack_5728 = uStack_7ac8;
        local_5780 = local_8b40;
        uStack_5778 = uStack_8b38;
        uStack_5770 = 0;
        uStack_5768 = 0;
        local_1380 = local_7ae0;
        uStack_1378 = uStack_7ad8;
        uStack_1370 = uStack_7ad0;
        uStack_1368 = uStack_7ac8;
        local_13c0 = local_8b40;
        uStack_13b8 = uStack_8b38;
        uStack_13b0 = 0;
        uStack_13a8 = 0;
        auVar9 = vfmadd213ps_fma(auVar12,auVar2,ZEXT1632(auVar9));
        local_8b60 = auVar9._0_8_;
        uStack_8b58 = auVar9._8_8_;
        local_57a0 = local_7b00;
        uStack_5798 = uStack_7af8;
        uStack_5790 = uStack_7af0;
        uStack_5788 = uStack_7ae8;
        local_57e0 = local_8b60;
        uStack_57d8 = uStack_8b58;
        uStack_57d0 = 0;
        uStack_57c8 = 0;
        local_1320 = local_7b00;
        uStack_1318 = uStack_7af8;
        uStack_1310 = uStack_7af0;
        uStack_1308 = uStack_7ae8;
        local_1360 = local_8b60;
        uStack_1358 = uStack_8b58;
        uStack_1350 = 0;
        uStack_1348 = 0;
        auVar9 = vfmadd213ps_fma(auVar13,auVar3,ZEXT1632(auVar9));
        local_8b80 = auVar9._0_8_;
        uStack_8b78 = auVar9._8_8_;
        local_5800 = local_7b20;
        uStack_57f8 = uStack_7b18;
        uStack_57f0 = uStack_7b10;
        uStack_57e8 = uStack_7b08;
        local_5840 = local_8b80;
        uStack_5838 = uStack_8b78;
        uStack_5830 = 0;
        uStack_5828 = 0;
        local_12c0 = local_7b20;
        uStack_12b8 = uStack_7b18;
        uStack_12b0 = uStack_7b10;
        uStack_12a8 = uStack_7b08;
        local_1300 = local_8b80;
        uStack_12f8 = uStack_8b78;
        uStack_12f0 = 0;
        uStack_12e8 = 0;
        auVar9 = vfmadd213ps_fma(auVar14,auVar4,ZEXT1632(auVar9));
        local_8ba0 = auVar9._0_8_;
        uStack_8b98 = auVar9._8_8_;
        local_5860 = local_7b40;
        uStack_5858 = uStack_7b38;
        uStack_5850 = uStack_7b30;
        uStack_5848 = uStack_7b28;
        local_58a0 = local_8ba0;
        uStack_5898 = uStack_8b98;
        uStack_5890 = 0;
        uStack_5888 = 0;
        local_1260 = local_7b40;
        uStack_1258 = uStack_7b38;
        uStack_1250 = uStack_7b30;
        uStack_1248 = uStack_7b28;
        local_12a0 = local_8ba0;
        uStack_1298 = uStack_8b98;
        uStack_1290 = 0;
        uStack_1288 = 0;
        auVar9 = vfmadd213ps_fma(auVar15,auVar5,ZEXT1632(auVar9));
        local_8bc0 = auVar9._0_8_;
        uStack_8bb8 = auVar9._8_8_;
        local_58c0 = local_7b60;
        uStack_58b8 = uStack_7b58;
        uStack_58b0 = uStack_7b50;
        uStack_58a8 = uStack_7b48;
        local_5900 = local_8bc0;
        uStack_58f8 = uStack_8bb8;
        uStack_58f0 = 0;
        uStack_58e8 = 0;
        local_1200 = local_7b60;
        uStack_11f8 = uStack_7b58;
        uStack_11f0 = uStack_7b50;
        uStack_11e8 = uStack_7b48;
        local_1240 = local_8bc0;
        uStack_1238 = uStack_8bb8;
        uStack_1230 = 0;
        uStack_1228 = 0;
        auVar9 = vfmadd213ps_fma(auVar16,auVar6,ZEXT1632(auVar9));
        local_8be0 = auVar9._0_8_;
        uStack_8bd8 = auVar9._8_8_;
        local_5920 = local_7b80;
        uStack_5918 = uStack_7b78;
        uStack_5910 = uStack_7b70;
        uStack_5908 = uStack_7b68;
        local_5960 = local_8be0;
        uStack_5958 = uStack_8bd8;
        uStack_5950 = 0;
        uStack_5948 = 0;
        local_11a0 = local_7b80;
        uStack_1198 = uStack_7b78;
        uStack_1190 = uStack_7b70;
        uStack_1188 = uStack_7b68;
        local_11e0 = local_8be0;
        uStack_11d8 = uStack_8bd8;
        uStack_11d0 = 0;
        uStack_11c8 = 0;
        auVar9 = vfmadd213ps_fma(auVar17,auVar7,ZEXT1632(auVar9));
        local_8c00 = auVar9._0_8_;
        uStack_8bf8 = auVar9._8_8_;
        local_5980 = local_7ba0;
        uStack_5978 = uStack_7b98;
        uStack_5970 = uStack_7b90;
        uStack_5968 = uStack_7b88;
        local_59c0 = local_8c00;
        uStack_59b8 = uStack_8bf8;
        uStack_59b0 = 0;
        uStack_59a8 = 0;
        local_1140 = local_7ba0;
        uStack_1138 = uStack_7b98;
        uStack_1130 = uStack_7b90;
        uStack_1128 = uStack_7b88;
        local_1180 = local_8c00;
        uStack_1178 = uStack_8bf8;
        uStack_1170 = 0;
        uStack_1168 = 0;
        auVar9 = vfmadd213ps_fma(auVar18,auVar8,ZEXT1632(auVar9));
        local_8c20 = auVar9._0_8_;
        uStack_8c18 = auVar9._8_8_;
        local_6c00 = local_6e10 + 4;
        local_5dc0 = *(undefined8 *)*local_6c00;
        uStack_5db8 = *(undefined8 *)(local_6e10[4] + 8);
        uStack_5db0 = *(undefined8 *)(local_6e10[4] + 0x10);
        uStack_5da8 = *(undefined8 *)(local_6e10[4] + 0x18);
        auVar13 = *local_6c00;
        auVar30 = *local_6c00;
        local_6c08 = local_6e18 + 4;
        local_5ee0 = *(undefined8 *)*local_6c08;
        uStack_5ed8 = *(undefined8 *)(local_6e18[4] + 8);
        uStack_5ed0 = *(undefined8 *)(local_6e18[4] + 0x10);
        uStack_5ec8 = *(undefined8 *)(local_6e18[4] + 0x18);
        auVar14 = *local_6c08;
        auVar11 = *local_6c08;
        local_6c10 = local_6e20 + 4;
        local_6000 = *(undefined8 *)*local_6c10;
        uStack_5ff8 = *(undefined8 *)(local_6e20[4] + 8);
        uStack_5ff0 = *(undefined8 *)(local_6e20[4] + 0x10);
        uStack_5fe8 = *(undefined8 *)(local_6e20[4] + 0x18);
        auVar15 = *local_6c10;
        auVar12 = *local_6c10;
        local_3688 = local_6dc0 + 8;
        local_36c0 = local_8c20;
        uStack_36b8 = uStack_8c18;
        uStack_36b0 = 0;
        uStack_36a8 = 0;
        *(undefined8 *)local_3688 = local_8c20;
        *(undefined8 *)(local_6dc0 + 10) = uStack_8c18;
        local_3648[0xc] = 0.0;
        local_3648[0xd] = 0.0;
        local_3648[0xe] = 0.0;
        local_3648[0xf] = 0.0;
        local_59e0 = local_7aa0;
        uStack_59d8 = uStack_7a98;
        uStack_59d0 = uStack_7a90;
        uStack_59c8 = uStack_7a88;
        local_5a20 = local_6da0;
        uStack_5a18 = uStack_6d98;
        uStack_5a10 = uStack_6d90;
        uStack_5a08 = uStack_6d88;
        local_10e0 = local_7aa0;
        uStack_10d8 = uStack_7a98;
        uStack_10d0 = uStack_7a90;
        uStack_10c8 = uStack_7a88;
        local_1120 = local_6da0;
        uStack_1118 = uStack_6d98;
        uStack_1110 = uStack_6d90;
        uStack_1108 = uStack_6d88;
        auVar20._8_8_ = uStack_6d98;
        auVar20._0_8_ = local_6da0;
        auVar20._16_8_ = uStack_6d90;
        auVar20._24_8_ = uStack_6d88;
        auVar9 = vfmadd213ps_fma(auVar21,auVar31,auVar20);
        local_8ca0 = auVar9._0_8_;
        uStack_8c98 = auVar9._8_8_;
        local_5a40 = local_7ac0;
        uStack_5a38 = uStack_7ab8;
        uStack_5a30 = uStack_7ab0;
        uStack_5a28 = uStack_7aa8;
        local_5a80 = local_8ca0;
        uStack_5a78 = uStack_8c98;
        uStack_5a70 = 0;
        uStack_5a68 = 0;
        local_1080 = local_7ac0;
        uStack_1078 = uStack_7ab8;
        uStack_1070 = uStack_7ab0;
        uStack_1068 = uStack_7aa8;
        local_10c0 = local_8ca0;
        uStack_10b8 = uStack_8c98;
        uStack_10b0 = 0;
        uStack_10a8 = 0;
        auVar9 = vfmadd213ps_fma(auVar22,auVar1,ZEXT1632(auVar9));
        local_8cc0 = auVar9._0_8_;
        uStack_8cb8 = auVar9._8_8_;
        local_5aa0 = local_7ae0;
        uStack_5a98 = uStack_7ad8;
        uStack_5a90 = uStack_7ad0;
        uStack_5a88 = uStack_7ac8;
        local_5ae0 = local_8cc0;
        uStack_5ad8 = uStack_8cb8;
        uStack_5ad0 = 0;
        uStack_5ac8 = 0;
        local_1020 = local_7ae0;
        uStack_1018 = uStack_7ad8;
        uStack_1010 = uStack_7ad0;
        uStack_1008 = uStack_7ac8;
        local_1060 = local_8cc0;
        uStack_1058 = uStack_8cb8;
        uStack_1050 = 0;
        uStack_1048 = 0;
        auVar9 = vfmadd213ps_fma(auVar30,auVar2,ZEXT1632(auVar9));
        local_8ce0 = auVar9._0_8_;
        uStack_8cd8 = auVar9._8_8_;
        local_5b00 = local_7b00;
        uStack_5af8 = uStack_7af8;
        uStack_5af0 = uStack_7af0;
        uStack_5ae8 = uStack_7ae8;
        local_5b40 = local_8ce0;
        uStack_5b38 = uStack_8cd8;
        uStack_5b30 = 0;
        uStack_5b28 = 0;
        local_fc0 = local_7b00;
        uStack_fb8 = uStack_7af8;
        uStack_fb0 = uStack_7af0;
        uStack_fa8 = uStack_7ae8;
        local_1000 = local_8ce0;
        uStack_ff8 = uStack_8cd8;
        uStack_ff0 = 0;
        uStack_fe8 = 0;
        auVar9 = vfmadd213ps_fma(auVar23,auVar3,ZEXT1632(auVar9));
        local_8d00 = auVar9._0_8_;
        uStack_8cf8 = auVar9._8_8_;
        local_5b60 = local_7b20;
        uStack_5b58 = uStack_7b18;
        uStack_5b50 = uStack_7b10;
        uStack_5b48 = uStack_7b08;
        local_5ba0 = local_8d00;
        uStack_5b98 = uStack_8cf8;
        uStack_5b90 = 0;
        uStack_5b88 = 0;
        local_f60 = local_7b20;
        uStack_f58 = uStack_7b18;
        uStack_f50 = uStack_7b10;
        uStack_f48 = uStack_7b08;
        local_fa0 = local_8d00;
        uStack_f98 = uStack_8cf8;
        uStack_f90 = 0;
        uStack_f88 = 0;
        auVar9 = vfmadd213ps_fma(auVar24,auVar4,ZEXT1632(auVar9));
        local_8d20 = auVar9._0_8_;
        uStack_8d18 = auVar9._8_8_;
        local_5bc0 = local_7b40;
        uStack_5bb8 = uStack_7b38;
        uStack_5bb0 = uStack_7b30;
        uStack_5ba8 = uStack_7b28;
        local_5c00 = local_8d20;
        uStack_5bf8 = uStack_8d18;
        uStack_5bf0 = 0;
        uStack_5be8 = 0;
        local_f00 = local_7b40;
        uStack_ef8 = uStack_7b38;
        uStack_ef0 = uStack_7b30;
        uStack_ee8 = uStack_7b28;
        local_f40 = local_8d20;
        uStack_f38 = uStack_8d18;
        uStack_f30 = 0;
        uStack_f28 = 0;
        auVar9 = vfmadd213ps_fma(auVar11,auVar5,ZEXT1632(auVar9));
        local_8d40 = auVar9._0_8_;
        uStack_8d38 = auVar9._8_8_;
        local_5c20 = local_7b60;
        uStack_5c18 = uStack_7b58;
        uStack_5c10 = uStack_7b50;
        uStack_5c08 = uStack_7b48;
        local_5c60 = local_8d40;
        uStack_5c58 = uStack_8d38;
        uStack_5c50 = 0;
        uStack_5c48 = 0;
        local_ea0 = local_7b60;
        uStack_e98 = uStack_7b58;
        uStack_e90 = uStack_7b50;
        uStack_e88 = uStack_7b48;
        local_ee0 = local_8d40;
        uStack_ed8 = uStack_8d38;
        uStack_ed0 = 0;
        uStack_ec8 = 0;
        auVar9 = vfmadd213ps_fma(auVar25,auVar6,ZEXT1632(auVar9));
        local_8d60 = auVar9._0_8_;
        uStack_8d58 = auVar9._8_8_;
        local_5c80 = local_7b80;
        uStack_5c78 = uStack_7b78;
        uStack_5c70 = uStack_7b70;
        uStack_5c68 = uStack_7b68;
        local_5cc0 = local_8d60;
        uStack_5cb8 = uStack_8d58;
        uStack_5cb0 = 0;
        uStack_5ca8 = 0;
        local_e40 = local_7b80;
        uStack_e38 = uStack_7b78;
        uStack_e30 = uStack_7b70;
        uStack_e28 = uStack_7b68;
        local_e80 = local_8d60;
        uStack_e78 = uStack_8d58;
        uStack_e70 = 0;
        uStack_e68 = 0;
        auVar9 = vfmadd213ps_fma(auVar26,auVar7,ZEXT1632(auVar9));
        local_8d80 = auVar9._0_8_;
        uStack_8d78 = auVar9._8_8_;
        local_5ce0 = local_7ba0;
        uStack_5cd8 = uStack_7b98;
        uStack_5cd0 = uStack_7b90;
        uStack_5cc8 = uStack_7b88;
        local_5d20 = local_8d80;
        uStack_5d18 = uStack_8d78;
        uStack_5d10 = 0;
        uStack_5d08 = 0;
        local_de0 = local_7ba0;
        uStack_dd8 = uStack_7b98;
        uStack_dd0 = uStack_7b90;
        uStack_dc8 = uStack_7b88;
        local_e20 = local_8d80;
        uStack_e18 = uStack_8d78;
        uStack_e10 = 0;
        uStack_e08 = 0;
        auVar9 = vfmadd213ps_fma(auVar12,auVar8,ZEXT1632(auVar9));
        local_8da0 = auVar9._0_8_;
        uStack_8d98 = auVar9._8_8_;
        local_6c18 = local_6e10 + 5;
        local_5e20 = *(undefined8 *)*local_6c18;
        uStack_5e18 = *(undefined8 *)(local_6e10[5] + 8);
        uStack_5e10 = *(undefined8 *)(local_6e10[5] + 0x10);
        uStack_5e08 = *(undefined8 *)(local_6e10[5] + 0x18);
        auVar30 = *local_6c18;
        local_6c20 = local_6e18 + 5;
        local_5f40 = *(undefined8 *)*local_6c20;
        uStack_5f38 = *(undefined8 *)(local_6e18[5] + 8);
        uStack_5f30 = *(undefined8 *)(local_6e18[5] + 0x10);
        uStack_5f28 = *(undefined8 *)(local_6e18[5] + 0x18);
        auVar11 = *local_6c20;
        local_6c28 = local_6e20 + 5;
        local_6060 = *(undefined8 *)*local_6c28;
        uStack_6058 = *(undefined8 *)(local_6e20[5] + 8);
        uStack_6050 = *(undefined8 *)(local_6e20[5] + 0x10);
        uStack_6048 = *(undefined8 *)(local_6e20[5] + 0x18);
        auVar12 = *local_6c28;
        local_36c8 = local_6dc0 + 0x10;
        local_3700 = local_8da0;
        uStack_36f8 = uStack_8d98;
        uStack_36f0 = 0;
        uStack_36e8 = 0;
        *(undefined8 *)local_36c8 = local_8da0;
        *(undefined8 *)(local_6dc0 + 0x12) = uStack_8d98;
        local_3648[0x14] = 0.0;
        local_3648[0x15] = 0.0;
        local_3648[0x16] = 0.0;
        local_3648[0x17] = 0.0;
        local_5d40 = local_7aa0;
        uStack_5d38 = uStack_7a98;
        uStack_5d30 = uStack_7a90;
        uStack_5d28 = uStack_7a88;
        local_5d80 = local_6da0;
        uStack_5d78 = uStack_6d98;
        uStack_5d70 = uStack_6d90;
        uStack_5d68 = uStack_6d88;
        local_d80 = local_7aa0;
        uStack_d78 = uStack_7a98;
        uStack_d70 = uStack_7a90;
        uStack_d68 = uStack_7a88;
        local_dc0 = local_6da0;
        uStack_db8 = uStack_6d98;
        uStack_db0 = uStack_6d90;
        uStack_da8 = uStack_6d88;
        auVar21._8_8_ = uStack_6d98;
        auVar21._0_8_ = local_6da0;
        auVar21._16_8_ = uStack_6d90;
        auVar21._24_8_ = uStack_6d88;
        auVar9 = vfmadd213ps_fma(auVar27,auVar31,auVar21);
        local_8e20 = auVar9._0_8_;
        uStack_8e18 = auVar9._8_8_;
        local_5da0 = local_7ac0;
        uStack_5d98 = uStack_7ab8;
        uStack_5d90 = uStack_7ab0;
        uStack_5d88 = uStack_7aa8;
        local_5de0 = local_8e20;
        uStack_5dd8 = uStack_8e18;
        uStack_5dd0 = 0;
        uStack_5dc8 = 0;
        local_d20 = local_7ac0;
        uStack_d18 = uStack_7ab8;
        uStack_d10 = uStack_7ab0;
        uStack_d08 = uStack_7aa8;
        local_d60 = local_8e20;
        uStack_d58 = uStack_8e18;
        uStack_d50 = 0;
        uStack_d48 = 0;
        auVar9 = vfmadd213ps_fma(auVar13,auVar1,ZEXT1632(auVar9));
        local_8e40 = auVar9._0_8_;
        uStack_8e38 = auVar9._8_8_;
        local_5e00 = local_7ae0;
        uStack_5df8 = uStack_7ad8;
        uStack_5df0 = uStack_7ad0;
        uStack_5de8 = uStack_7ac8;
        local_5e40 = local_8e40;
        uStack_5e38 = uStack_8e38;
        uStack_5e30 = 0;
        uStack_5e28 = 0;
        local_cc0 = local_7ae0;
        uStack_cb8 = uStack_7ad8;
        uStack_cb0 = uStack_7ad0;
        uStack_ca8 = uStack_7ac8;
        local_d00 = local_8e40;
        uStack_cf8 = uStack_8e38;
        uStack_cf0 = 0;
        uStack_ce8 = 0;
        auVar9 = vfmadd213ps_fma(auVar30,auVar2,ZEXT1632(auVar9));
        local_8e60 = auVar9._0_8_;
        uStack_8e58 = auVar9._8_8_;
        local_5e60 = local_7b00;
        uStack_5e58 = uStack_7af8;
        uStack_5e50 = uStack_7af0;
        uStack_5e48 = uStack_7ae8;
        local_5ea0 = local_8e60;
        uStack_5e98 = uStack_8e58;
        uStack_5e90 = 0;
        uStack_5e88 = 0;
        local_c60 = local_7b00;
        uStack_c58 = uStack_7af8;
        uStack_c50 = uStack_7af0;
        uStack_c48 = uStack_7ae8;
        local_ca0 = local_8e60;
        uStack_c98 = uStack_8e58;
        uStack_c90 = 0;
        uStack_c88 = 0;
        auVar9 = vfmadd213ps_fma(auVar28,auVar3,ZEXT1632(auVar9));
        local_8e80 = auVar9._0_8_;
        uStack_8e78 = auVar9._8_8_;
        local_5ec0 = local_7b20;
        uStack_5eb8 = uStack_7b18;
        uStack_5eb0 = uStack_7b10;
        uStack_5ea8 = uStack_7b08;
        local_5f00 = local_8e80;
        uStack_5ef8 = uStack_8e78;
        uStack_5ef0 = 0;
        uStack_5ee8 = 0;
        local_c00 = local_7b20;
        uStack_bf8 = uStack_7b18;
        uStack_bf0 = uStack_7b10;
        uStack_be8 = uStack_7b08;
        local_c40 = local_8e80;
        uStack_c38 = uStack_8e78;
        uStack_c30 = 0;
        uStack_c28 = 0;
        auVar9 = vfmadd213ps_fma(auVar14,auVar4,ZEXT1632(auVar9));
        local_8ea0 = auVar9._0_8_;
        uStack_8e98 = auVar9._8_8_;
        local_5f20 = local_7b40;
        uStack_5f18 = uStack_7b38;
        uStack_5f10 = uStack_7b30;
        uStack_5f08 = uStack_7b28;
        local_5f60 = local_8ea0;
        uStack_5f58 = uStack_8e98;
        uStack_5f50 = 0;
        uStack_5f48 = 0;
        local_ba0 = local_7b40;
        uStack_b98 = uStack_7b38;
        uStack_b90 = uStack_7b30;
        uStack_b88 = uStack_7b28;
        local_be0 = local_8ea0;
        uStack_bd8 = uStack_8e98;
        uStack_bd0 = 0;
        uStack_bc8 = 0;
        auVar9 = vfmadd213ps_fma(auVar11,auVar5,ZEXT1632(auVar9));
        local_8ec0 = auVar9._0_8_;
        uStack_8eb8 = auVar9._8_8_;
        local_5f80 = local_7b60;
        uStack_5f78 = uStack_7b58;
        uStack_5f70 = uStack_7b50;
        uStack_5f68 = uStack_7b48;
        local_5fc0 = local_8ec0;
        uStack_5fb8 = uStack_8eb8;
        uStack_5fb0 = 0;
        uStack_5fa8 = 0;
        local_b40 = local_7b60;
        uStack_b38 = uStack_7b58;
        uStack_b30 = uStack_7b50;
        uStack_b28 = uStack_7b48;
        local_b80 = local_8ec0;
        uStack_b78 = uStack_8eb8;
        uStack_b70 = 0;
        uStack_b68 = 0;
        auVar9 = vfmadd213ps_fma(auVar29,auVar6,ZEXT1632(auVar9));
        local_8ee0 = auVar9._0_8_;
        uStack_8ed8 = auVar9._8_8_;
        local_5fe0 = local_7b80;
        uStack_5fd8 = uStack_7b78;
        uStack_5fd0 = uStack_7b70;
        uStack_5fc8 = uStack_7b68;
        local_6020 = local_8ee0;
        uStack_6018 = uStack_8ed8;
        uStack_6010 = 0;
        uStack_6008 = 0;
        local_ae0 = local_7b80;
        uStack_ad8 = uStack_7b78;
        uStack_ad0 = uStack_7b70;
        uStack_ac8 = uStack_7b68;
        local_b20 = local_8ee0;
        uStack_b18 = uStack_8ed8;
        uStack_b10 = 0;
        uStack_b08 = 0;
        auVar9 = vfmadd213ps_fma(auVar15,auVar7,ZEXT1632(auVar9));
        local_8f00 = auVar9._0_8_;
        uStack_8ef8 = auVar9._8_8_;
        local_6040 = local_7ba0;
        uStack_6038 = uStack_7b98;
        uStack_6030 = uStack_7b90;
        uStack_6028 = uStack_7b88;
        local_6080 = local_8f00;
        uStack_6078 = uStack_8ef8;
        uStack_6070 = 0;
        uStack_6068 = 0;
        local_a80 = local_7ba0;
        uStack_a78 = uStack_7b98;
        uStack_a70 = uStack_7b90;
        uStack_a68 = uStack_7b88;
        local_ac0 = local_8f00;
        uStack_ab8 = uStack_8ef8;
        uStack_ab0 = 0;
        uStack_aa8 = 0;
        auVar9 = vfmadd213ps_fma(auVar12,auVar8,ZEXT1632(auVar9));
        local_8f20 = auVar9._0_8_;
        uStack_8f18 = auVar9._8_8_;
        local_3708 = local_6dc0 + 0x18;
        local_3740 = local_8f20;
        uStack_3738 = uStack_8f18;
        uStack_3730 = 0;
        uStack_3728 = 0;
        *(undefined8 *)local_3708 = local_8f20;
        *(undefined8 *)(local_6dc0 + 0x1a) = uStack_8f18;
        local_3648[0x1c] = 0.0;
        local_3648[0x1d] = 0.0;
        local_3648[0x1e] = 0.0;
        local_3648[0x1f] = 0.0;
        local_6e10 = local_6e10 + 4;
        local_6e18 = local_6e18 + 4;
        local_6e20 = local_6e20 + 4;
        local_6dc0 = local_6dc0 + 0x20;
        local_5d00 = local_6000;
        uStack_5cf8 = uStack_5ff8;
        uStack_5cf0 = uStack_5ff0;
        uStack_5ce8 = uStack_5fe8;
        local_5ca0 = local_5fa0;
        uStack_5c98 = uStack_5f98;
        uStack_5c90 = uStack_5f90;
        uStack_5c88 = uStack_5f88;
        local_5be0 = local_5ee0;
        uStack_5bd8 = uStack_5ed8;
        uStack_5bd0 = uStack_5ed0;
        uStack_5bc8 = uStack_5ec8;
        local_5b80 = local_5e80;
        uStack_5b78 = uStack_5e78;
        uStack_5b70 = uStack_5e70;
        uStack_5b68 = uStack_5e68;
        local_5ac0 = local_5dc0;
        uStack_5ab8 = uStack_5db8;
        uStack_5ab0 = uStack_5db0;
        uStack_5aa8 = uStack_5da8;
        local_5a60 = local_5d60;
        uStack_5a58 = uStack_5d58;
        uStack_5a50 = uStack_5d50;
        uStack_5a48 = uStack_5d48;
        local_59a0 = local_5fa0;
        uStack_5998 = uStack_5f98;
        uStack_5990 = uStack_5f90;
        uStack_5988 = uStack_5f88;
        local_5940 = local_5c40;
        uStack_5938 = uStack_5c38;
        uStack_5930 = uStack_5c30;
        uStack_5928 = uStack_5c28;
        local_5880 = local_5e80;
        uStack_5878 = uStack_5e78;
        uStack_5870 = uStack_5e70;
        uStack_5868 = uStack_5e68;
        local_5820 = local_5b20;
        uStack_5818 = uStack_5b18;
        uStack_5810 = uStack_5b10;
        uStack_5808 = uStack_5b08;
        local_5760 = local_5d60;
        uStack_5758 = uStack_5d58;
        uStack_5750 = uStack_5d50;
        uStack_5748 = uStack_5d48;
        local_5700 = local_5a00;
        uStack_56f8 = uStack_59f8;
        uStack_56f0 = uStack_59f0;
        uStack_56e8 = uStack_59e8;
        local_5640 = local_5c40;
        uStack_5638 = uStack_5c38;
        uStack_5630 = uStack_5c30;
        uStack_5628 = uStack_5c28;
        local_55e0 = local_58e0;
        uStack_55d8 = uStack_58d8;
        uStack_55d0 = uStack_58d0;
        uStack_55c8 = uStack_58c8;
        local_5520 = local_5b20;
        uStack_5518 = uStack_5b18;
        uStack_5510 = uStack_5b10;
        uStack_5508 = uStack_5b08;
        local_54c0 = local_57c0;
        uStack_54b8 = uStack_57b8;
        uStack_54b0 = uStack_57b0;
        uStack_54a8 = uStack_57a8;
        local_5400 = local_5a00;
        uStack_53f8 = uStack_59f8;
        uStack_53f0 = uStack_59f0;
        uStack_53e8 = uStack_59e8;
        local_53a0 = local_56a0;
        uStack_5398 = uStack_5698;
        uStack_5390 = uStack_5690;
        uStack_5388 = uStack_5688;
        local_17c0 = local_5340;
        uStack_17b8 = uStack_5338;
        uStack_17b0 = uStack_5330;
        uStack_17a8 = uStack_5328;
        local_1760 = local_56a0;
        uStack_1758 = uStack_5698;
        uStack_1750 = uStack_5690;
        uStack_1748 = uStack_5688;
        local_1700 = local_5a00;
        uStack_16f8 = uStack_59f8;
        uStack_16f0 = uStack_59f0;
        uStack_16e8 = uStack_59e8;
        local_16a0 = local_5460;
        uStack_1698 = uStack_5458;
        uStack_1690 = uStack_5450;
        uStack_1688 = uStack_5448;
        local_1640 = local_57c0;
        uStack_1638 = uStack_57b8;
        uStack_1630 = uStack_57b0;
        uStack_1628 = uStack_57a8;
        local_15e0 = local_5b20;
        uStack_15d8 = uStack_5b18;
        uStack_15d0 = uStack_5b10;
        uStack_15c8 = uStack_5b08;
        local_1580 = local_5580;
        uStack_1578 = uStack_5578;
        uStack_1570 = uStack_5570;
        uStack_1568 = uStack_5568;
        local_1520 = local_58e0;
        uStack_1518 = uStack_58d8;
        uStack_1510 = uStack_58d0;
        uStack_1508 = uStack_58c8;
        local_14c0 = local_5c40;
        uStack_14b8 = uStack_5c38;
        uStack_14b0 = uStack_5c30;
        uStack_14a8 = uStack_5c28;
        local_1460 = local_56a0;
        uStack_1458 = uStack_5698;
        uStack_1450 = uStack_5690;
        uStack_1448 = uStack_5688;
        local_1400 = local_5a00;
        uStack_13f8 = uStack_59f8;
        uStack_13f0 = uStack_59f0;
        uStack_13e8 = uStack_59e8;
        local_13a0 = local_5d60;
        uStack_1398 = uStack_5d58;
        uStack_1390 = uStack_5d50;
        uStack_1388 = uStack_5d48;
        local_1340 = local_57c0;
        uStack_1338 = uStack_57b8;
        uStack_1330 = uStack_57b0;
        uStack_1328 = uStack_57a8;
        local_12e0 = local_5b20;
        uStack_12d8 = uStack_5b18;
        uStack_12d0 = uStack_5b10;
        uStack_12c8 = uStack_5b08;
        local_1280 = local_5e80;
        uStack_1278 = uStack_5e78;
        uStack_1270 = uStack_5e70;
        uStack_1268 = uStack_5e68;
        local_1220 = local_58e0;
        uStack_1218 = uStack_58d8;
        uStack_1210 = uStack_58d0;
        uStack_1208 = uStack_58c8;
        local_11c0 = local_5c40;
        uStack_11b8 = uStack_5c38;
        uStack_11b0 = uStack_5c30;
        uStack_11a8 = uStack_5c28;
        local_1160 = local_5fa0;
        uStack_1158 = uStack_5f98;
        uStack_1150 = uStack_5f90;
        uStack_1148 = uStack_5f88;
        local_1100 = local_5a00;
        uStack_10f8 = uStack_59f8;
        uStack_10f0 = uStack_59f0;
        uStack_10e8 = uStack_59e8;
        local_10a0 = local_5d60;
        uStack_1098 = uStack_5d58;
        uStack_1090 = uStack_5d50;
        uStack_1088 = uStack_5d48;
        local_1040 = local_5dc0;
        uStack_1038 = uStack_5db8;
        uStack_1030 = uStack_5db0;
        uStack_1028 = uStack_5da8;
        local_fe0 = local_5b20;
        uStack_fd8 = uStack_5b18;
        uStack_fd0 = uStack_5b10;
        uStack_fc8 = uStack_5b08;
        local_f80 = local_5e80;
        uStack_f78 = uStack_5e78;
        uStack_f70 = uStack_5e70;
        uStack_f68 = uStack_5e68;
        local_f20 = local_5ee0;
        uStack_f18 = uStack_5ed8;
        uStack_f10 = uStack_5ed0;
        uStack_f08 = uStack_5ec8;
        local_ec0 = local_5c40;
        uStack_eb8 = uStack_5c38;
        uStack_eb0 = uStack_5c30;
        uStack_ea8 = uStack_5c28;
        local_e60 = local_5fa0;
        uStack_e58 = uStack_5f98;
        uStack_e50 = uStack_5f90;
        uStack_e48 = uStack_5f88;
        local_e00 = local_6000;
        uStack_df8 = uStack_5ff8;
        uStack_df0 = uStack_5ff0;
        uStack_de8 = uStack_5fe8;
        local_da0 = local_5d60;
        uStack_d98 = uStack_5d58;
        uStack_d90 = uStack_5d50;
        uStack_d88 = uStack_5d48;
        local_d40 = local_5dc0;
        uStack_d38 = uStack_5db8;
        uStack_d30 = uStack_5db0;
        uStack_d28 = uStack_5da8;
        local_ce0 = local_5e20;
        uStack_cd8 = uStack_5e18;
        uStack_cd0 = uStack_5e10;
        uStack_cc8 = uStack_5e08;
        local_c80 = local_5e80;
        uStack_c78 = uStack_5e78;
        uStack_c70 = uStack_5e70;
        uStack_c68 = uStack_5e68;
        local_c20 = local_5ee0;
        uStack_c18 = uStack_5ed8;
        uStack_c10 = uStack_5ed0;
        uStack_c08 = uStack_5ec8;
        local_bc0 = local_5f40;
        uStack_bb8 = uStack_5f38;
        uStack_bb0 = uStack_5f30;
        uStack_ba8 = uStack_5f28;
        local_b60 = local_5fa0;
        uStack_b58 = uStack_5f98;
        uStack_b50 = uStack_5f90;
        uStack_b48 = uStack_5f88;
        local_b00 = local_6000;
        uStack_af8 = uStack_5ff8;
        uStack_af0 = uStack_5ff0;
        uStack_ae8 = uStack_5fe8;
        local_aa0 = local_6060;
        uStack_a98 = uStack_6058;
        uStack_a90 = uStack_6050;
        uStack_a88 = uStack_6048;
      }
      for (; auVar30 = _local_9500, local_6f48 + 1 < local_6d04; local_6f48 = local_6f48 + 2) {
        local_6c30 = local_6e10;
        local_60c0 = *(undefined8 *)*local_6e10;
        uStack_60b8 = *(undefined8 *)(*local_6e10 + 8);
        uStack_60b0 = *(undefined8 *)(*local_6e10 + 0x10);
        uStack_60a8 = *(undefined8 *)(*local_6e10 + 0x18);
        local_6c38 = local_6e10 + 1;
        local_6420 = *(undefined8 *)*local_6c38;
        uStack_6418 = *(undefined8 *)(local_6e10[1] + 8);
        uStack_6410 = *(undefined8 *)(local_6e10[1] + 0x10);
        uStack_6408 = *(undefined8 *)(local_6e10[1] + 0x18);
        auVar30 = *local_6c38;
        local_6c40 = local_6e10 + 2;
        local_6480 = *(undefined8 *)*local_6c40;
        uStack_6478 = *(undefined8 *)(local_6e10[2] + 8);
        uStack_6470 = *(undefined8 *)(local_6e10[2] + 0x10);
        uStack_6468 = *(undefined8 *)(local_6e10[2] + 0x18);
        auVar11 = *local_6c40;
        local_6c48 = local_6e18;
        local_61e0 = *(undefined8 *)*local_6e18;
        uStack_61d8 = *(undefined8 *)(*local_6e18 + 8);
        uStack_61d0 = *(undefined8 *)(*local_6e18 + 0x10);
        uStack_61c8 = *(undefined8 *)(*local_6e18 + 0x18);
        local_6c50 = local_6e18 + 1;
        local_6540 = *(undefined8 *)*local_6c50;
        uStack_6538 = *(undefined8 *)(local_6e18[1] + 8);
        uStack_6530 = *(undefined8 *)(local_6e18[1] + 0x10);
        uStack_6528 = *(undefined8 *)(local_6e18[1] + 0x18);
        auVar13 = *local_6c50;
        local_6c58 = local_6e18 + 2;
        local_65a0 = *(undefined8 *)*local_6c58;
        uStack_6598 = *(undefined8 *)(local_6e18[2] + 8);
        uStack_6590 = *(undefined8 *)(local_6e18[2] + 0x10);
        uStack_6588 = *(undefined8 *)(local_6e18[2] + 0x18);
        auVar14 = *local_6c58;
        local_6c60 = local_6e20;
        local_6300 = *(undefined8 *)*local_6e20;
        uStack_62f8 = *(undefined8 *)(*local_6e20 + 8);
        uStack_62f0 = *(undefined8 *)(*local_6e20 + 0x10);
        uStack_62e8 = *(undefined8 *)(*local_6e20 + 0x18);
        local_6c68 = local_6e20 + 1;
        local_6660 = *(undefined8 *)*local_6c68;
        uStack_6658 = *(undefined8 *)(local_6e20[1] + 8);
        uStack_6650 = *(undefined8 *)(local_6e20[1] + 0x10);
        uStack_6648 = *(undefined8 *)(local_6e20[1] + 0x18);
        auVar16 = *local_6c68;
        local_6c70 = local_6e20 + 2;
        local_66c0 = *(undefined8 *)*local_6c70;
        uStack_66b8 = *(undefined8 *)(local_6e20[2] + 8);
        uStack_66b0 = *(undefined8 *)(local_6e20[2] + 0x10);
        uStack_66a8 = *(undefined8 *)(local_6e20[2] + 0x18);
        auVar17 = *local_6c70;
        local_60a0 = local_7aa0;
        uStack_6098 = uStack_7a98;
        uStack_6090 = uStack_7a90;
        uStack_6088 = uStack_7a88;
        local_60e0 = local_6da0;
        uStack_60d8 = uStack_6d98;
        uStack_60d0 = uStack_6d90;
        uStack_60c8 = uStack_6d88;
        local_a20 = local_7aa0;
        uStack_a18 = uStack_7a98;
        uStack_a10 = uStack_7a90;
        uStack_a08 = uStack_7a88;
        local_a60 = local_6da0;
        uStack_a58 = uStack_6d98;
        uStack_a50 = uStack_6d90;
        uStack_a48 = uStack_6d88;
        auVar22._8_8_ = uStack_6d98;
        auVar22._0_8_ = local_6da0;
        auVar22._16_8_ = uStack_6d90;
        auVar22._24_8_ = uStack_6d88;
        auVar9 = vfmadd213ps_fma(*local_6e10,auVar31,auVar22);
        local_9060 = auVar9._0_8_;
        uStack_9058 = auVar9._8_8_;
        local_6100 = local_7ac0;
        uStack_60f8 = uStack_7ab8;
        uStack_60f0 = uStack_7ab0;
        uStack_60e8 = uStack_7aa8;
        local_6140 = local_9060;
        uStack_6138 = uStack_9058;
        uStack_6130 = 0;
        uStack_6128 = 0;
        local_9c0 = local_7ac0;
        uStack_9b8 = uStack_7ab8;
        uStack_9b0 = uStack_7ab0;
        uStack_9a8 = uStack_7aa8;
        local_a00 = local_9060;
        uStack_9f8 = uStack_9058;
        uStack_9f0 = 0;
        uStack_9e8 = 0;
        auVar9 = vfmadd213ps_fma(*local_6c38,auVar1,ZEXT1632(auVar9));
        local_9080 = auVar9._0_8_;
        uStack_9078 = auVar9._8_8_;
        local_6160 = local_7ae0;
        uStack_6158 = uStack_7ad8;
        uStack_6150 = uStack_7ad0;
        uStack_6148 = uStack_7ac8;
        local_61a0 = local_9080;
        uStack_6198 = uStack_9078;
        uStack_6190 = 0;
        uStack_6188 = 0;
        local_960 = local_7ae0;
        uStack_958 = uStack_7ad8;
        uStack_950 = uStack_7ad0;
        uStack_948 = uStack_7ac8;
        local_9a0 = local_9080;
        uStack_998 = uStack_9078;
        uStack_990 = 0;
        uStack_988 = 0;
        auVar9 = vfmadd213ps_fma(*local_6c40,auVar2,ZEXT1632(auVar9));
        local_90a0 = auVar9._0_8_;
        uStack_9098 = auVar9._8_8_;
        local_61c0 = local_7b00;
        uStack_61b8 = uStack_7af8;
        uStack_61b0 = uStack_7af0;
        uStack_61a8 = uStack_7ae8;
        local_6200 = local_90a0;
        uStack_61f8 = uStack_9098;
        uStack_61f0 = 0;
        uStack_61e8 = 0;
        local_900 = local_7b00;
        uStack_8f8 = uStack_7af8;
        uStack_8f0 = uStack_7af0;
        uStack_8e8 = uStack_7ae8;
        local_940 = local_90a0;
        uStack_938 = uStack_9098;
        uStack_930 = 0;
        uStack_928 = 0;
        auVar9 = vfmadd213ps_fma(*local_6e18,auVar3,ZEXT1632(auVar9));
        local_90c0 = auVar9._0_8_;
        uStack_90b8 = auVar9._8_8_;
        local_6220 = local_7b20;
        uStack_6218 = uStack_7b18;
        uStack_6210 = uStack_7b10;
        uStack_6208 = uStack_7b08;
        local_6260 = local_90c0;
        uStack_6258 = uStack_90b8;
        uStack_6250 = 0;
        uStack_6248 = 0;
        local_8a0 = local_7b20;
        uStack_898 = uStack_7b18;
        uStack_890 = uStack_7b10;
        uStack_888 = uStack_7b08;
        local_8e0 = local_90c0;
        uStack_8d8 = uStack_90b8;
        uStack_8d0 = 0;
        uStack_8c8 = 0;
        auVar9 = vfmadd213ps_fma(*local_6c50,auVar4,ZEXT1632(auVar9));
        local_90e0 = auVar9._0_8_;
        uStack_90d8 = auVar9._8_8_;
        local_6280 = local_7b40;
        uStack_6278 = uStack_7b38;
        uStack_6270 = uStack_7b30;
        uStack_6268 = uStack_7b28;
        local_62c0 = local_90e0;
        uStack_62b8 = uStack_90d8;
        uStack_62b0 = 0;
        uStack_62a8 = 0;
        local_840 = local_7b40;
        uStack_838 = uStack_7b38;
        uStack_830 = uStack_7b30;
        uStack_828 = uStack_7b28;
        local_880 = local_90e0;
        uStack_878 = uStack_90d8;
        uStack_870 = 0;
        uStack_868 = 0;
        auVar9 = vfmadd213ps_fma(*local_6c58,auVar5,ZEXT1632(auVar9));
        local_9100 = auVar9._0_8_;
        uStack_90f8 = auVar9._8_8_;
        local_62e0 = local_7b60;
        uStack_62d8 = uStack_7b58;
        uStack_62d0 = uStack_7b50;
        uStack_62c8 = uStack_7b48;
        local_6320 = local_9100;
        uStack_6318 = uStack_90f8;
        uStack_6310 = 0;
        uStack_6308 = 0;
        local_7e0 = local_7b60;
        uStack_7d8 = uStack_7b58;
        uStack_7d0 = uStack_7b50;
        uStack_7c8 = uStack_7b48;
        local_820 = local_9100;
        uStack_818 = uStack_90f8;
        uStack_810 = 0;
        uStack_808 = 0;
        auVar9 = vfmadd213ps_fma(*local_6e20,auVar6,ZEXT1632(auVar9));
        local_9120 = auVar9._0_8_;
        uStack_9118 = auVar9._8_8_;
        local_6340 = local_7b80;
        uStack_6338 = uStack_7b78;
        uStack_6330 = uStack_7b70;
        uStack_6328 = uStack_7b68;
        local_6380 = local_9120;
        uStack_6378 = uStack_9118;
        uStack_6370 = 0;
        uStack_6368 = 0;
        local_780 = local_7b80;
        uStack_778 = uStack_7b78;
        uStack_770 = uStack_7b70;
        uStack_768 = uStack_7b68;
        local_7c0 = local_9120;
        uStack_7b8 = uStack_9118;
        uStack_7b0 = 0;
        uStack_7a8 = 0;
        auVar9 = vfmadd213ps_fma(*local_6c68,auVar7,ZEXT1632(auVar9));
        local_9140 = auVar9._0_8_;
        uStack_9138 = auVar9._8_8_;
        local_63a0 = local_7ba0;
        uStack_6398 = uStack_7b98;
        uStack_6390 = uStack_7b90;
        uStack_6388 = uStack_7b88;
        local_63e0 = local_9140;
        uStack_63d8 = uStack_9138;
        uStack_63d0 = 0;
        uStack_63c8 = 0;
        local_720 = local_7ba0;
        uStack_718 = uStack_7b98;
        uStack_710 = uStack_7b90;
        uStack_708 = uStack_7b88;
        local_760 = local_9140;
        uStack_758 = uStack_9138;
        uStack_750 = 0;
        uStack_748 = 0;
        auVar9 = vfmadd213ps_fma(*local_6c70,auVar8,ZEXT1632(auVar9));
        local_9160 = auVar9._0_8_;
        uStack_9158 = auVar9._8_8_;
        local_6c78 = local_6e10 + 3;
        local_64e0 = *(undefined8 *)*local_6c78;
        uStack_64d8 = *(undefined8 *)(local_6e10[3] + 8);
        uStack_64d0 = *(undefined8 *)(local_6e10[3] + 0x10);
        uStack_64c8 = *(undefined8 *)(local_6e10[3] + 0x18);
        auVar12 = *local_6c78;
        local_6c80 = local_6e18 + 3;
        local_6600 = *(undefined8 *)*local_6c80;
        uStack_65f8 = *(undefined8 *)(local_6e18[3] + 8);
        uStack_65f0 = *(undefined8 *)(local_6e18[3] + 0x10);
        uStack_65e8 = *(undefined8 *)(local_6e18[3] + 0x18);
        auVar15 = *local_6c80;
        local_6c88 = local_6e20 + 3;
        local_6720 = *(undefined8 *)*local_6c88;
        uStack_6718 = *(undefined8 *)(local_6e20[3] + 8);
        uStack_6710 = *(undefined8 *)(local_6e20[3] + 0x10);
        uStack_6708 = *(undefined8 *)(local_6e20[3] + 0x18);
        auVar18 = *local_6c88;
        local_3748 = local_6dc0;
        local_3780 = local_9160;
        uStack_3778 = uStack_9158;
        uStack_3770 = 0;
        uStack_3768 = 0;
        *(undefined8 *)local_6dc0 = local_9160;
        *(undefined8 *)(local_6dc0 + 2) = uStack_9158;
        local_3748[4] = 0.0;
        local_3748[5] = 0.0;
        local_3748[6] = 0.0;
        local_3748[7] = 0.0;
        local_6400 = local_7aa0;
        uStack_63f8 = uStack_7a98;
        uStack_63f0 = uStack_7a90;
        uStack_63e8 = uStack_7a88;
        local_6440 = local_6da0;
        uStack_6438 = uStack_6d98;
        uStack_6430 = uStack_6d90;
        uStack_6428 = uStack_6d88;
        local_6c0 = local_7aa0;
        uStack_6b8 = uStack_7a98;
        uStack_6b0 = uStack_7a90;
        uStack_6a8 = uStack_7a88;
        local_700 = local_6da0;
        uStack_6f8 = uStack_6d98;
        uStack_6f0 = uStack_6d90;
        uStack_6e8 = uStack_6d88;
        auVar23._8_8_ = uStack_6d98;
        auVar23._0_8_ = local_6da0;
        auVar23._16_8_ = uStack_6d90;
        auVar23._24_8_ = uStack_6d88;
        auVar9 = vfmadd213ps_fma(auVar30,auVar31,auVar23);
        local_91e0 = auVar9._0_8_;
        uStack_91d8 = auVar9._8_8_;
        local_6460 = local_7ac0;
        uStack_6458 = uStack_7ab8;
        uStack_6450 = uStack_7ab0;
        uStack_6448 = uStack_7aa8;
        local_64a0 = local_91e0;
        uStack_6498 = uStack_91d8;
        uStack_6490 = 0;
        uStack_6488 = 0;
        local_660 = local_7ac0;
        uStack_658 = uStack_7ab8;
        uStack_650 = uStack_7ab0;
        uStack_648 = uStack_7aa8;
        local_6a0 = local_91e0;
        uStack_698 = uStack_91d8;
        uStack_690 = 0;
        uStack_688 = 0;
        auVar9 = vfmadd213ps_fma(auVar11,auVar1,ZEXT1632(auVar9));
        local_9200 = auVar9._0_8_;
        uStack_91f8 = auVar9._8_8_;
        local_64c0 = local_7ae0;
        uStack_64b8 = uStack_7ad8;
        uStack_64b0 = uStack_7ad0;
        uStack_64a8 = uStack_7ac8;
        local_6500 = local_9200;
        uStack_64f8 = uStack_91f8;
        uStack_64f0 = 0;
        uStack_64e8 = 0;
        local_600 = local_7ae0;
        uStack_5f8 = uStack_7ad8;
        uStack_5f0 = uStack_7ad0;
        uStack_5e8 = uStack_7ac8;
        local_640 = local_9200;
        uStack_638 = uStack_91f8;
        uStack_630 = 0;
        uStack_628 = 0;
        auVar9 = vfmadd213ps_fma(auVar12,auVar2,ZEXT1632(auVar9));
        local_9220 = auVar9._0_8_;
        uStack_9218 = auVar9._8_8_;
        local_6520 = local_7b00;
        uStack_6518 = uStack_7af8;
        uStack_6510 = uStack_7af0;
        uStack_6508 = uStack_7ae8;
        local_6560 = local_9220;
        uStack_6558 = uStack_9218;
        uStack_6550 = 0;
        uStack_6548 = 0;
        local_5a0 = local_7b00;
        uStack_598 = uStack_7af8;
        uStack_590 = uStack_7af0;
        uStack_588 = uStack_7ae8;
        local_5e0 = local_9220;
        uStack_5d8 = uStack_9218;
        uStack_5d0 = 0;
        uStack_5c8 = 0;
        auVar9 = vfmadd213ps_fma(auVar13,auVar3,ZEXT1632(auVar9));
        local_9240 = auVar9._0_8_;
        uStack_9238 = auVar9._8_8_;
        local_6580 = local_7b20;
        uStack_6578 = uStack_7b18;
        uStack_6570 = uStack_7b10;
        uStack_6568 = uStack_7b08;
        local_65c0 = local_9240;
        uStack_65b8 = uStack_9238;
        uStack_65b0 = 0;
        uStack_65a8 = 0;
        local_540 = local_7b20;
        uStack_538 = uStack_7b18;
        uStack_530 = uStack_7b10;
        uStack_528 = uStack_7b08;
        local_580 = local_9240;
        uStack_578 = uStack_9238;
        uStack_570 = 0;
        uStack_568 = 0;
        auVar9 = vfmadd213ps_fma(auVar14,auVar4,ZEXT1632(auVar9));
        local_9260 = auVar9._0_8_;
        uStack_9258 = auVar9._8_8_;
        local_65e0 = local_7b40;
        uStack_65d8 = uStack_7b38;
        uStack_65d0 = uStack_7b30;
        uStack_65c8 = uStack_7b28;
        local_6620 = local_9260;
        uStack_6618 = uStack_9258;
        uStack_6610 = 0;
        uStack_6608 = 0;
        local_4e0 = local_7b40;
        uStack_4d8 = uStack_7b38;
        uStack_4d0 = uStack_7b30;
        uStack_4c8 = uStack_7b28;
        local_520 = local_9260;
        uStack_518 = uStack_9258;
        uStack_510 = 0;
        uStack_508 = 0;
        auVar9 = vfmadd213ps_fma(auVar15,auVar5,ZEXT1632(auVar9));
        local_9280 = auVar9._0_8_;
        uStack_9278 = auVar9._8_8_;
        local_6640 = local_7b60;
        uStack_6638 = uStack_7b58;
        uStack_6630 = uStack_7b50;
        uStack_6628 = uStack_7b48;
        local_6680 = local_9280;
        uStack_6678 = uStack_9278;
        uStack_6670 = 0;
        uStack_6668 = 0;
        local_480 = local_7b60;
        uStack_478 = uStack_7b58;
        uStack_470 = uStack_7b50;
        uStack_468 = uStack_7b48;
        local_4c0 = local_9280;
        uStack_4b8 = uStack_9278;
        uStack_4b0 = 0;
        uStack_4a8 = 0;
        auVar9 = vfmadd213ps_fma(auVar16,auVar6,ZEXT1632(auVar9));
        local_92a0 = auVar9._0_8_;
        uStack_9298 = auVar9._8_8_;
        local_66a0 = local_7b80;
        uStack_6698 = uStack_7b78;
        uStack_6690 = uStack_7b70;
        uStack_6688 = uStack_7b68;
        local_66e0 = local_92a0;
        uStack_66d8 = uStack_9298;
        uStack_66d0 = 0;
        uStack_66c8 = 0;
        local_420 = local_7b80;
        uStack_418 = uStack_7b78;
        uStack_410 = uStack_7b70;
        uStack_408 = uStack_7b68;
        local_460 = local_92a0;
        uStack_458 = uStack_9298;
        uStack_450 = 0;
        uStack_448 = 0;
        auVar9 = vfmadd213ps_fma(auVar17,auVar7,ZEXT1632(auVar9));
        local_92c0 = auVar9._0_8_;
        uStack_92b8 = auVar9._8_8_;
        local_6700 = local_7ba0;
        uStack_66f8 = uStack_7b98;
        uStack_66f0 = uStack_7b90;
        uStack_66e8 = uStack_7b88;
        local_6740 = local_92c0;
        uStack_6738 = uStack_92b8;
        uStack_6730 = 0;
        uStack_6728 = 0;
        local_3c0 = local_7ba0;
        uStack_3b8 = uStack_7b98;
        uStack_3b0 = uStack_7b90;
        uStack_3a8 = uStack_7b88;
        local_400 = local_92c0;
        uStack_3f8 = uStack_92b8;
        uStack_3f0 = 0;
        uStack_3e8 = 0;
        auVar9 = vfmadd213ps_fma(auVar18,auVar8,ZEXT1632(auVar9));
        local_92e0 = auVar9._0_8_;
        uStack_92d8 = auVar9._8_8_;
        local_3788 = local_6dc0 + 8;
        local_37c0 = local_92e0;
        uStack_37b8 = uStack_92d8;
        uStack_37b0 = 0;
        uStack_37a8 = 0;
        *(undefined8 *)local_3788 = local_92e0;
        *(undefined8 *)(local_6dc0 + 10) = uStack_92d8;
        local_3748[0xc] = 0.0;
        local_3748[0xd] = 0.0;
        local_3748[0xe] = 0.0;
        local_3748[0xf] = 0.0;
        local_6e10 = local_6e10 + 2;
        local_6e18 = local_6e18 + 2;
        local_6e20 = local_6e20 + 2;
        local_6dc0 = local_6dc0 + 0x10;
        local_63c0 = local_66c0;
        uStack_63b8 = uStack_66b8;
        uStack_63b0 = uStack_66b0;
        uStack_63a8 = uStack_66a8;
        local_6360 = local_6660;
        uStack_6358 = uStack_6658;
        uStack_6350 = uStack_6650;
        uStack_6348 = uStack_6648;
        local_62a0 = local_65a0;
        uStack_6298 = uStack_6598;
        uStack_6290 = uStack_6590;
        uStack_6288 = uStack_6588;
        local_6240 = local_6540;
        uStack_6238 = uStack_6538;
        uStack_6230 = uStack_6530;
        uStack_6228 = uStack_6528;
        local_6180 = local_6480;
        uStack_6178 = uStack_6478;
        uStack_6170 = uStack_6470;
        uStack_6168 = uStack_6468;
        local_6120 = local_6420;
        uStack_6118 = uStack_6418;
        uStack_6110 = uStack_6410;
        uStack_6108 = uStack_6408;
        local_a40 = local_60c0;
        uStack_a38 = uStack_60b8;
        uStack_a30 = uStack_60b0;
        uStack_a28 = uStack_60a8;
        local_9e0 = local_6420;
        uStack_9d8 = uStack_6418;
        uStack_9d0 = uStack_6410;
        uStack_9c8 = uStack_6408;
        local_980 = local_6480;
        uStack_978 = uStack_6478;
        uStack_970 = uStack_6470;
        uStack_968 = uStack_6468;
        local_920 = local_61e0;
        uStack_918 = uStack_61d8;
        uStack_910 = uStack_61d0;
        uStack_908 = uStack_61c8;
        local_8c0 = local_6540;
        uStack_8b8 = uStack_6538;
        uStack_8b0 = uStack_6530;
        uStack_8a8 = uStack_6528;
        local_860 = local_65a0;
        uStack_858 = uStack_6598;
        uStack_850 = uStack_6590;
        uStack_848 = uStack_6588;
        local_800 = local_6300;
        uStack_7f8 = uStack_62f8;
        uStack_7f0 = uStack_62f0;
        uStack_7e8 = uStack_62e8;
        local_7a0 = local_6660;
        uStack_798 = uStack_6658;
        uStack_790 = uStack_6650;
        uStack_788 = uStack_6648;
        local_740 = local_66c0;
        uStack_738 = uStack_66b8;
        uStack_730 = uStack_66b0;
        uStack_728 = uStack_66a8;
        local_6e0 = local_6420;
        uStack_6d8 = uStack_6418;
        uStack_6d0 = uStack_6410;
        uStack_6c8 = uStack_6408;
        local_680 = local_6480;
        uStack_678 = uStack_6478;
        uStack_670 = uStack_6470;
        uStack_668 = uStack_6468;
        local_620 = local_64e0;
        uStack_618 = uStack_64d8;
        uStack_610 = uStack_64d0;
        uStack_608 = uStack_64c8;
        local_5c0 = local_6540;
        uStack_5b8 = uStack_6538;
        uStack_5b0 = uStack_6530;
        uStack_5a8 = uStack_6528;
        local_560 = local_65a0;
        uStack_558 = uStack_6598;
        uStack_550 = uStack_6590;
        uStack_548 = uStack_6588;
        local_500 = local_6600;
        uStack_4f8 = uStack_65f8;
        uStack_4f0 = uStack_65f0;
        uStack_4e8 = uStack_65e8;
        local_4a0 = local_6660;
        uStack_498 = uStack_6658;
        uStack_490 = uStack_6650;
        uStack_488 = uStack_6648;
        local_440 = local_66c0;
        uStack_438 = uStack_66b8;
        uStack_430 = uStack_66b0;
        uStack_428 = uStack_66a8;
        local_3e0 = local_6720;
        uStack_3d8 = uStack_6718;
        uStack_3d0 = uStack_6710;
        uStack_3c8 = uStack_6708;
      }
      for (; _local_9500 = auVar30, local_6f48 < local_6d04; local_6f48 = local_6f48 + 1) {
        local_6c90 = local_6e10;
        local_6780 = *(undefined8 *)*local_6e10;
        uStack_6778 = *(undefined8 *)(*local_6e10 + 8);
        uStack_6770 = *(undefined8 *)(*local_6e10 + 0x10);
        uStack_6768 = *(undefined8 *)(*local_6e10 + 0x18);
        local_6c98 = local_6e10 + 1;
        local_67e0 = *(undefined8 *)*local_6c98;
        uStack_67d8 = *(undefined8 *)(local_6e10[1] + 8);
        uStack_67d0 = *(undefined8 *)(local_6e10[1] + 0x10);
        uStack_67c8 = *(undefined8 *)(local_6e10[1] + 0x18);
        local_6ca0 = local_6e10 + 2;
        local_6840 = *(undefined8 *)*local_6ca0;
        uStack_6838 = *(undefined8 *)(local_6e10[2] + 8);
        uStack_6830 = *(undefined8 *)(local_6e10[2] + 0x10);
        uStack_6828 = *(undefined8 *)(local_6e10[2] + 0x18);
        local_6ca8 = local_6e18;
        local_68a0 = *(undefined8 *)*local_6e18;
        uStack_6898 = *(undefined8 *)(*local_6e18 + 8);
        uStack_6890 = *(undefined8 *)(*local_6e18 + 0x10);
        uStack_6888 = *(undefined8 *)(*local_6e18 + 0x18);
        local_6cb0 = local_6e18 + 1;
        local_6900 = *(undefined8 *)*local_6cb0;
        uStack_68f8 = *(undefined8 *)(local_6e18[1] + 8);
        uStack_68f0 = *(undefined8 *)(local_6e18[1] + 0x10);
        uStack_68e8 = *(undefined8 *)(local_6e18[1] + 0x18);
        local_6cb8 = local_6e18 + 2;
        local_6960 = *(undefined8 *)*local_6cb8;
        uStack_6958 = *(undefined8 *)(local_6e18[2] + 8);
        uStack_6950 = *(undefined8 *)(local_6e18[2] + 0x10);
        uStack_6948 = *(undefined8 *)(local_6e18[2] + 0x18);
        local_6cc0 = local_6e20;
        local_69c0 = *(undefined8 *)*local_6e20;
        uStack_69b8 = *(undefined8 *)(*local_6e20 + 8);
        uStack_69b0 = *(undefined8 *)(*local_6e20 + 0x10);
        uStack_69a8 = *(undefined8 *)(*local_6e20 + 0x18);
        local_6cc8 = local_6e20 + 1;
        local_6a20 = *(undefined8 *)*local_6cc8;
        uStack_6a18 = *(undefined8 *)(local_6e20[1] + 8);
        uStack_6a10 = *(undefined8 *)(local_6e20[1] + 0x10);
        uStack_6a08 = *(undefined8 *)(local_6e20[1] + 0x18);
        local_6cd0 = local_6e20 + 2;
        local_6a80 = *(undefined8 *)*local_6cd0;
        uStack_6a78 = *(undefined8 *)(local_6e20[2] + 8);
        uStack_6a70 = *(undefined8 *)(local_6e20[2] + 0x10);
        uStack_6a68 = *(undefined8 *)(local_6e20[2] + 0x18);
        local_6760 = local_7aa0;
        uStack_6758 = uStack_7a98;
        uStack_6750 = uStack_7a90;
        uStack_6748 = uStack_7a88;
        local_67a0 = local_6da0;
        uStack_6798 = uStack_6d98;
        uStack_6790 = uStack_6d90;
        uStack_6788 = uStack_6d88;
        local_360 = local_7aa0;
        uStack_358 = uStack_7a98;
        uStack_350 = uStack_7a90;
        uStack_348 = uStack_7a88;
        local_3a0 = local_6da0;
        uStack_398 = uStack_6d98;
        uStack_390 = uStack_6d90;
        uStack_388 = uStack_6d88;
        auVar24._8_8_ = uStack_6d98;
        auVar24._0_8_ = local_6da0;
        auVar24._16_8_ = uStack_6d90;
        auVar24._24_8_ = uStack_6d88;
        auVar9 = vfmadd213ps_fma(*local_6e10,auVar31,auVar24);
        local_9420 = auVar9._0_8_;
        uStack_9418 = auVar9._8_8_;
        local_67c0 = local_7ac0;
        uStack_67b8 = uStack_7ab8;
        uStack_67b0 = uStack_7ab0;
        uStack_67a8 = uStack_7aa8;
        local_6800 = local_9420;
        uStack_67f8 = uStack_9418;
        uStack_67f0 = 0;
        uStack_67e8 = 0;
        local_300 = local_7ac0;
        uStack_2f8 = uStack_7ab8;
        uStack_2f0 = uStack_7ab0;
        uStack_2e8 = uStack_7aa8;
        local_340 = local_9420;
        uStack_338 = uStack_9418;
        uStack_330 = 0;
        uStack_328 = 0;
        auVar9 = vfmadd213ps_fma(*local_6c98,auVar1,ZEXT1632(auVar9));
        local_9440 = auVar9._0_8_;
        uStack_9438 = auVar9._8_8_;
        local_6820 = local_7ae0;
        uStack_6818 = uStack_7ad8;
        uStack_6810 = uStack_7ad0;
        uStack_6808 = uStack_7ac8;
        local_6860 = local_9440;
        uStack_6858 = uStack_9438;
        uStack_6850 = 0;
        uStack_6848 = 0;
        local_2a0 = local_7ae0;
        uStack_298 = uStack_7ad8;
        uStack_290 = uStack_7ad0;
        uStack_288 = uStack_7ac8;
        local_2e0 = local_9440;
        uStack_2d8 = uStack_9438;
        uStack_2d0 = 0;
        uStack_2c8 = 0;
        auVar9 = vfmadd213ps_fma(*local_6ca0,auVar2,ZEXT1632(auVar9));
        local_9460 = auVar9._0_8_;
        uStack_9458 = auVar9._8_8_;
        local_6880 = local_7b00;
        uStack_6878 = uStack_7af8;
        uStack_6870 = uStack_7af0;
        uStack_6868 = uStack_7ae8;
        local_68c0 = local_9460;
        uStack_68b8 = uStack_9458;
        uStack_68b0 = 0;
        uStack_68a8 = 0;
        local_240 = local_7b00;
        uStack_238 = uStack_7af8;
        uStack_230 = uStack_7af0;
        uStack_228 = uStack_7ae8;
        local_280 = local_9460;
        uStack_278 = uStack_9458;
        uStack_270 = 0;
        uStack_268 = 0;
        auVar9 = vfmadd213ps_fma(*local_6e18,auVar3,ZEXT1632(auVar9));
        local_9480 = auVar9._0_8_;
        uStack_9478 = auVar9._8_8_;
        local_68e0 = local_7b20;
        uStack_68d8 = uStack_7b18;
        uStack_68d0 = uStack_7b10;
        uStack_68c8 = uStack_7b08;
        local_6920 = local_9480;
        uStack_6918 = uStack_9478;
        uStack_6910 = 0;
        uStack_6908 = 0;
        local_1e0 = local_7b20;
        uStack_1d8 = uStack_7b18;
        uStack_1d0 = uStack_7b10;
        uStack_1c8 = uStack_7b08;
        local_220 = local_9480;
        uStack_218 = uStack_9478;
        uStack_210 = 0;
        uStack_208 = 0;
        auVar9 = vfmadd213ps_fma(*local_6cb0,auVar4,ZEXT1632(auVar9));
        local_94a0 = auVar9._0_8_;
        uStack_9498 = auVar9._8_8_;
        local_6940 = local_7b40;
        uStack_6938 = uStack_7b38;
        uStack_6930 = uStack_7b30;
        uStack_6928 = uStack_7b28;
        local_6980 = local_94a0;
        uStack_6978 = uStack_9498;
        uStack_6970 = 0;
        uStack_6968 = 0;
        local_180 = local_7b40;
        uStack_178 = uStack_7b38;
        uStack_170 = uStack_7b30;
        uStack_168 = uStack_7b28;
        local_1c0 = local_94a0;
        uStack_1b8 = uStack_9498;
        uStack_1b0 = 0;
        uStack_1a8 = 0;
        auVar9 = vfmadd213ps_fma(*local_6cb8,auVar5,ZEXT1632(auVar9));
        local_94c0 = auVar9._0_8_;
        uStack_94b8 = auVar9._8_8_;
        local_69a0 = local_7b60;
        uStack_6998 = uStack_7b58;
        uStack_6990 = uStack_7b50;
        uStack_6988 = uStack_7b48;
        local_69e0 = local_94c0;
        uStack_69d8 = uStack_94b8;
        uStack_69d0 = 0;
        uStack_69c8 = 0;
        local_120 = local_7b60;
        uStack_118 = uStack_7b58;
        uStack_110 = uStack_7b50;
        uStack_108 = uStack_7b48;
        local_160 = local_94c0;
        uStack_158 = uStack_94b8;
        uStack_150 = 0;
        uStack_148 = 0;
        auVar9 = vfmadd213ps_fma(*local_6e20,auVar6,ZEXT1632(auVar9));
        local_94e0 = auVar9._0_8_;
        uStack_94d8 = auVar9._8_8_;
        local_6a00 = local_7b80;
        uStack_69f8 = uStack_7b78;
        uStack_69f0 = uStack_7b70;
        uStack_69e8 = uStack_7b68;
        local_6a40 = local_94e0;
        uStack_6a38 = uStack_94d8;
        uStack_6a30 = 0;
        uStack_6a28 = 0;
        local_c0 = local_7b80;
        uStack_b8 = uStack_7b78;
        uStack_b0 = uStack_7b70;
        uStack_a8 = uStack_7b68;
        local_100 = local_94e0;
        uStack_f8 = uStack_94d8;
        uStack_f0 = 0;
        uStack_e8 = 0;
        auVar9 = vfmadd213ps_fma(*local_6cc8,auVar7,ZEXT1632(auVar9));
        local_9500 = auVar9._0_8_;
        this = (Mat *)0x0;
        local_6a60 = local_7ba0;
        uStack_6a58 = uStack_7b98;
        uStack_6a50 = uStack_7b90;
        uStack_6a48 = uStack_7b88;
        local_6aa0 = local_9500;
        uStack_6a88 = 0;
        local_60 = local_7ba0;
        uStack_58 = uStack_7b98;
        uStack_50 = uStack_7b90;
        uStack_48 = uStack_7b88;
        local_a0 = local_9500;
        uStack_88 = 0;
        auVar10 = vfmadd213ps_fma(*local_6cd0,auVar8,ZEXT1632(auVar9));
        local_9520 = auVar10._0_8_;
        uStack_9518 = auVar10._8_8_;
        local_37c8 = local_6dc0;
        local_3800 = local_9520;
        uStack_37f8 = uStack_9518;
        uStack_37f0 = 0;
        uStack_37e8 = 0;
        *(undefined8 *)local_6dc0 = local_9520;
        *(undefined8 *)(local_6dc0 + 2) = uStack_9518;
        local_37c8[4] = 0.0;
        local_37c8[5] = 0.0;
        local_37c8[6] = 0.0;
        local_37c8[7] = 0.0;
        local_6e10 = local_6e10 + 1;
        local_6e18 = local_6e18 + 1;
        local_6e20 = local_6e20 + 1;
        local_6dc0 = local_6dc0 + 8;
        auVar30 = ZEXT1632(auVar9);
        uStack_6a98 = auVar9._8_8_;
        uStack_6a90 = this;
        local_380 = local_6780;
        uStack_378 = uStack_6778;
        uStack_370 = uStack_6770;
        uStack_368 = uStack_6768;
        local_320 = local_67e0;
        uStack_318 = uStack_67d8;
        uStack_310 = uStack_67d0;
        uStack_308 = uStack_67c8;
        local_2c0 = local_6840;
        uStack_2b8 = uStack_6838;
        uStack_2b0 = uStack_6830;
        uStack_2a8 = uStack_6828;
        local_260 = local_68a0;
        uStack_258 = uStack_6898;
        uStack_250 = uStack_6890;
        uStack_248 = uStack_6888;
        local_200 = local_6900;
        uStack_1f8 = uStack_68f8;
        uStack_1f0 = uStack_68f0;
        uStack_1e8 = uStack_68e8;
        local_1a0 = local_6960;
        uStack_198 = uStack_6958;
        uStack_190 = uStack_6950;
        uStack_188 = uStack_6948;
        local_140 = local_69c0;
        uStack_138 = uStack_69b8;
        uStack_130 = uStack_69b0;
        uStack_128 = uStack_69a8;
        local_e0 = local_6a20;
        uStack_d8 = uStack_6a18;
        uStack_d0 = uStack_6a10;
        uStack_c8 = uStack_6a08;
        uStack_98 = auVar9._8_8_;
        uStack_90 = this;
        local_80 = local_6a80;
        uStack_78 = uStack_6a78;
        uStack_70 = uStack_6a70;
        uStack_68 = uStack_6a68;
      }
      local_6e10 = local_6e10 + 2;
      local_6e18 = local_6e18 + 2;
      local_6e20 = local_6e20 + 2;
    }
    local_3360 = local_3410;
    local_3358 = local_3418;
    local_3350 = local_3420;
    local_3348 = local_3428;
    local_3340 = local_3430;
    local_3338 = local_3438;
    local_3330 = local_3440;
    local_3328 = local_3448;
    Mat::~Mat((Mat *)0x632ff2);
    Mat::~Mat((Mat *)0x632fff);
  }
  return;
}

Assistant:

static void convdw3x3s1_fp16_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_set1_ps(0.f);

        const unsigned short* k0 = (const unsigned short*)kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m256 _k00 = loadfp16(k0);
        __m256 _k01 = loadfp16(k0 + 8);
        __m256 _k02 = loadfp16(k0 + 16);
        __m256 _k10 = loadfp16(k0 + 24);
        __m256 _k11 = loadfp16(k0 + 32);
        __m256 _k12 = loadfp16(k0 + 40);
        __m256 _k20 = loadfp16(k0 + 48);
        __m256 _k21 = loadfp16(k0 + 56);
        __m256 _k22 = loadfp16(k0 + 64);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 7 < outw; j += 8)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                __m256 _sum4 = _bias0;
                __m256 _r06 = _mm256_loadu_ps(r0 + 48);
                __m256 _r16 = _mm256_loadu_ps(r1 + 48);
                __m256 _r26 = _mm256_loadu_ps(r2 + 48);
                _mm256_storeu_ps(outptr0 + 24, _sum3);

                _sum4 = _mm256_comp_fmadd_ps(_k00, _r04, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k01, _r05, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k02, _r06, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k10, _r14, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k11, _r15, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k12, _r16, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k20, _r24, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k21, _r25, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k22, _r26, _sum4);

                __m256 _sum5 = _bias0;
                __m256 _r07 = _mm256_loadu_ps(r0 + 56);
                __m256 _r17 = _mm256_loadu_ps(r1 + 56);
                __m256 _r27 = _mm256_loadu_ps(r2 + 56);
                _mm256_storeu_ps(outptr0 + 32, _sum4);

                _sum5 = _mm256_comp_fmadd_ps(_k00, _r05, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k01, _r06, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k02, _r07, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k10, _r15, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k11, _r16, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k12, _r17, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k20, _r25, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k21, _r26, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k22, _r27, _sum5);

                __m256 _sum6 = _bias0;
                __m256 _r08 = _mm256_loadu_ps(r0 + 64);
                __m256 _r18 = _mm256_loadu_ps(r1 + 64);
                __m256 _r28 = _mm256_loadu_ps(r2 + 64);
                _mm256_storeu_ps(outptr0 + 40, _sum5);

                _sum6 = _mm256_comp_fmadd_ps(_k00, _r06, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k01, _r07, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k02, _r08, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k10, _r16, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k11, _r17, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k12, _r18, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k20, _r26, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k21, _r27, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k22, _r28, _sum6);

                __m256 _sum7 = _bias0;
                __m256 _r09 = _mm256_loadu_ps(r0 + 72);
                __m256 _r19 = _mm256_loadu_ps(r1 + 72);
                __m256 _r29 = _mm256_loadu_ps(r2 + 72);
                _mm256_storeu_ps(outptr0 + 48, _sum6);

                _sum7 = _mm256_comp_fmadd_ps(_k00, _r07, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k01, _r08, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k02, _r09, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k10, _r17, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k11, _r18, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k12, _r19, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k20, _r27, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k21, _r28, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k22, _r29, _sum7);
                _mm256_storeu_ps(outptr0 + 56, _sum7);

                r0 += 64;
                r1 += 64;
                r2 += 64;
                outptr0 += 64;
            }
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm256_storeu_ps(outptr0 + 24, _sum3);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm256_storeu_ps(outptr0 + 8, _sum1);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm256_storeu_ps(outptr0, _sum0);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }

            r0 += 2 * 8;
            r1 += 2 * 8;
            r2 += 2 * 8;
        }
    }
}